

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  pointer pMVar6;
  Mat *this_00;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  float *pfVar52;
  float *pfVar53;
  long lVar54;
  size_t sVar55;
  int iVar56;
  undefined1 (*pauVar57) [16];
  undefined1 (*pauVar58) [16];
  undefined1 (*pauVar59) [16];
  void *pvVar60;
  int iVar61;
  long lVar62;
  void *pvVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  int iVar69;
  long lVar70;
  bool bVar71;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined1 in_XMM1 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  undefined1 in_XMM2 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 in_XMM3 [16];
  float fVar162;
  __m128 afVar163;
  binary_op_pow_pack4 op;
  Mat m;
  __m128 _p;
  binary_op_pow_pack4 local_e1;
  float *local_e0;
  undefined8 local_d8;
  ulong local_d0;
  void *local_c8;
  ulong local_c0;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  size_t local_a8;
  int local_a0;
  Allocator *local_98;
  uint local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  size_t local_78;
  size_t local_70;
  ulong local_68;
  ulong local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_39;
  size_t local_38;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar48 = pMVar6->elempack;
  iVar56 = pMVar6[1].elempack;
  if ((iVar56 != 4 && iVar48 != 4) ||
     (8 < *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]))) {
    iVar48 = BinaryOp::forward((BinaryOp *)
                               ((long)&this->_vptr_BinaryOp_x86 + (long)this->_vptr_BinaryOp_x86[-3]
                               ),bottom_blobs,top_blobs,opt);
    return iVar48;
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(*(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3])) {
  case 1:
    uVar67 = pMVar6->w;
    uVar51 = (ulong)uVar67;
    sVar55 = pMVar6->elemsize;
    uVar66 = pMVar6[1].w;
    uVar65 = pMVar6[1].h;
    uVar64 = pMVar6[1].c;
    uVar50 = (ulong)uVar64;
    local_e0 = (float *)CONCAT44(local_e0._4_4_,uVar65 * uVar66);
    local_70 = pMVar6[1].elemsize;
    iVar3 = pMVar6->dims;
    if (iVar3 == 1) {
      iVar3 = pMVar6[1].dims;
      if (iVar48 != 1 || uVar67 != 1) {
        if (iVar3 == 1) {
          Mat::create(this_00,uVar67,sVar55,iVar48,opt->blob_allocator);
          pvVar8 = this_00->data;
          if (pvVar8 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar56 != 1 || pMVar6[1].w != 1) {
            if (0 < (int)uVar67) {
              pvVar60 = pMVar6->data;
              pvVar63 = pMVar6[1].data;
              lVar62 = 0;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62);
                fVar128 = pfVar53[1];
                fVar157 = pfVar53[2];
                fVar159 = pfVar53[3];
                pfVar52 = (float *)((long)pvVar63 + lVar62);
                fVar161 = pfVar52[1];
                fVar156 = pfVar52[2];
                fVar158 = pfVar52[3];
                pfVar1 = (float *)((long)pvVar8 + lVar62);
                *pfVar1 = *pfVar53 - *pfVar52;
                pfVar1[1] = fVar128 - fVar161;
                pfVar1[2] = fVar157 - fVar156;
                pfVar1[3] = fVar159 - fVar158;
                lVar62 = lVar62 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar67) {
            fVar128 = *pMVar6[1].data;
            pvVar60 = pMVar6->data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = *pfVar53 - fVar128;
              pfVar52[1] = fVar157 - fVar128;
              pfVar52[2] = fVar159 - fVar128;
              pfVar52[3] = fVar161 - fVar128;
              lVar62 = lVar62 + 0x10;
              uVar67 = (int)uVar51 - 1;
              uVar51 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar3 == 2) {
          Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
          pauVar59 = (undefined1 (*) [16])this_00->data;
          if (pauVar59 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              pfVar53 = (float *)pMVar6->data;
              pauVar57 = (undefined1 (*) [16])pMVar6[1].data;
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  fVar128 = *pfVar53;
                  fVar157 = pfVar53[1];
                  fVar159 = pfVar53[2];
                  fVar161 = pfVar53[3];
                  uVar64 = uVar66;
                  do {
                    auVar93 = *pauVar57;
                    auVar140._0_4_ = fVar128 - auVar93._0_4_;
                    auVar140._4_4_ = fVar157 - auVar93._4_4_;
                    auVar140._8_4_ = fVar159 - auVar93._8_4_;
                    auVar140._12_4_ = fVar161 - auVar93._12_4_;
                    *pauVar59 = auVar140;
                    pauVar57 = pauVar57 + 1;
                    pauVar59 = pauVar59 + 1;
                    uVar64 = uVar64 - 1;
                  } while (uVar64 != 0);
                }
                pfVar53 = pfVar53 + 4;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar3 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)local_e0) {
                sVar55 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pfVar53 = (float *)((long)pMVar6->data + uVar51 * 0x10);
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar6[1].cstep;
                sVar10 = pMVar6[1].elemsize;
                pvVar60 = pMVar6[1].data;
                lVar62 = 0;
                iVar48 = (int)local_e0;
                do {
                  auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51)
                  ;
                  auVar135._0_4_ = fVar128 - auVar93._0_4_;
                  auVar135._4_4_ = fVar157 - auVar93._4_4_;
                  auVar135._8_4_ = fVar159 - auVar93._8_4_;
                  auVar135._12_4_ = fVar161 - auVar93._12_4_;
                  *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar135
                  ;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 == 1) {
        Mat::create(this_00,uVar66,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar66) {
            fVar128 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = fVar128 - *pfVar53;
              pfVar52[1] = fVar128 - fVar157;
              pfVar52[2] = fVar128 - fVar159;
              pfVar52[3] = fVar128 - fVar161;
              lVar62 = lVar62 + 0x10;
              uVar66 = uVar66 - 1;
            } while (uVar66 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 == 2) {
        Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e0) {
            fVar128 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = fVar128 - *pfVar53;
              pfVar52[1] = fVar128 - fVar157;
              pfVar52[2] = fVar128 - fVar159;
              pfVar52[3] = fVar128 - fVar161;
              lVar62 = lVar62 + 0x10;
              local_e0._0_4_ = (int)local_e0 + -1;
            } while ((int)local_e0 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        fVar128 = *pMVar6->data;
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
              auVar132._0_4_ = fVar128 - auVar93._0_4_;
              auVar132._4_4_ = fVar128 - auVar93._4_4_;
              auVar132._8_4_ = fVar128 - auVar93._8_4_;
              auVar132._12_4_ = fVar128 - auVar93._12_4_;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar132;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar4 = pMVar6->h;
    local_c8 = (void *)CONCAT44(local_c8._4_4_,uVar4 * uVar67);
    local_d8 = (Option *)uVar50;
    if (iVar3 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_00->cstep * uVar51 * this_00->elemsize + (long)this_00->data);
                pauVar57 = (undefined1 (*) [16])
                           (pMVar6[1].cstep * uVar51 * pMVar6[1].elemsize + (long)pMVar6[1].data);
                pfVar53 = (float *)((long)pMVar6->w * uVar51 * pMVar6->elemsize + (long)pMVar6->data
                                   );
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    fVar128 = *pfVar53;
                    fVar157 = pfVar53[1];
                    fVar159 = pfVar53[2];
                    fVar161 = pfVar53[3];
                    uVar64 = uVar66;
                    do {
                      auVar93 = *pauVar57;
                      auVar131._0_4_ = fVar128 - auVar93._0_4_;
                      auVar131._4_4_ = fVar157 - auVar93._4_4_;
                      auVar131._8_4_ = fVar159 - auVar93._8_4_;
                      auVar131._12_4_ = fVar161 - auVar93._12_4_;
                      *pauVar59 = auVar131;
                      pauVar57 = pauVar57 + 1;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pfVar53 = pfVar53 + 4;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e0 = (float *)CONCAT44(local_e0._4_4_,iVar56);
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pvVar8 = this_00->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_c8) {
          pvVar60 = pMVar6->data;
          pvVar63 = pMVar6[1].data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar60 + lVar62);
            fVar128 = pfVar53[1];
            fVar157 = pfVar53[2];
            fVar159 = pfVar53[3];
            pfVar52 = (float *)((long)pvVar63 + lVar62);
            fVar161 = pfVar52[1];
            fVar156 = pfVar52[2];
            fVar158 = pfVar52[3];
            pfVar1 = (float *)((long)pvVar8 + lVar62);
            *pfVar1 = *pfVar53 - *pfVar52;
            pfVar1[1] = fVar128 - fVar161;
            pfVar1[2] = fVar157 - fVar156;
            pfVar1[3] = fVar159 - fVar158;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_00->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if ((int)local_e0 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar4) {
            pfVar53 = (float *)pMVar6->data;
            pfVar52 = (float *)pMVar6[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar128 = *pfVar52;
                fVar157 = pfVar52[1];
                fVar159 = pfVar52[2];
                fVar161 = pfVar52[3];
                uVar50 = uVar51;
                do {
                  auVar121._0_4_ = *pfVar53 - fVar128;
                  auVar121._4_4_ = pfVar53[1] - fVar157;
                  auVar121._8_4_ = pfVar53[2] - fVar159;
                  auVar121._12_4_ = pfVar53[3] - fVar161;
                  *pauVar59 = auVar121;
                  pfVar53 = pfVar53 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar52 = pfVar52 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_c8) {
          fVar128 = *pMVar6[1].data;
          pvVar8 = pMVar6->data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar8 + lVar62);
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pfVar52 = (float *)((long)*pauVar59 + lVar62);
            *pfVar52 = *pfVar53 - fVar128;
            pfVar52[1] = fVar157 - fVar128;
            pfVar52[2] = fVar159 - fVar128;
            pfVar52[3] = fVar161 - fVar128;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar49 = (ulong)uVar5;
    local_c0 = sVar55;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims == 1) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar5) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pfVar53 = (float *)((long)pMVar6[1].data + uVar50 * 0x10);
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar6->cstep;
                sVar10 = pMVar6->elemsize;
                pvVar60 = pMVar6->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
                  auVar112._0_4_ = *pfVar53 - fVar128;
                  auVar112._4_4_ = pfVar53[1] - fVar157;
                  auVar112._8_4_ = pfVar53[2] - fVar159;
                  auVar112._12_4_ = pfVar53[3] - fVar161;
                  *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar112
                  ;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar49);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar5) {
          fVar128 = *pMVar6[1].data;
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar8 = this_00->data;
              sVar9 = pMVar6->cstep;
              sVar10 = pMVar6->elemsize;
              pvVar60 = pMVar6->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
                auVar103._0_4_ = *pfVar53 - fVar128;
                auVar103._4_4_ = pfVar53[1] - fVar128;
                auVar103._8_4_ = pfVar53[2] - fVar128;
                auVar103._12_4_ = pfVar53[3] - fVar128;
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar103;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar5) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar4) {
            pauVar59 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            pfVar53 = (float *)((long)pMVar6[1].w * uVar50 * pMVar6[1].elemsize +
                               (long)pMVar6[1].data);
            pfVar52 = (float *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                uVar68 = uVar51;
                do {
                  auVar87._0_4_ = *pfVar52 - fVar128;
                  auVar87._4_4_ = pfVar52[1] - fVar157;
                  auVar87._8_4_ = pfVar52[2] - fVar159;
                  auVar87._12_4_ = pfVar52[3] - fVar161;
                  *pauVar59 = auVar87;
                  pfVar52 = pfVar52 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar68 - 1;
                  uVar68 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar53 = pfVar53 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar49);
        return 0;
      }
      return 0;
    }
    if (uVar5 == uVar64 && ((uVar66 ^ 1) == 0 && (uVar65 ^ 1) == 0)) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar5) {
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = pMVar6->cstep;
              sVar7 = pMVar6->elemsize;
              pfVar53 = (float *)((long)pMVar6[1].data +
                                 pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize);
              fVar128 = *pfVar53;
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pvVar8 = pMVar6->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                auVar74._0_4_ = *pfVar53 - fVar128;
                auVar74._4_4_ = pfVar53[1] - fVar157;
                auVar74._8_4_ = pfVar53[2] - fVar159;
                auVar74._12_4_ = pfVar53[3] - fVar161;
                *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50) = auVar74;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = uVar49;
    if (uVar66 == uVar67) {
      if (iVar56 == 1 && (uVar64 == 1 && uVar65 == uVar4)) {
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = pMVar6->cstep;
                sVar7 = pMVar6->elemsize;
                sVar9 = this_00->cstep;
                pvVar8 = pMVar6->data;
                pvVar60 = pMVar6[1].data;
                sVar10 = this_00->elemsize;
                pvVar63 = this_00->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar50);
                  fVar157 = pfVar53[1];
                  fVar159 = pfVar53[2];
                  fVar161 = pfVar53[3];
                  fVar128 = *(float *)((long)pvVar60 + lVar62);
                  pfVar52 = (float *)((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar50);
                  *pfVar52 = *pfVar53 - fVar128;
                  pfVar52[1] = fVar157 - fVar128;
                  pfVar52[2] = fVar159 - fVar128;
                  pfVar52[3] = fVar161 - fVar128;
                  lVar62 = lVar62 + 4;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) {
        if (((iVar48 == 1) && (uVar65 == uVar4)) && (uVar5 == 1)) {
          Mat::create(this_00,uVar67,uVar4,uVar64,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar64) {
              uVar51 = 0;
              do {
                if (0 < (int)local_e0) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  sVar9 = this_00->cstep;
                  pvVar8 = pMVar6[1].data;
                  pvVar60 = pMVar6->data;
                  sVar10 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar62 = 0;
                  iVar48 = (int)local_e0;
                  do {
                    fVar128 = *(float *)((long)pvVar60 + lVar62);
                    auVar93 = *(undefined1 (*) [16])
                               ((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar51);
                    pfVar53 = (float *)((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar51);
                    *pfVar53 = fVar128 - auVar93._0_4_;
                    pfVar53[1] = fVar128 - auVar93._4_4_;
                    pfVar53[2] = fVar128 - auVar93._8_4_;
                    pfVar53[3] = fVar128 - auVar93._12_4_;
                    lVar62 = lVar62 + 4;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
LAB_00233d22:
        if ((((uVar66 ^ 1) == 0 && uVar65 == uVar4) && uVar5 == uVar64) && uVar67 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  pvVar8 = pMVar6[1].data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pfVar53 = (float *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data
                                     );
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      pfVar52 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      fVar128 = *pfVar52;
                      fVar157 = pfVar52[1];
                      fVar159 = pfVar52[2];
                      fVar161 = pfVar52[3];
                      uVar66 = uVar67;
                      do {
                        auVar99._0_4_ = *pfVar53 - fVar128;
                        auVar99._4_4_ = pfVar53[1] - fVar157;
                        auVar99._8_4_ = pfVar53[2] - fVar159;
                        auVar99._12_4_ = pfVar53[3] - fVar161;
                        *pauVar59 = auVar99;
                        pfVar53 = pfVar53 + 4;
                        pauVar59 = pauVar59 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar66 == uVar67 && (uVar65 ^ 1) == 0) && uVar5 == uVar64) && uVar4 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].elemsize;
                  pvVar60 = (void *)(this_00->cstep * uVar50 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar63 = (void *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data)
                  ;
                  sVar7 = pMVar6[1].cstep;
                  pvVar8 = pMVar6[1].data;
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        pfVar53 = (float *)((long)pvVar63 + lVar62);
                        fVar128 = pfVar53[1];
                        fVar157 = pfVar53[2];
                        fVar159 = pfVar53[3];
                        auVar93 = *(undefined1 (*) [16])
                                   ((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                        pfVar52 = (float *)((long)pvVar60 + lVar62);
                        *pfVar52 = *pfVar53 - auVar93._0_4_;
                        pfVar52[1] = fVar128 - auVar93._4_4_;
                        pfVar52[2] = fVar157 - auVar93._8_4_;
                        pfVar52[3] = fVar159 - auVar93._12_4_;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar64 == uVar5 && uVar65 == uVar4) & uVar66 != 1 & (byte)local_68) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar66,uVar4,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar5) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6->cstep;
                  sVar7 = pMVar6->elemsize;
                  pvVar8 = pMVar6->data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pauVar57 = (undefined1 (*) [16])
                             (pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize + (long)pMVar6[1].data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar66) {
                      pfVar53 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      fVar128 = *pfVar53;
                      fVar157 = pfVar53[1];
                      fVar159 = pfVar53[2];
                      fVar161 = pfVar53[3];
                      uVar67 = uVar66;
                      do {
                        auVar93 = *pauVar57;
                        auVar150._0_4_ = fVar128 - auVar93._0_4_;
                        auVar150._4_4_ = fVar157 - auVar93._4_4_;
                        auVar150._8_4_ = fVar159 - auVar93._8_4_;
                        auVar150._12_4_ = fVar161 - auVar93._12_4_;
                        *pauVar59 = auVar150;
                        pauVar57 = pauVar57 + 1;
                        pauVar59 = pauVar59 + 1;
                        uVar67 = uVar67 - 1;
                      } while (uVar67 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != uVar49);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((byte)local_60 & uVar64 == uVar5 & (uVar65 != 1 && uVar66 == uVar67)) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar65,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              local_e0 = (float *)0x0;
              do {
                bVar71 = pMVar6->dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6->d;
                }
                local_8c = pMVar6->w;
                local_88 = pMVar6->h;
                local_90 = bVar71 ^ 3;
                local_d8 = (Option *)pMVar6->cstep;
                pvVar8 = pMVar6->data;
                local_c8 = (void *)pMVar6->elemsize;
                local_b8 = (undefined1  [8])
                           ((long)local_d8 * (long)local_e0 * (long)local_c8 + (long)pvVar8);
                local_a0 = pMVar6->elempack;
                local_98 = pMVar6->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_a8 = (size_t)local_c8;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = pMVar6[1].dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6[1].d;
                }
                local_8c = pMVar6[1].w;
                local_88 = pMVar6[1].h;
                local_a8 = pMVar6[1].elemsize;
                pvVar60 = (void *)(pMVar6[1].cstep * (long)local_e0 * local_a8 +
                                  (long)pMVar6[1].data);
                local_90 = bVar71 ^ 3;
                local_a0 = pMVar6[1].elempack;
                local_98 = pMVar6[1].allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar60;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = this_00->dims == 3;
                local_8c = this_00->w;
                local_88 = this_00->h;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = this_00->d;
                }
                local_a8 = this_00->elemsize;
                pvVar63 = (void *)(this_00->cstep * (long)local_e0 * local_a8 + (long)this_00->data)
                ;
                local_90 = bVar71 ^ 3;
                local_a0 = this_00->elempack;
                local_98 = this_00->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar63;
                Mat::~Mat((Mat *)local_b8);
                if (0 < (int)uVar65) {
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        pfVar53 = (float *)((long)pvVar8 +
                                           lVar62 + (long)local_d8 * (long)local_c8 * (long)local_e0
                                           );
                        fVar128 = pfVar53[1];
                        fVar157 = pfVar53[2];
                        fVar159 = pfVar53[3];
                        auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62);
                        pfVar52 = (float *)((long)pvVar63 + lVar62);
                        *pfVar52 = *pfVar53 - auVar93._0_4_;
                        pfVar52[1] = fVar128 - auVar93._4_4_;
                        pfVar52[2] = fVar157 - auVar93._8_4_;
                        pfVar52[3] = fVar159 - auVar93._12_4_;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar65);
                }
                local_e0 = (float *)((long)local_e0 + 1);
              } while (local_e0 != (float *)local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              bVar71 = pMVar6->dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6->d;
              }
              local_8c = pMVar6->w;
              local_88 = pMVar6->h;
              local_90 = bVar71 ^ 3;
              local_e0 = (float *)pMVar6->cstep;
              pvVar8 = pMVar6->data;
              local_d8 = (Option *)pMVar6->elemsize;
              local_b8 = (undefined1  [8])((long)local_e0 * uVar50 * (long)local_d8 + (long)pvVar8);
              local_a0 = pMVar6->elempack;
              local_98 = pMVar6->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = (size_t)local_d8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = pMVar6[1].dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6[1].d;
              }
              local_8c = pMVar6[1].w;
              local_88 = pMVar6[1].h;
              local_90 = bVar71 ^ 3;
              local_c0 = pMVar6[1].cstep;
              pvVar60 = pMVar6[1].data;
              local_a8 = pMVar6[1].elemsize;
              local_b8 = (undefined1  [8])(local_c0 * uVar50 * local_a8 + (long)pvVar60);
              local_a0 = pMVar6[1].elempack;
              local_98 = pMVar6[1].allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_70 = local_a8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = this_00->dims == 3;
              local_8c = this_00->w;
              local_88 = this_00->h;
              local_80 = 1;
              if (!bVar71) {
                local_80 = this_00->d;
              }
              local_90 = bVar71 ^ 3;
              sVar55 = this_00->cstep;
              pvVar63 = this_00->data;
              sVar7 = this_00->elemsize;
              local_b8 = (undefined1  [8])(sVar55 * uVar50 * sVar7 + (long)pvVar63);
              local_a0 = this_00->elempack;
              local_98 = this_00->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = sVar7;
              Mat::~Mat((Mat *)local_b8);
              if (0 < (int)local_c8) {
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar8 +
                                     lVar62 + (long)local_e0 * (long)local_d8 * uVar50);
                  fVar128 = pfVar53[1];
                  fVar157 = pfVar53[2];
                  fVar159 = pfVar53[3];
                  auVar93 = *(undefined1 (*) [16])
                             ((long)pvVar60 + lVar62 + local_c0 * local_70 * uVar50);
                  pfVar52 = (float *)((long)pvVar63 + lVar62 + sVar55 * sVar7 * uVar50);
                  *pfVar52 = *pfVar53 - auVar93._0_4_;
                  pfVar52[1] = fVar128 - auVar93._4_4_;
                  pfVar52[2] = fVar157 - auVar93._8_4_;
                  pfVar52[3] = fVar159 - auVar93._12_4_;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    else {
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) goto LAB_00233d22;
    }
    Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pfVar53 = (float *)((long)pMVar6->data + pMVar6->cstep * uVar51 * pMVar6->elemsize);
            fVar128 = *pfVar53;
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
              auVar144._0_4_ = fVar128 - auVar93._0_4_;
              auVar144._4_4_ = fVar157 - auVar93._4_4_;
              auVar144._8_4_ = fVar159 - auVar93._8_4_;
              auVar144._12_4_ = fVar161 - auVar93._12_4_;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar144;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  case 2:
    uVar67 = pMVar6->w;
    uVar51 = (ulong)uVar67;
    sVar55 = pMVar6->elemsize;
    uVar66 = pMVar6[1].w;
    uVar65 = pMVar6[1].h;
    uVar64 = pMVar6[1].c;
    uVar50 = (ulong)uVar64;
    local_e0 = (float *)CONCAT44(local_e0._4_4_,uVar65 * uVar66);
    local_70 = pMVar6[1].elemsize;
    iVar3 = pMVar6->dims;
    if (iVar3 == 1) {
      iVar3 = pMVar6[1].dims;
      if (iVar48 != 1 || uVar67 != 1) {
        if (iVar3 == 1) {
          Mat::create(this_00,uVar67,sVar55,iVar48,opt->blob_allocator);
          pvVar8 = this_00->data;
          if (pvVar8 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar56 != 1 || pMVar6[1].w != 1) {
            if (0 < (int)uVar67) {
              pvVar60 = pMVar6->data;
              pvVar63 = pMVar6[1].data;
              lVar62 = 0;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62);
                fVar128 = pfVar53[1];
                fVar157 = pfVar53[2];
                fVar159 = pfVar53[3];
                pfVar52 = (float *)((long)pvVar63 + lVar62);
                fVar161 = pfVar52[1];
                fVar156 = pfVar52[2];
                fVar158 = pfVar52[3];
                pfVar1 = (float *)((long)pvVar8 + lVar62);
                *pfVar1 = *pfVar52 * *pfVar53;
                pfVar1[1] = fVar161 * fVar128;
                pfVar1[2] = fVar156 * fVar157;
                pfVar1[3] = fVar158 * fVar159;
                lVar62 = lVar62 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar67) {
            fVar128 = *pMVar6[1].data;
            pvVar60 = pMVar6->data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = *pfVar53 * fVar128;
              pfVar52[1] = fVar157 * fVar128;
              pfVar52[2] = fVar159 * fVar128;
              pfVar52[3] = fVar161 * fVar128;
              lVar62 = lVar62 + 0x10;
              uVar67 = (int)uVar51 - 1;
              uVar51 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar3 == 2) {
          Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
          pauVar59 = (undefined1 (*) [16])this_00->data;
          if (pauVar59 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              pfVar53 = (float *)pMVar6->data;
              pfVar52 = (float *)pMVar6[1].data;
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  fVar128 = *pfVar53;
                  fVar157 = pfVar53[1];
                  fVar159 = pfVar53[2];
                  fVar161 = pfVar53[3];
                  uVar64 = uVar66;
                  do {
                    auVar94._0_4_ = *pfVar52 * fVar128;
                    auVar94._4_4_ = pfVar52[1] * fVar157;
                    auVar94._8_4_ = pfVar52[2] * fVar159;
                    auVar94._12_4_ = pfVar52[3] * fVar161;
                    *pauVar59 = auVar94;
                    pfVar52 = pfVar52 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar64 = uVar64 - 1;
                  } while (uVar64 != 0);
                }
                pfVar53 = pfVar53 + 4;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar3 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)local_e0) {
                sVar55 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pfVar53 = (float *)((long)pMVar6->data + uVar51 * 0x10);
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar6[1].cstep;
                sVar10 = pMVar6[1].elemsize;
                pvVar60 = pMVar6[1].data;
                lVar62 = 0;
                iVar48 = (int)local_e0;
                do {
                  pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
                  auVar82._0_4_ = *pfVar53 * fVar128;
                  auVar82._4_4_ = pfVar53[1] * fVar157;
                  auVar82._8_4_ = pfVar53[2] * fVar159;
                  auVar82._12_4_ = pfVar53[3] * fVar161;
                  *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar82;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 == 1) {
        Mat::create(this_00,uVar66,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar66) {
            fVar128 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = *pfVar53 * fVar128;
              pfVar52[1] = fVar157 * fVar128;
              pfVar52[2] = fVar159 * fVar128;
              pfVar52[3] = fVar161 * fVar128;
              lVar62 = lVar62 + 0x10;
              uVar66 = uVar66 - 1;
            } while (uVar66 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 == 2) {
        Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e0) {
            fVar128 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = *pfVar53 * fVar128;
              pfVar52[1] = fVar157 * fVar128;
              pfVar52[2] = fVar159 * fVar128;
              pfVar52[3] = fVar161 * fVar128;
              lVar62 = lVar62 + 0x10;
              local_e0._0_4_ = (int)local_e0 + -1;
            } while ((int)local_e0 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        fVar128 = *pMVar6->data;
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
              auVar77._0_4_ = *pfVar53 * fVar128;
              auVar77._4_4_ = pfVar53[1] * fVar128;
              auVar77._8_4_ = pfVar53[2] * fVar128;
              auVar77._12_4_ = pfVar53[3] * fVar128;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar77;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar4 = pMVar6->h;
    local_c8 = (void *)CONCAT44(local_c8._4_4_,uVar4 * uVar67);
    local_d8 = (Option *)uVar50;
    if (iVar3 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_00->cstep * uVar51 * this_00->elemsize + (long)this_00->data);
                pfVar53 = (float *)(pMVar6[1].cstep * uVar51 * pMVar6[1].elemsize +
                                   (long)pMVar6[1].data);
                pfVar52 = (float *)((long)pMVar6->w * uVar51 * pMVar6->elemsize + (long)pMVar6->data
                                   );
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    fVar128 = *pfVar52;
                    fVar157 = pfVar52[1];
                    fVar159 = pfVar52[2];
                    fVar161 = pfVar52[3];
                    uVar64 = uVar66;
                    do {
                      auVar76._0_4_ = *pfVar53 * fVar128;
                      auVar76._4_4_ = pfVar53[1] * fVar157;
                      auVar76._8_4_ = pfVar53[2] * fVar159;
                      auVar76._12_4_ = pfVar53[3] * fVar161;
                      *pauVar59 = auVar76;
                      pfVar53 = pfVar53 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pfVar52 = pfVar52 + 4;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e0 = (float *)CONCAT44(local_e0._4_4_,iVar56);
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pvVar8 = this_00->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_c8) {
          pvVar60 = pMVar6->data;
          pvVar63 = pMVar6[1].data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar60 + lVar62);
            fVar128 = pfVar53[1];
            fVar157 = pfVar53[2];
            fVar159 = pfVar53[3];
            pfVar52 = (float *)((long)pvVar63 + lVar62);
            fVar161 = pfVar52[1];
            fVar156 = pfVar52[2];
            fVar158 = pfVar52[3];
            pfVar1 = (float *)((long)pvVar8 + lVar62);
            *pfVar1 = *pfVar52 * *pfVar53;
            pfVar1[1] = fVar161 * fVar128;
            pfVar1[2] = fVar156 * fVar157;
            pfVar1[3] = fVar158 * fVar159;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_00->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if ((int)local_e0 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar4) {
            pfVar53 = (float *)pMVar6->data;
            pfVar52 = (float *)pMVar6[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar128 = *pfVar52;
                fVar157 = pfVar52[1];
                fVar159 = pfVar52[2];
                fVar161 = pfVar52[3];
                uVar50 = uVar51;
                do {
                  auVar119._0_4_ = *pfVar53 * fVar128;
                  auVar119._4_4_ = pfVar53[1] * fVar157;
                  auVar119._8_4_ = pfVar53[2] * fVar159;
                  auVar119._12_4_ = pfVar53[3] * fVar161;
                  *pauVar59 = auVar119;
                  pfVar53 = pfVar53 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar52 = pfVar52 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_c8) {
          fVar128 = *pMVar6[1].data;
          pvVar8 = pMVar6->data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar8 + lVar62);
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pfVar52 = (float *)((long)*pauVar59 + lVar62);
            *pfVar52 = *pfVar53 * fVar128;
            pfVar52[1] = fVar157 * fVar128;
            pfVar52[2] = fVar159 * fVar128;
            pfVar52[3] = fVar161 * fVar128;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar49 = (ulong)uVar5;
    local_c0 = sVar55;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims == 1) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar5) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pfVar53 = (float *)((long)pMVar6[1].data + uVar50 * 0x10);
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar6->cstep;
                sVar10 = pMVar6->elemsize;
                pvVar60 = pMVar6->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
                  auVar110._0_4_ = *pfVar53 * fVar128;
                  auVar110._4_4_ = pfVar53[1] * fVar157;
                  auVar110._8_4_ = pfVar53[2] * fVar159;
                  auVar110._12_4_ = pfVar53[3] * fVar161;
                  *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar110
                  ;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar49);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar5) {
          fVar128 = *pMVar6[1].data;
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar8 = this_00->data;
              sVar9 = pMVar6->cstep;
              sVar10 = pMVar6->elemsize;
              pvVar60 = pMVar6->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
                auVar100._0_4_ = *pfVar53 * fVar128;
                auVar100._4_4_ = pfVar53[1] * fVar128;
                auVar100._8_4_ = pfVar53[2] * fVar128;
                auVar100._12_4_ = pfVar53[3] * fVar128;
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar100;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar5) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar4) {
            pauVar59 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            pfVar53 = (float *)((long)pMVar6[1].w * uVar50 * pMVar6[1].elemsize +
                               (long)pMVar6[1].data);
            pfVar52 = (float *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                uVar68 = uVar51;
                do {
                  auVar83._0_4_ = *pfVar52 * fVar128;
                  auVar83._4_4_ = pfVar52[1] * fVar157;
                  auVar83._8_4_ = pfVar52[2] * fVar159;
                  auVar83._12_4_ = pfVar52[3] * fVar161;
                  *pauVar59 = auVar83;
                  pfVar52 = pfVar52 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar68 - 1;
                  uVar68 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar53 = pfVar53 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar49);
        return 0;
      }
      return 0;
    }
    if (uVar5 == uVar64 && ((uVar66 ^ 1) == 0 && (uVar65 ^ 1) == 0)) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar5) {
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = pMVar6->cstep;
              sVar7 = pMVar6->elemsize;
              pfVar53 = (float *)((long)pMVar6[1].data +
                                 pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize);
              fVar128 = *pfVar53;
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pvVar8 = pMVar6->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                auVar73._0_4_ = *pfVar53 * fVar128;
                auVar73._4_4_ = pfVar53[1] * fVar157;
                auVar73._8_4_ = pfVar53[2] * fVar159;
                auVar73._12_4_ = pfVar53[3] * fVar161;
                *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50) = auVar73;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = uVar49;
    if (uVar66 == uVar67) {
      if (iVar56 == 1 && (uVar64 == 1 && uVar65 == uVar4)) {
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = pMVar6->cstep;
                sVar7 = pMVar6->elemsize;
                sVar9 = this_00->cstep;
                pvVar8 = pMVar6->data;
                pvVar60 = pMVar6[1].data;
                sVar10 = this_00->elemsize;
                pvVar63 = this_00->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar50);
                  fVar128 = *(float *)((long)pvVar60 + lVar62);
                  auVar89._0_4_ = fVar128 * *pfVar53;
                  auVar89._4_4_ = fVar128 * pfVar53[1];
                  auVar89._8_4_ = fVar128 * pfVar53[2];
                  auVar89._12_4_ = fVar128 * pfVar53[3];
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar50) =
                       auVar89;
                  lVar62 = lVar62 + 4;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) {
        if (((iVar48 == 1) && (uVar65 == uVar4)) && (uVar5 == 1)) {
          Mat::create(this_00,uVar67,uVar4,uVar64,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar64) {
              uVar51 = 0;
              do {
                if (0 < (int)local_e0) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  sVar9 = this_00->cstep;
                  pvVar8 = pMVar6[1].data;
                  pvVar60 = pMVar6->data;
                  sVar10 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar62 = 0;
                  iVar48 = (int)local_e0;
                  do {
                    fVar128 = *(float *)((long)pvVar60 + lVar62);
                    pfVar53 = (float *)((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar51);
                    auVar113._0_4_ = *pfVar53 * fVar128;
                    auVar113._4_4_ = pfVar53[1] * fVar128;
                    auVar113._8_4_ = pfVar53[2] * fVar128;
                    auVar113._12_4_ = pfVar53[3] * fVar128;
                    *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar51) =
                         auVar113;
                    lVar62 = lVar62 + 4;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
LAB_0023320a:
        if ((((uVar66 ^ 1) == 0 && uVar65 == uVar4) && uVar5 == uVar64) && uVar67 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  pvVar8 = pMVar6[1].data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pfVar53 = (float *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data
                                     );
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      pfVar52 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      fVar128 = *pfVar52;
                      fVar157 = pfVar52[1];
                      fVar159 = pfVar52[2];
                      fVar161 = pfVar52[3];
                      uVar66 = uVar67;
                      do {
                        auVar97._0_4_ = *pfVar53 * fVar128;
                        auVar97._4_4_ = pfVar53[1] * fVar157;
                        auVar97._8_4_ = pfVar53[2] * fVar159;
                        auVar97._12_4_ = pfVar53[3] * fVar161;
                        *pauVar59 = auVar97;
                        pfVar53 = pfVar53 + 4;
                        pauVar59 = pauVar59 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar66 == uVar67 && (uVar65 ^ 1) == 0) && uVar5 == uVar64) && uVar4 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].elemsize;
                  pvVar60 = (void *)(this_00->cstep * uVar50 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar63 = (void *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data)
                  ;
                  sVar7 = pMVar6[1].cstep;
                  pvVar8 = pMVar6[1].data;
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        pfVar53 = (float *)((long)pvVar63 + lVar62);
                        pfVar52 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                        auVar107._0_4_ = *pfVar52 * *pfVar53;
                        auVar107._4_4_ = pfVar52[1] * pfVar53[1];
                        auVar107._8_4_ = pfVar52[2] * pfVar53[2];
                        auVar107._12_4_ = pfVar52[3] * pfVar53[3];
                        *(undefined1 (*) [16])((long)pvVar60 + lVar62) = auVar107;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar64 == uVar5 && uVar65 == uVar4) & uVar66 != 1 & (byte)local_68) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar66,uVar4,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar5) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6->cstep;
                  sVar7 = pMVar6->elemsize;
                  pvVar8 = pMVar6->data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pfVar53 = (float *)(pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize +
                                     (long)pMVar6[1].data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar66) {
                      pfVar52 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      fVar128 = *pfVar52;
                      fVar157 = pfVar52[1];
                      fVar159 = pfVar52[2];
                      fVar161 = pfVar52[3];
                      uVar67 = uVar66;
                      do {
                        auVar116._0_4_ = *pfVar53 * fVar128;
                        auVar116._4_4_ = pfVar53[1] * fVar157;
                        auVar116._8_4_ = pfVar53[2] * fVar159;
                        auVar116._12_4_ = pfVar53[3] * fVar161;
                        *pauVar59 = auVar116;
                        pfVar53 = pfVar53 + 4;
                        pauVar59 = pauVar59 + 1;
                        uVar67 = uVar67 - 1;
                      } while (uVar67 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != uVar49);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((byte)local_60 & uVar64 == uVar5 & (uVar65 != 1 && uVar66 == uVar67)) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar65,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              local_e0 = (float *)0x0;
              do {
                bVar71 = pMVar6->dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6->d;
                }
                local_8c = pMVar6->w;
                local_88 = pMVar6->h;
                local_90 = bVar71 ^ 3;
                local_d8 = (Option *)pMVar6->cstep;
                pvVar8 = pMVar6->data;
                local_c8 = (void *)pMVar6->elemsize;
                local_b8 = (undefined1  [8])
                           ((long)local_d8 * (long)local_e0 * (long)local_c8 + (long)pvVar8);
                local_a0 = pMVar6->elempack;
                local_98 = pMVar6->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_a8 = (size_t)local_c8;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = pMVar6[1].dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6[1].d;
                }
                local_8c = pMVar6[1].w;
                local_88 = pMVar6[1].h;
                local_a8 = pMVar6[1].elemsize;
                pvVar60 = (void *)(pMVar6[1].cstep * (long)local_e0 * local_a8 +
                                  (long)pMVar6[1].data);
                local_90 = bVar71 ^ 3;
                local_a0 = pMVar6[1].elempack;
                local_98 = pMVar6[1].allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar60;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = this_00->dims == 3;
                local_8c = this_00->w;
                local_88 = this_00->h;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = this_00->d;
                }
                local_a8 = this_00->elemsize;
                pvVar63 = (void *)(this_00->cstep * (long)local_e0 * local_a8 + (long)this_00->data)
                ;
                local_90 = bVar71 ^ 3;
                local_a0 = this_00->elempack;
                local_98 = this_00->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar63;
                Mat::~Mat((Mat *)local_b8);
                if (0 < (int)uVar65) {
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        pfVar53 = (float *)((long)pvVar8 +
                                           lVar62 + (long)local_d8 * (long)local_c8 * (long)local_e0
                                           );
                        pfVar52 = (float *)((long)pvVar60 + lVar62);
                        auVar122._0_4_ = *pfVar52 * *pfVar53;
                        auVar122._4_4_ = pfVar52[1] * pfVar53[1];
                        auVar122._8_4_ = pfVar52[2] * pfVar53[2];
                        auVar122._12_4_ = pfVar52[3] * pfVar53[3];
                        *(undefined1 (*) [16])((long)pvVar63 + lVar62) = auVar122;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar65);
                }
                local_e0 = (float *)((long)local_e0 + 1);
              } while (local_e0 != (float *)local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              bVar71 = pMVar6->dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6->d;
              }
              local_8c = pMVar6->w;
              local_88 = pMVar6->h;
              local_90 = bVar71 ^ 3;
              local_e0 = (float *)pMVar6->cstep;
              pvVar8 = pMVar6->data;
              local_d8 = (Option *)pMVar6->elemsize;
              local_b8 = (undefined1  [8])((long)local_e0 * uVar50 * (long)local_d8 + (long)pvVar8);
              local_a0 = pMVar6->elempack;
              local_98 = pMVar6->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = (size_t)local_d8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = pMVar6[1].dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6[1].d;
              }
              local_8c = pMVar6[1].w;
              local_88 = pMVar6[1].h;
              local_90 = bVar71 ^ 3;
              local_c0 = pMVar6[1].cstep;
              pvVar60 = pMVar6[1].data;
              local_a8 = pMVar6[1].elemsize;
              local_b8 = (undefined1  [8])(local_c0 * uVar50 * local_a8 + (long)pvVar60);
              local_a0 = pMVar6[1].elempack;
              local_98 = pMVar6[1].allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_70 = local_a8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = this_00->dims == 3;
              local_8c = this_00->w;
              local_88 = this_00->h;
              local_80 = 1;
              if (!bVar71) {
                local_80 = this_00->d;
              }
              local_90 = bVar71 ^ 3;
              sVar55 = this_00->cstep;
              pvVar63 = this_00->data;
              sVar7 = this_00->elemsize;
              local_b8 = (undefined1  [8])(sVar55 * uVar50 * sVar7 + (long)pvVar63);
              local_a0 = this_00->elempack;
              local_98 = this_00->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = sVar7;
              Mat::~Mat((Mat *)local_b8);
              if (0 < (int)local_c8) {
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar8 +
                                     lVar62 + (long)local_e0 * (long)local_d8 * uVar50);
                  pfVar52 = (float *)((long)pvVar60 + lVar62 + local_c0 * local_70 * uVar50);
                  auVar125._0_4_ = *pfVar52 * *pfVar53;
                  auVar125._4_4_ = pfVar52[1] * pfVar53[1];
                  auVar125._8_4_ = pfVar52[2] * pfVar53[2];
                  auVar125._12_4_ = pfVar52[3] * pfVar53[3];
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 + sVar55 * sVar7 * uVar50) =
                       auVar125;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    else {
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) goto LAB_0023320a;
    }
    Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pfVar53 = (float *)((long)pMVar6->data + pMVar6->cstep * uVar51 * pMVar6->elemsize);
            fVar128 = *pfVar53;
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
              auVar104._0_4_ = *pfVar53 * fVar128;
              auVar104._4_4_ = pfVar53[1] * fVar157;
              auVar104._8_4_ = pfVar53[2] * fVar159;
              auVar104._12_4_ = pfVar53[3] * fVar161;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar104;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  case 3:
    uVar67 = pMVar6->w;
    uVar51 = (ulong)uVar67;
    sVar55 = pMVar6->elemsize;
    uVar66 = pMVar6[1].w;
    uVar65 = pMVar6[1].h;
    uVar64 = pMVar6[1].c;
    uVar50 = (ulong)uVar64;
    local_e0 = (float *)CONCAT44(local_e0._4_4_,uVar65 * uVar66);
    local_70 = pMVar6[1].elemsize;
    iVar3 = pMVar6->dims;
    if (iVar3 == 1) {
      iVar3 = pMVar6[1].dims;
      if (iVar48 != 1 || uVar67 != 1) {
        if (iVar3 == 1) {
          Mat::create(this_00,uVar67,sVar55,iVar48,opt->blob_allocator);
          pvVar8 = this_00->data;
          if (pvVar8 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar56 != 1 || pMVar6[1].w != 1) {
            if (0 < (int)uVar67) {
              pvVar60 = pMVar6->data;
              pvVar63 = pMVar6[1].data;
              lVar62 = 0;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62);
                fVar128 = pfVar53[1];
                fVar157 = pfVar53[2];
                fVar159 = pfVar53[3];
                auVar93 = *(undefined1 (*) [16])((long)pvVar63 + lVar62);
                in_XMM2 = rcpps(in_XMM2,auVar93);
                fVar161 = *pfVar53 * in_XMM2._0_4_;
                fVar156 = fVar128 * in_XMM2._4_4_;
                fVar158 = fVar157 * in_XMM2._8_4_;
                fVar160 = fVar159 * in_XMM2._12_4_;
                pfVar52 = (float *)((long)pvVar8 + lVar62);
                *pfVar52 = (*pfVar53 - auVar93._0_4_ * fVar161) * in_XMM2._0_4_ + fVar161;
                pfVar52[1] = (fVar128 - auVar93._4_4_ * fVar156) * in_XMM2._4_4_ + fVar156;
                pfVar52[2] = (fVar157 - auVar93._8_4_ * fVar158) * in_XMM2._8_4_ + fVar158;
                pfVar52[3] = (fVar159 - auVar93._12_4_ * fVar160) * in_XMM2._12_4_ + fVar160;
                lVar62 = lVar62 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar67) {
            fVar128 = 1.0 / *pMVar6[1].data;
            pvVar60 = pMVar6->data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = *pfVar53 * fVar128;
              pfVar52[1] = fVar157 * fVar128;
              pfVar52[2] = fVar159 * fVar128;
              pfVar52[3] = fVar161 * fVar128;
              lVar62 = lVar62 + 0x10;
              uVar67 = (int)uVar51 - 1;
              uVar51 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar3 == 2) {
          Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
          pfVar53 = (float *)this_00->data;
          if (pfVar53 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              pfVar52 = (float *)pMVar6->data;
              pauVar59 = (undefined1 (*) [16])pMVar6[1].data;
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  fVar128 = *pfVar52;
                  fVar157 = pfVar52[1];
                  fVar159 = pfVar52[2];
                  fVar161 = pfVar52[3];
                  uVar64 = uVar66;
                  do {
                    auVar93 = *pauVar59;
                    in_XMM2 = rcpps(in_XMM2,auVar93);
                    fVar156 = fVar128 * in_XMM2._0_4_;
                    fVar158 = fVar157 * in_XMM2._4_4_;
                    fVar160 = fVar159 * in_XMM2._8_4_;
                    fVar162 = fVar161 * in_XMM2._12_4_;
                    *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
                    pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                    pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                    pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
                    pauVar59 = pauVar59 + 1;
                    pfVar53 = pfVar53 + 4;
                    uVar64 = uVar64 - 1;
                  } while (uVar64 != 0);
                }
                pfVar52 = pfVar52 + 4;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar3 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_e0) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pfVar53 = (float *)((long)pMVar6->data + uVar51 * 0x10);
              fVar128 = *pfVar53;
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pvVar8 = this_00->data;
              sVar9 = pMVar6[1].cstep;
              sVar10 = pMVar6[1].elemsize;
              pvVar60 = pMVar6[1].data;
              lVar62 = 0;
              iVar48 = (int)local_e0;
              do {
                auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
                in_XMM2 = rcpps(in_XMM2,auVar93);
                fVar156 = fVar128 * in_XMM2._0_4_;
                fVar158 = fVar157 * in_XMM2._4_4_;
                fVar160 = fVar159 * in_XMM2._8_4_;
                fVar162 = fVar161 * in_XMM2._12_4_;
                pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51);
                *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
                pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      if (iVar3 == 1) {
        Mat::create(this_00,uVar66,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar66) {
            fVar128 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62);
              in_XMM2 = rcpps(in_XMM2,auVar93);
              fVar157 = fVar128 * in_XMM2._0_4_;
              fVar159 = fVar128 * in_XMM2._4_4_;
              fVar161 = fVar128 * in_XMM2._8_4_;
              fVar156 = fVar128 * in_XMM2._12_4_;
              pfVar53 = (float *)((long)pvVar8 + lVar62);
              *pfVar53 = (fVar128 - auVar93._0_4_ * fVar157) * in_XMM2._0_4_ + fVar157;
              pfVar53[1] = (fVar128 - auVar93._4_4_ * fVar159) * in_XMM2._4_4_ + fVar159;
              pfVar53[2] = (fVar128 - auVar93._8_4_ * fVar161) * in_XMM2._8_4_ + fVar161;
              pfVar53[3] = (fVar128 - auVar93._12_4_ * fVar156) * in_XMM2._12_4_ + fVar156;
              lVar62 = lVar62 + 0x10;
              uVar66 = uVar66 - 1;
            } while (uVar66 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 == 2) {
        Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e0) {
            fVar128 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62);
              in_XMM2 = rcpps(in_XMM2,auVar93);
              fVar157 = fVar128 * in_XMM2._0_4_;
              fVar159 = fVar128 * in_XMM2._4_4_;
              fVar161 = fVar128 * in_XMM2._8_4_;
              fVar156 = fVar128 * in_XMM2._12_4_;
              pfVar53 = (float *)((long)pvVar8 + lVar62);
              *pfVar53 = (fVar128 - auVar93._0_4_ * fVar157) * in_XMM2._0_4_ + fVar157;
              pfVar53[1] = (fVar128 - auVar93._4_4_ * fVar159) * in_XMM2._4_4_ + fVar159;
              pfVar53[2] = (fVar128 - auVar93._8_4_ * fVar161) * in_XMM2._8_4_ + fVar161;
              pfVar53[3] = (fVar128 - auVar93._12_4_ * fVar156) * in_XMM2._12_4_ + fVar156;
              lVar62 = lVar62 + 0x10;
              local_e0._0_4_ = (int)local_e0 + -1;
            } while ((int)local_e0 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        fVar128 = *pMVar6->data;
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
              in_XMM2 = rcpps(in_XMM2,auVar93);
              fVar157 = fVar128 * in_XMM2._0_4_;
              fVar159 = fVar128 * in_XMM2._4_4_;
              fVar161 = fVar128 * in_XMM2._8_4_;
              fVar156 = fVar128 * in_XMM2._12_4_;
              pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51);
              *pfVar53 = (fVar128 - auVar93._0_4_ * fVar157) * in_XMM2._0_4_ + fVar157;
              pfVar53[1] = (fVar128 - auVar93._4_4_ * fVar159) * in_XMM2._4_4_ + fVar159;
              pfVar53[2] = (fVar128 - auVar93._8_4_ * fVar161) * in_XMM2._8_4_ + fVar161;
              pfVar53[3] = (fVar128 - auVar93._12_4_ * fVar156) * in_XMM2._12_4_ + fVar156;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar4 = pMVar6->h;
    local_c8 = (void *)CONCAT44(local_c8._4_4_,uVar4 * uVar67);
    local_d8 = (Option *)uVar50;
    if (iVar3 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pfVar53 = (float *)(this_00->cstep * uVar51 * this_00->elemsize +
                                   (long)this_00->data);
                pauVar59 = (undefined1 (*) [16])
                           (pMVar6[1].cstep * uVar51 * pMVar6[1].elemsize + (long)pMVar6[1].data);
                pfVar52 = (float *)((long)pMVar6->w * uVar51 * pMVar6->elemsize + (long)pMVar6->data
                                   );
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    fVar128 = *pfVar52;
                    fVar157 = pfVar52[1];
                    fVar159 = pfVar52[2];
                    fVar161 = pfVar52[3];
                    uVar64 = uVar66;
                    do {
                      auVar93 = *pauVar59;
                      in_XMM2 = rcpps(in_XMM2,auVar93);
                      fVar156 = fVar128 * in_XMM2._0_4_;
                      fVar158 = fVar157 * in_XMM2._4_4_;
                      fVar160 = fVar159 * in_XMM2._8_4_;
                      fVar162 = fVar161 * in_XMM2._12_4_;
                      *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
                      pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                      pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                      pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
                      pauVar59 = pauVar59 + 1;
                      pfVar53 = pfVar53 + 4;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pfVar52 = pfVar52 + 4;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pvVar8 = this_00->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_c8) {
          pvVar60 = pMVar6->data;
          pvVar63 = pMVar6[1].data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar60 + lVar62);
            fVar128 = pfVar53[1];
            fVar157 = pfVar53[2];
            fVar159 = pfVar53[3];
            auVar93 = *(undefined1 (*) [16])((long)pvVar63 + lVar62);
            in_XMM2 = rcpps(in_XMM2,auVar93);
            fVar161 = *pfVar53 * in_XMM2._0_4_;
            fVar156 = fVar128 * in_XMM2._4_4_;
            fVar158 = fVar157 * in_XMM2._8_4_;
            fVar160 = fVar159 * in_XMM2._12_4_;
            pfVar52 = (float *)((long)pvVar8 + lVar62);
            *pfVar52 = (*pfVar53 - auVar93._0_4_ * fVar161) * in_XMM2._0_4_ + fVar161;
            pfVar52[1] = (fVar128 - auVar93._4_4_ * fVar156) * in_XMM2._4_4_ + fVar156;
            pfVar52[2] = (fVar157 - auVar93._8_4_ * fVar158) * in_XMM2._8_4_ + fVar158;
            pfVar52[3] = (fVar159 - auVar93._12_4_ * fVar160) * in_XMM2._12_4_ + fVar160;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_00->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar4) {
            pfVar53 = (float *)pMVar6->data;
            pauVar57 = (undefined1 (*) [16])pMVar6[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar93 = *pauVar57;
                in_XMM3 = rcpps(in_XMM3,auVar93);
                fVar128 = in_XMM3._0_4_;
                fVar157 = in_XMM3._4_4_;
                fVar159 = in_XMM3._8_4_;
                fVar161 = in_XMM3._12_4_;
                uVar50 = uVar51;
                do {
                  auVar152._0_4_ = *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128);
                  auVar152._4_4_ =
                       pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
                  auVar152._8_4_ =
                       pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
                  auVar152._12_4_ =
                       pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
                  *pauVar59 = auVar152;
                  pfVar53 = pfVar53 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_c8) {
          fVar128 = 1.0 / *pMVar6[1].data;
          pvVar8 = pMVar6->data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar8 + lVar62);
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pfVar52 = (float *)((long)*pauVar59 + lVar62);
            *pfVar52 = *pfVar53 * fVar128;
            pfVar52[1] = fVar157 * fVar128;
            pfVar52[2] = fVar159 * fVar128;
            pfVar52[3] = fVar161 * fVar128;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar49 = (ulong)uVar5;
    local_c0 = sVar55;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims == 1) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar5) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = pMVar6->cstep;
                auVar93 = *(undefined1 (*) [16])((long)pMVar6[1].data + uVar50 * 0x10);
                in_XMM3 = rcpps(in_XMM3,auVar93);
                fVar128 = in_XMM3._0_4_;
                fVar157 = in_XMM3._4_4_;
                fVar159 = in_XMM3._8_4_;
                fVar161 = in_XMM3._12_4_;
                sVar7 = this_00->cstep;
                sVar9 = this_00->elemsize;
                pvVar8 = this_00->data;
                sVar10 = pMVar6->elemsize;
                pvVar60 = pMVar6->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar55 * sVar10 * uVar50);
                  auVar147._0_4_ = *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128);
                  auVar147._4_4_ =
                       pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
                  auVar147._8_4_ =
                       pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
                  auVar147._12_4_ =
                       pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
                  *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar7 * sVar9 * uVar50) = auVar147;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar49);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar5) {
          fVar128 = 1.0 / *pMVar6[1].data;
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar8 = this_00->data;
              sVar9 = pMVar6->cstep;
              sVar10 = pMVar6->elemsize;
              pvVar60 = pMVar6->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
                auVar101._0_4_ = *pfVar53 * fVar128;
                auVar101._4_4_ = pfVar53[1] * fVar128;
                auVar101._8_4_ = pfVar53[2] * fVar128;
                auVar101._12_4_ = pfVar53[3] * fVar128;
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar101;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar5) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar4) {
            pauVar59 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            pauVar57 = (undefined1 (*) [16])
                       ((long)pMVar6[1].w * uVar50 * pMVar6[1].elemsize + (long)pMVar6[1].data);
            pfVar53 = (float *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar93 = *pauVar57;
                in_XMM3 = rcpps(in_XMM3,auVar93);
                fVar128 = in_XMM3._0_4_;
                fVar157 = in_XMM3._4_4_;
                fVar159 = in_XMM3._8_4_;
                fVar161 = in_XMM3._12_4_;
                uVar68 = uVar51;
                do {
                  auVar134._0_4_ = *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128);
                  auVar134._4_4_ =
                       pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
                  auVar134._8_4_ =
                       pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
                  auVar134._12_4_ =
                       pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
                  *pauVar59 = auVar134;
                  pfVar53 = pfVar53 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar68 - 1;
                  uVar68 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar49);
        return 0;
      }
      return 0;
    }
    if (uVar5 == uVar64 && ((uVar66 ^ 1) == 0 && (uVar65 ^ 1) == 0)) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar5) {
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = pMVar6->cstep;
              auVar93 = *(undefined1 (*) [16])
                         ((long)pMVar6[1].data + pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize);
              in_XMM3 = rcpps(in_XMM3,auVar93);
              fVar128 = in_XMM3._0_4_;
              fVar157 = in_XMM3._4_4_;
              fVar159 = in_XMM3._8_4_;
              fVar161 = in_XMM3._12_4_;
              sVar7 = pMVar6->elemsize;
              pvVar8 = pMVar6->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                auVar129._0_4_ = *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128);
                auVar129._4_4_ = pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
                auVar129._8_4_ = pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
                auVar129._12_4_ =
                     pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
                *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50) = auVar129;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = uVar49;
    if (uVar66 == uVar67) {
      if (iVar56 == 1 && (uVar64 == 1 && uVar65 == uVar4)) {
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = pMVar6->cstep;
                sVar7 = pMVar6->elemsize;
                sVar9 = this_00->cstep;
                pvVar8 = pMVar6->data;
                pvVar60 = pMVar6[1].data;
                sVar10 = this_00->elemsize;
                pvVar63 = this_00->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  auVar93 = *(undefined1 (*) [16])
                             ((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar50);
                  fVar128 = 1.0 / *(float *)((long)pvVar60 + lVar62);
                  auVar138._0_4_ = fVar128 * auVar93._0_4_;
                  auVar138._4_4_ = fVar128 * auVar93._4_4_;
                  auVar138._8_4_ = fVar128 * auVar93._8_4_;
                  auVar138._12_4_ = fVar128 * auVar93._12_4_;
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar50) =
                       auVar138;
                  lVar62 = lVar62 + 4;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) {
        if (((iVar48 == 1) && (uVar65 == uVar4)) && (uVar5 == 1)) {
          Mat::create(this_00,uVar67,uVar4,uVar64,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar64) {
              uVar51 = 0;
              do {
                if (0 < (int)local_e0) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  sVar9 = this_00->cstep;
                  pvVar8 = pMVar6[1].data;
                  pvVar60 = pMVar6->data;
                  sVar10 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar62 = 0;
                  iVar48 = (int)local_e0;
                  do {
                    fVar128 = *(float *)((long)pvVar60 + lVar62);
                    auVar93 = *(undefined1 (*) [16])
                               ((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar51);
                    in_XMM2 = rcpps(in_XMM2,auVar93);
                    fVar157 = fVar128 * in_XMM2._0_4_;
                    fVar159 = fVar128 * in_XMM2._4_4_;
                    fVar161 = fVar128 * in_XMM2._8_4_;
                    fVar156 = fVar128 * in_XMM2._12_4_;
                    pfVar53 = (float *)((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar51);
                    *pfVar53 = (fVar128 - auVar93._0_4_ * fVar157) * in_XMM2._0_4_ + fVar157;
                    pfVar53[1] = (fVar128 - auVar93._4_4_ * fVar159) * in_XMM2._4_4_ + fVar159;
                    pfVar53[2] = (fVar128 - auVar93._8_4_ * fVar161) * in_XMM2._8_4_ + fVar161;
                    pfVar53[3] = (fVar128 - auVar93._12_4_ * fVar156) * in_XMM2._12_4_ + fVar156;
                    lVar62 = lVar62 + 4;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
LAB_002337d6:
        if ((((uVar66 ^ 1) == 0 && uVar65 == uVar4) && uVar5 == uVar64) && uVar67 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  pvVar8 = pMVar6[1].data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pfVar53 = (float *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data
                                     );
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      auVar93 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      in_XMM3 = rcpps(in_XMM3,auVar93);
                      fVar128 = in_XMM3._0_4_;
                      fVar157 = in_XMM3._4_4_;
                      fVar159 = in_XMM3._8_4_;
                      fVar161 = in_XMM3._12_4_;
                      uVar66 = uVar67;
                      do {
                        auVar141._0_4_ =
                             *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128);
                        auVar141._4_4_ =
                             pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
                        auVar141._8_4_ =
                             pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
                        auVar141._12_4_ =
                             pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
                        *pauVar59 = auVar141;
                        pfVar53 = pfVar53 + 4;
                        pauVar59 = pauVar59 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar66 == uVar67 && (uVar65 ^ 1) == 0) && uVar5 == uVar64) && uVar4 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].elemsize;
                  pvVar60 = (void *)(this_00->cstep * uVar50 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar63 = (void *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data)
                  ;
                  sVar7 = pMVar6[1].cstep;
                  pvVar8 = pMVar6[1].data;
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        pfVar53 = (float *)((long)pvVar63 + lVar62);
                        fVar128 = pfVar53[1];
                        fVar157 = pfVar53[2];
                        fVar159 = pfVar53[3];
                        auVar93 = *(undefined1 (*) [16])
                                   ((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                        in_XMM2 = rcpps(in_XMM2,auVar93);
                        fVar161 = *pfVar53 * in_XMM2._0_4_;
                        fVar156 = fVar128 * in_XMM2._4_4_;
                        fVar158 = fVar157 * in_XMM2._8_4_;
                        fVar160 = fVar159 * in_XMM2._12_4_;
                        pfVar52 = (float *)((long)pvVar60 + lVar62);
                        *pfVar52 = (*pfVar53 - auVar93._0_4_ * fVar161) * in_XMM2._0_4_ + fVar161;
                        pfVar52[1] = (fVar128 - auVar93._4_4_ * fVar156) * in_XMM2._4_4_ + fVar156;
                        pfVar52[2] = (fVar157 - auVar93._8_4_ * fVar158) * in_XMM2._8_4_ + fVar158;
                        pfVar52[3] = (fVar159 - auVar93._12_4_ * fVar160) * in_XMM2._12_4_ + fVar160
                        ;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar64 == uVar5 && uVar65 == uVar4) & uVar66 != 1 & (byte)local_68) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar66,uVar4,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar5) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6->cstep;
                  sVar7 = pMVar6->elemsize;
                  pvVar8 = pMVar6->data;
                  pfVar53 = (float *)(this_00->cstep * uVar50 * this_00->elemsize +
                                     (long)this_00->data);
                  pauVar59 = (undefined1 (*) [16])
                             (pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize + (long)pMVar6[1].data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar66) {
                      pfVar52 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      fVar128 = *pfVar52;
                      fVar157 = pfVar52[1];
                      fVar159 = pfVar52[2];
                      fVar161 = pfVar52[3];
                      uVar67 = uVar66;
                      do {
                        auVar93 = *pauVar59;
                        in_XMM2 = rcpps(in_XMM2,auVar93);
                        fVar156 = fVar128 * in_XMM2._0_4_;
                        fVar158 = fVar157 * in_XMM2._4_4_;
                        fVar160 = fVar159 * in_XMM2._8_4_;
                        fVar162 = fVar161 * in_XMM2._12_4_;
                        *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
                        pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                        pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                        pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162
                        ;
                        pauVar59 = pauVar59 + 1;
                        pfVar53 = pfVar53 + 4;
                        uVar67 = uVar67 - 1;
                      } while (uVar67 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != uVar49);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((byte)local_60 & uVar64 == uVar5 & (uVar65 != 1 && uVar66 == uVar67)) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar65,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              local_e0 = (float *)0x0;
              do {
                bVar71 = pMVar6->dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6->d;
                }
                local_8c = pMVar6->w;
                local_88 = pMVar6->h;
                local_90 = bVar71 ^ 3;
                local_d8 = (Option *)pMVar6->cstep;
                pvVar8 = pMVar6->data;
                local_c8 = (void *)pMVar6->elemsize;
                local_b8 = (undefined1  [8])
                           ((long)local_d8 * (long)local_e0 * (long)local_c8 + (long)pvVar8);
                local_a0 = pMVar6->elempack;
                local_98 = pMVar6->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_a8 = (size_t)local_c8;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = pMVar6[1].dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6[1].d;
                }
                local_8c = pMVar6[1].w;
                local_88 = pMVar6[1].h;
                local_a8 = pMVar6[1].elemsize;
                pvVar60 = (void *)(pMVar6[1].cstep * (long)local_e0 * local_a8 +
                                  (long)pMVar6[1].data);
                local_90 = bVar71 ^ 3;
                local_a0 = pMVar6[1].elempack;
                local_98 = pMVar6[1].allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar60;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = this_00->dims == 3;
                local_8c = this_00->w;
                local_88 = this_00->h;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = this_00->d;
                }
                local_a8 = this_00->elemsize;
                pvVar63 = (void *)(this_00->cstep * (long)local_e0 * local_a8 + (long)this_00->data)
                ;
                local_90 = bVar71 ^ 3;
                local_a0 = this_00->elempack;
                local_98 = this_00->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar63;
                Mat::~Mat((Mat *)local_b8);
                if (0 < (int)uVar65) {
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        pfVar53 = (float *)((long)pvVar8 +
                                           lVar62 + (long)local_d8 * (long)local_c8 * (long)local_e0
                                           );
                        fVar128 = pfVar53[1];
                        fVar157 = pfVar53[2];
                        fVar159 = pfVar53[3];
                        auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62);
                        in_XMM2 = rcpps(in_XMM2,auVar93);
                        fVar161 = *pfVar53 * in_XMM2._0_4_;
                        fVar156 = fVar128 * in_XMM2._4_4_;
                        fVar158 = fVar157 * in_XMM2._8_4_;
                        fVar160 = fVar159 * in_XMM2._12_4_;
                        pfVar52 = (float *)((long)pvVar63 + lVar62);
                        *pfVar52 = (*pfVar53 - auVar93._0_4_ * fVar161) * in_XMM2._0_4_ + fVar161;
                        pfVar52[1] = (fVar128 - auVar93._4_4_ * fVar156) * in_XMM2._4_4_ + fVar156;
                        pfVar52[2] = (fVar157 - auVar93._8_4_ * fVar158) * in_XMM2._8_4_ + fVar158;
                        pfVar52[3] = (fVar159 - auVar93._12_4_ * fVar160) * in_XMM2._12_4_ + fVar160
                        ;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar65);
                }
                local_e0 = (float *)((long)local_e0 + 1);
              } while (local_e0 != (float *)local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              bVar71 = pMVar6->dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6->d;
              }
              local_8c = pMVar6->w;
              local_88 = pMVar6->h;
              local_90 = bVar71 ^ 3;
              local_e0 = (float *)pMVar6->cstep;
              pvVar8 = pMVar6->data;
              local_d8 = (Option *)pMVar6->elemsize;
              local_b8 = (undefined1  [8])((long)local_e0 * uVar50 * (long)local_d8 + (long)pvVar8);
              local_a0 = pMVar6->elempack;
              local_98 = pMVar6->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = (size_t)local_d8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = pMVar6[1].dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6[1].d;
              }
              local_8c = pMVar6[1].w;
              local_88 = pMVar6[1].h;
              local_90 = bVar71 ^ 3;
              local_c0 = pMVar6[1].cstep;
              pvVar60 = pMVar6[1].data;
              local_a8 = pMVar6[1].elemsize;
              local_b8 = (undefined1  [8])(local_c0 * uVar50 * local_a8 + (long)pvVar60);
              local_a0 = pMVar6[1].elempack;
              local_98 = pMVar6[1].allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_70 = local_a8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = this_00->dims == 3;
              local_8c = this_00->w;
              local_88 = this_00->h;
              local_80 = 1;
              if (!bVar71) {
                local_80 = this_00->d;
              }
              local_90 = bVar71 ^ 3;
              sVar55 = this_00->cstep;
              pvVar63 = this_00->data;
              sVar7 = this_00->elemsize;
              local_b8 = (undefined1  [8])(sVar55 * uVar50 * sVar7 + (long)pvVar63);
              local_a0 = this_00->elempack;
              local_98 = this_00->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = sVar7;
              Mat::~Mat((Mat *)local_b8);
              if (0 < (int)local_c8) {
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar8 +
                                     lVar62 + (long)local_e0 * (long)local_d8 * uVar50);
                  fVar128 = pfVar53[1];
                  fVar157 = pfVar53[2];
                  fVar159 = pfVar53[3];
                  auVar93 = *(undefined1 (*) [16])
                             ((long)pvVar60 + lVar62 + local_c0 * local_70 * uVar50);
                  in_XMM2 = rcpps(in_XMM2,auVar93);
                  fVar161 = *pfVar53 * in_XMM2._0_4_;
                  fVar156 = fVar128 * in_XMM2._4_4_;
                  fVar158 = fVar157 * in_XMM2._8_4_;
                  fVar160 = fVar159 * in_XMM2._12_4_;
                  pfVar52 = (float *)((long)pvVar63 + lVar62 + sVar55 * sVar7 * uVar50);
                  *pfVar52 = (*pfVar53 - auVar93._0_4_ * fVar161) * in_XMM2._0_4_ + fVar161;
                  pfVar52[1] = (fVar128 - auVar93._4_4_ * fVar156) * in_XMM2._4_4_ + fVar156;
                  pfVar52[2] = (fVar157 - auVar93._8_4_ * fVar158) * in_XMM2._8_4_ + fVar158;
                  pfVar52[3] = (fVar159 - auVar93._12_4_ * fVar160) * in_XMM2._12_4_ + fVar160;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    else {
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) goto LAB_002337d6;
    }
    Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pfVar53 = (float *)((long)pMVar6->data + pMVar6->cstep * uVar51 * pMVar6->elemsize);
            fVar128 = *pfVar53;
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
              in_XMM2 = rcpps(in_XMM2,auVar93);
              fVar156 = fVar128 * in_XMM2._0_4_;
              fVar158 = fVar157 * in_XMM2._4_4_;
              fVar160 = fVar159 * in_XMM2._8_4_;
              fVar162 = fVar161 * in_XMM2._12_4_;
              pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51);
              *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
              pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
              pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
              pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  case 4:
    uVar67 = pMVar6->w;
    uVar51 = (ulong)uVar67;
    sVar55 = pMVar6->elemsize;
    uVar66 = pMVar6[1].w;
    uVar65 = pMVar6[1].h;
    uVar64 = pMVar6[1].c;
    uVar50 = (ulong)uVar64;
    local_e0 = (float *)CONCAT44(local_e0._4_4_,uVar65 * uVar66);
    local_70 = pMVar6[1].elemsize;
    iVar3 = pMVar6->dims;
    if (iVar3 == 1) {
      iVar3 = pMVar6[1].dims;
      if (iVar48 != 1 || uVar67 != 1) {
        if (iVar3 == 1) {
          Mat::create(this_00,uVar67,sVar55,iVar48,opt->blob_allocator);
          pvVar8 = this_00->data;
          if (pvVar8 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar56 != 1 || pMVar6[1].w != 1) {
            if (0 < (int)uVar67) {
              pvVar60 = pMVar6->data;
              pvVar63 = pMVar6[1].data;
              lVar62 = 0;
              do {
                auVar93 = maxps(*(undefined1 (*) [16])((long)pvVar63 + lVar62),
                                *(undefined1 (*) [16])((long)pvVar60 + lVar62));
                *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
                lVar62 = lVar62 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar67) {
            uVar2 = *pMVar6[1].data;
            pvVar60 = pMVar6->data;
            lVar62 = 0;
            do {
              auVar47._4_4_ = uVar2;
              auVar47._0_4_ = uVar2;
              auVar47._8_4_ = uVar2;
              auVar47._12_4_ = uVar2;
              auVar93 = maxps(*(undefined1 (*) [16])((long)pvVar60 + lVar62),auVar47);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
              lVar62 = lVar62 + 0x10;
              uVar67 = (int)uVar51 - 1;
              uVar51 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar3 == 2) {
          Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
          pauVar59 = (undefined1 (*) [16])this_00->data;
          if (pauVar59 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              pauVar57 = (undefined1 (*) [16])pMVar6->data;
              pauVar58 = (undefined1 (*) [16])pMVar6[1].data;
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  auVar93 = *pauVar57;
                  uVar64 = uVar66;
                  do {
                    auVar75 = maxps(*pauVar58,auVar93);
                    *pauVar59 = auVar75;
                    pauVar58 = pauVar58 + 1;
                    pauVar59 = pauVar59 + 1;
                    uVar64 = uVar64 - 1;
                  } while (uVar64 != 0);
                }
                pauVar57 = pauVar57 + 1;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar3 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_e0) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              auVar93 = *(undefined1 (*) [16])((long)pMVar6->data + uVar51 * 0x10);
              pvVar8 = this_00->data;
              sVar9 = pMVar6[1].cstep;
              sVar10 = pMVar6[1].elemsize;
              pvVar60 = pMVar6[1].data;
              lVar62 = 0;
              iVar48 = (int)local_e0;
              do {
                auVar75 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51),auVar93);
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar75;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      if (iVar3 == 1) {
        Mat::create(this_00,uVar66,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar2 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              auVar46._4_4_ = uVar2;
              auVar46._0_4_ = uVar2;
              auVar46._8_4_ = uVar2;
              auVar46._12_4_ = uVar2;
              auVar93 = maxps(*(undefined1 (*) [16])((long)pvVar60 + lVar62),auVar46);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
              lVar62 = lVar62 + 0x10;
              uVar66 = uVar66 - 1;
            } while (uVar66 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 == 2) {
        Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e0) {
            uVar2 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              auVar45._4_4_ = uVar2;
              auVar45._0_4_ = uVar2;
              auVar45._8_4_ = uVar2;
              auVar45._12_4_ = uVar2;
              auVar93 = maxps(*(undefined1 (*) [16])((long)pvVar60 + lVar62),auVar45);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
              lVar62 = lVar62 + 0x10;
              local_e0._0_4_ = (int)local_e0 + -1;
            } while ((int)local_e0 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        uVar2 = *pMVar6->data;
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              auVar44._4_4_ = uVar2;
              auVar44._0_4_ = uVar2;
              auVar44._8_4_ = uVar2;
              auVar44._12_4_ = uVar2;
              auVar93 = maxps(*(undefined1 (*) [16])
                               ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51),auVar44);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar93;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar4 = pMVar6->h;
    local_c8 = (void *)CONCAT44(local_c8._4_4_,uVar4 * uVar67);
    local_d8 = (Option *)uVar50;
    if (iVar3 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_00->cstep * uVar51 * this_00->elemsize + (long)this_00->data);
                pauVar57 = (undefined1 (*) [16])
                           (pMVar6[1].cstep * uVar51 * pMVar6[1].elemsize + (long)pMVar6[1].data);
                pauVar58 = (undefined1 (*) [16])
                           ((long)pMVar6->w * uVar51 * pMVar6->elemsize + (long)pMVar6->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    auVar93 = *pauVar58;
                    uVar64 = uVar66;
                    do {
                      auVar75 = maxps(*pauVar57,auVar93);
                      *pauVar59 = auVar75;
                      pauVar57 = pauVar57 + 1;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar58 = pauVar58 + 1;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pvVar8 = this_00->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_c8) {
          pvVar60 = pMVar6->data;
          pvVar63 = pMVar6[1].data;
          lVar62 = 0;
          do {
            auVar93 = maxps(*(undefined1 (*) [16])((long)pvVar63 + lVar62),
                            *(undefined1 (*) [16])((long)pvVar60 + lVar62));
            *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_00->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar4) {
            pauVar57 = (undefined1 (*) [16])pMVar6->data;
            pauVar58 = (undefined1 (*) [16])pMVar6[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar93 = *pauVar58;
                uVar50 = uVar51;
                do {
                  auVar75 = maxps(*pauVar57,auVar93);
                  *pauVar59 = auVar75;
                  pauVar57 = pauVar57 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar58 = pauVar58 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_c8) {
          uVar2 = *pMVar6[1].data;
          pvVar8 = pMVar6->data;
          lVar62 = 0;
          do {
            auVar43._4_4_ = uVar2;
            auVar43._0_4_ = uVar2;
            auVar43._8_4_ = uVar2;
            auVar43._12_4_ = uVar2;
            auVar93 = maxps(*(undefined1 (*) [16])((long)pvVar8 + lVar62),auVar43);
            *(undefined1 (*) [16])((long)*pauVar59 + lVar62) = auVar93;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar49 = (ulong)uVar5;
    local_c0 = sVar55;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims == 1) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar5) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar93 = *(undefined1 (*) [16])((long)pMVar6[1].data + uVar50 * 0x10);
                pvVar8 = this_00->data;
                sVar9 = pMVar6->cstep;
                sVar10 = pMVar6->elemsize;
                pvVar60 = pMVar6->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  auVar75 = maxps(*(undefined1 (*) [16])
                                   ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50),auVar93);
                  *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar75;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar49);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar5) {
          uVar2 = *pMVar6[1].data;
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar8 = this_00->data;
              sVar9 = pMVar6->cstep;
              sVar10 = pMVar6->elemsize;
              pvVar60 = pMVar6->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                auVar42._4_4_ = uVar2;
                auVar42._0_4_ = uVar2;
                auVar42._8_4_ = uVar2;
                auVar42._12_4_ = uVar2;
                auVar93 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50),auVar42);
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar93;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar5) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar4) {
            pauVar59 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            pauVar57 = (undefined1 (*) [16])
                       ((long)pMVar6[1].w * uVar50 * pMVar6[1].elemsize + (long)pMVar6[1].data);
            pauVar58 = (undefined1 (*) [16])
                       (pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar93 = *pauVar57;
                uVar68 = uVar51;
                do {
                  auVar75 = maxps(*pauVar58,auVar93);
                  *pauVar59 = auVar75;
                  pauVar58 = pauVar58 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar68 - 1;
                  uVar68 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar49);
        return 0;
      }
      return 0;
    }
    if (uVar5 == uVar64 && ((uVar66 ^ 1) == 0 && (uVar65 ^ 1) == 0)) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar5) {
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = pMVar6->cstep;
              sVar7 = pMVar6->elemsize;
              auVar93 = *(undefined1 (*) [16])
                         ((long)pMVar6[1].data + pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize);
              pvVar8 = pMVar6->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                auVar75 = maxps(*(undefined1 (*) [16])
                                 ((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50),auVar93);
                *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50) = auVar75;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = uVar49;
    if (uVar66 == uVar67) {
      if (iVar56 == 1 && (uVar64 == 1 && uVar65 == uVar4)) {
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = pMVar6->cstep;
                sVar7 = pMVar6->elemsize;
                sVar9 = this_00->cstep;
                pvVar8 = pMVar6->data;
                pvVar60 = pMVar6[1].data;
                sVar10 = this_00->elemsize;
                pvVar63 = this_00->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  uVar2 = *(undefined4 *)((long)pvVar60 + lVar62);
                  auVar88._4_4_ = uVar2;
                  auVar88._0_4_ = uVar2;
                  auVar88._8_4_ = uVar2;
                  auVar88._12_4_ = uVar2;
                  auVar93 = maxps(auVar88,*(undefined1 (*) [16])
                                           ((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar50));
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar50) =
                       auVar93;
                  lVar62 = lVar62 + 4;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) {
        if (((iVar48 == 1) && (uVar65 == uVar4)) && (uVar5 == 1)) {
          Mat::create(this_00,uVar67,uVar4,uVar64,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar64) {
              uVar51 = 0;
              do {
                if (0 < (int)local_e0) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  sVar9 = this_00->cstep;
                  pvVar8 = pMVar6[1].data;
                  pvVar60 = pMVar6->data;
                  sVar10 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar62 = 0;
                  iVar48 = (int)local_e0;
                  do {
                    uVar2 = *(undefined4 *)((long)pvVar60 + lVar62);
                    auVar41._4_4_ = uVar2;
                    auVar41._0_4_ = uVar2;
                    auVar41._8_4_ = uVar2;
                    auVar41._12_4_ = uVar2;
                    auVar93 = maxps(*(undefined1 (*) [16])
                                     ((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar51),auVar41);
                    *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar51) =
                         auVar93;
                    lVar62 = lVar62 + 4;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
LAB_00232b35:
        if ((((uVar66 ^ 1) == 0 && uVar65 == uVar4) && uVar5 == uVar64) && uVar67 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  pvVar8 = pMVar6[1].data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pauVar57 = (undefined1 (*) [16])
                             (pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      auVar93 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      uVar66 = uVar67;
                      do {
                        auVar75 = maxps(*pauVar57,auVar93);
                        *pauVar59 = auVar75;
                        pauVar57 = pauVar57 + 1;
                        pauVar59 = pauVar59 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar66 == uVar67 && (uVar65 ^ 1) == 0) && uVar5 == uVar64) && uVar4 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].elemsize;
                  pvVar60 = (void *)(this_00->cstep * uVar50 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar63 = (void *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data)
                  ;
                  sVar7 = pMVar6[1].cstep;
                  pvVar8 = pMVar6[1].data;
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        auVar93 = maxps(*(undefined1 (*) [16])
                                         ((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50),
                                        *(undefined1 (*) [16])((long)pvVar63 + lVar62));
                        *(undefined1 (*) [16])((long)pvVar60 + lVar62) = auVar93;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar64 == uVar5 && uVar65 == uVar4) & uVar66 != 1 & (byte)local_68) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar66,uVar4,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar5) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6->cstep;
                  sVar7 = pMVar6->elemsize;
                  pvVar8 = pMVar6->data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pauVar57 = (undefined1 (*) [16])
                             (pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize + (long)pMVar6[1].data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar66) {
                      auVar93 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      uVar67 = uVar66;
                      do {
                        auVar75 = maxps(*pauVar57,auVar93);
                        *pauVar59 = auVar75;
                        pauVar57 = pauVar57 + 1;
                        pauVar59 = pauVar59 + 1;
                        uVar67 = uVar67 - 1;
                      } while (uVar67 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != uVar49);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((byte)local_60 & uVar64 == uVar5 & (uVar65 != 1 && uVar66 == uVar67)) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar65,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              local_e0 = (float *)0x0;
              do {
                bVar71 = pMVar6->dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6->d;
                }
                local_8c = pMVar6->w;
                local_88 = pMVar6->h;
                local_90 = bVar71 ^ 3;
                local_d8 = (Option *)pMVar6->cstep;
                pvVar8 = pMVar6->data;
                local_c8 = (void *)pMVar6->elemsize;
                local_b8 = (undefined1  [8])
                           ((long)local_d8 * (long)local_e0 * (long)local_c8 + (long)pvVar8);
                local_a0 = pMVar6->elempack;
                local_98 = pMVar6->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_a8 = (size_t)local_c8;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = pMVar6[1].dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6[1].d;
                }
                local_8c = pMVar6[1].w;
                local_88 = pMVar6[1].h;
                local_a8 = pMVar6[1].elemsize;
                pvVar60 = (void *)(pMVar6[1].cstep * (long)local_e0 * local_a8 +
                                  (long)pMVar6[1].data);
                local_90 = bVar71 ^ 3;
                local_a0 = pMVar6[1].elempack;
                local_98 = pMVar6[1].allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar60;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = this_00->dims == 3;
                local_8c = this_00->w;
                local_88 = this_00->h;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = this_00->d;
                }
                local_a8 = this_00->elemsize;
                pvVar63 = (void *)(this_00->cstep * (long)local_e0 * local_a8 + (long)this_00->data)
                ;
                local_90 = bVar71 ^ 3;
                local_a0 = this_00->elempack;
                local_98 = this_00->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar63;
                Mat::~Mat((Mat *)local_b8);
                if (0 < (int)uVar65) {
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        auVar93 = maxps(*(undefined1 (*) [16])((long)pvVar60 + lVar62),
                                        *(undefined1 (*) [16])
                                         ((long)pvVar8 +
                                         lVar62 + (long)local_d8 * (long)local_c8 * (long)local_e0))
                        ;
                        *(undefined1 (*) [16])((long)pvVar63 + lVar62) = auVar93;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar65);
                }
                local_e0 = (float *)((long)local_e0 + 1);
              } while (local_e0 != (float *)local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              bVar71 = pMVar6->dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6->d;
              }
              local_8c = pMVar6->w;
              local_88 = pMVar6->h;
              local_90 = bVar71 ^ 3;
              local_e0 = (float *)pMVar6->cstep;
              pvVar8 = pMVar6->data;
              local_d8 = (Option *)pMVar6->elemsize;
              local_b8 = (undefined1  [8])((long)local_e0 * uVar50 * (long)local_d8 + (long)pvVar8);
              local_a0 = pMVar6->elempack;
              local_98 = pMVar6->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = (size_t)local_d8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = pMVar6[1].dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6[1].d;
              }
              local_8c = pMVar6[1].w;
              local_88 = pMVar6[1].h;
              local_90 = bVar71 ^ 3;
              local_c0 = pMVar6[1].cstep;
              pvVar60 = pMVar6[1].data;
              local_a8 = pMVar6[1].elemsize;
              local_b8 = (undefined1  [8])(local_c0 * uVar50 * local_a8 + (long)pvVar60);
              local_a0 = pMVar6[1].elempack;
              local_98 = pMVar6[1].allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_70 = local_a8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = this_00->dims == 3;
              local_8c = this_00->w;
              local_88 = this_00->h;
              local_80 = 1;
              if (!bVar71) {
                local_80 = this_00->d;
              }
              local_90 = bVar71 ^ 3;
              sVar55 = this_00->cstep;
              pvVar63 = this_00->data;
              sVar7 = this_00->elemsize;
              local_b8 = (undefined1  [8])(sVar55 * uVar50 * sVar7 + (long)pvVar63);
              local_a0 = this_00->elempack;
              local_98 = this_00->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = sVar7;
              Mat::~Mat((Mat *)local_b8);
              if (0 < (int)local_c8) {
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  auVar93 = maxps(*(undefined1 (*) [16])
                                   ((long)pvVar60 + lVar62 + local_c0 * local_70 * uVar50),
                                  *(undefined1 (*) [16])
                                   ((long)pvVar8 + lVar62 + (long)local_e0 * (long)local_d8 * uVar50
                                   ));
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 + sVar55 * sVar7 * uVar50) = auVar93
                  ;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    else {
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) goto LAB_00232b35;
    }
    Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            auVar93 = *(undefined1 (*) [16])
                       ((long)pMVar6->data + pMVar6->cstep * uVar51 * pMVar6->elemsize);
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              auVar75 = maxps(*(undefined1 (*) [16])
                               ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51),auVar93);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar75;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  case 5:
    uVar67 = pMVar6->w;
    uVar51 = (ulong)uVar67;
    sVar55 = pMVar6->elemsize;
    uVar66 = pMVar6[1].w;
    uVar65 = pMVar6[1].h;
    uVar64 = pMVar6[1].c;
    uVar50 = (ulong)uVar64;
    local_e0 = (float *)CONCAT44(local_e0._4_4_,uVar65 * uVar66);
    local_70 = pMVar6[1].elemsize;
    iVar3 = pMVar6->dims;
    if (iVar3 == 1) {
      iVar3 = pMVar6[1].dims;
      if (iVar48 != 1 || uVar67 != 1) {
        if (iVar3 == 1) {
          Mat::create(this_00,uVar67,sVar55,iVar48,opt->blob_allocator);
          pvVar8 = this_00->data;
          if (pvVar8 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar56 != 1 || pMVar6[1].w != 1) {
            if (0 < (int)uVar67) {
              pvVar60 = pMVar6->data;
              pvVar63 = pMVar6[1].data;
              lVar62 = 0;
              do {
                auVar93 = minps(*(undefined1 (*) [16])((long)pvVar63 + lVar62),
                                *(undefined1 (*) [16])((long)pvVar60 + lVar62));
                *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
                lVar62 = lVar62 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar67) {
            uVar2 = *pMVar6[1].data;
            pvVar60 = pMVar6->data;
            lVar62 = 0;
            do {
              auVar40._4_4_ = uVar2;
              auVar40._0_4_ = uVar2;
              auVar40._8_4_ = uVar2;
              auVar40._12_4_ = uVar2;
              auVar93 = minps(*(undefined1 (*) [16])((long)pvVar60 + lVar62),auVar40);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
              lVar62 = lVar62 + 0x10;
              uVar67 = (int)uVar51 - 1;
              uVar51 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar3 == 2) {
          Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
          pauVar59 = (undefined1 (*) [16])this_00->data;
          if (pauVar59 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              pauVar57 = (undefined1 (*) [16])pMVar6->data;
              pauVar58 = (undefined1 (*) [16])pMVar6[1].data;
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  auVar93 = *pauVar57;
                  uVar64 = uVar66;
                  do {
                    auVar75 = minps(*pauVar58,auVar93);
                    *pauVar59 = auVar75;
                    pauVar58 = pauVar58 + 1;
                    pauVar59 = pauVar59 + 1;
                    uVar64 = uVar64 - 1;
                  } while (uVar64 != 0);
                }
                pauVar57 = pauVar57 + 1;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar3 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_e0) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              auVar93 = *(undefined1 (*) [16])((long)pMVar6->data + uVar51 * 0x10);
              pvVar8 = this_00->data;
              sVar9 = pMVar6[1].cstep;
              sVar10 = pMVar6[1].elemsize;
              pvVar60 = pMVar6[1].data;
              lVar62 = 0;
              iVar48 = (int)local_e0;
              do {
                auVar75 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51),auVar93);
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar75;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      if (iVar3 == 1) {
        Mat::create(this_00,uVar66,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar66) {
            uVar2 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              auVar39._4_4_ = uVar2;
              auVar39._0_4_ = uVar2;
              auVar39._8_4_ = uVar2;
              auVar39._12_4_ = uVar2;
              auVar93 = minps(*(undefined1 (*) [16])((long)pvVar60 + lVar62),auVar39);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
              lVar62 = lVar62 + 0x10;
              uVar66 = uVar66 - 1;
            } while (uVar66 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 == 2) {
        Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e0) {
            uVar2 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              auVar38._4_4_ = uVar2;
              auVar38._0_4_ = uVar2;
              auVar38._8_4_ = uVar2;
              auVar38._12_4_ = uVar2;
              auVar93 = minps(*(undefined1 (*) [16])((long)pvVar60 + lVar62),auVar38);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
              lVar62 = lVar62 + 0x10;
              local_e0._0_4_ = (int)local_e0 + -1;
            } while ((int)local_e0 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        uVar2 = *pMVar6->data;
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              auVar37._4_4_ = uVar2;
              auVar37._0_4_ = uVar2;
              auVar37._8_4_ = uVar2;
              auVar37._12_4_ = uVar2;
              auVar93 = minps(*(undefined1 (*) [16])
                               ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51),auVar37);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar93;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar4 = pMVar6->h;
    local_c8 = (void *)CONCAT44(local_c8._4_4_,uVar4 * uVar67);
    local_d8 = (Option *)uVar50;
    if (iVar3 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_00->cstep * uVar51 * this_00->elemsize + (long)this_00->data);
                pauVar57 = (undefined1 (*) [16])
                           (pMVar6[1].cstep * uVar51 * pMVar6[1].elemsize + (long)pMVar6[1].data);
                pauVar58 = (undefined1 (*) [16])
                           ((long)pMVar6->w * uVar51 * pMVar6->elemsize + (long)pMVar6->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    auVar93 = *pauVar58;
                    uVar64 = uVar66;
                    do {
                      auVar75 = minps(*pauVar57,auVar93);
                      *pauVar59 = auVar75;
                      pauVar57 = pauVar57 + 1;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar58 = pauVar58 + 1;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pvVar8 = this_00->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_c8) {
          pvVar60 = pMVar6->data;
          pvVar63 = pMVar6[1].data;
          lVar62 = 0;
          do {
            auVar93 = minps(*(undefined1 (*) [16])((long)pvVar63 + lVar62),
                            *(undefined1 (*) [16])((long)pvVar60 + lVar62));
            *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar93;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_00->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar4) {
            pauVar57 = (undefined1 (*) [16])pMVar6->data;
            pauVar58 = (undefined1 (*) [16])pMVar6[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar93 = *pauVar58;
                uVar50 = uVar51;
                do {
                  auVar75 = minps(*pauVar57,auVar93);
                  *pauVar59 = auVar75;
                  pauVar57 = pauVar57 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar58 = pauVar58 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_c8) {
          uVar2 = *pMVar6[1].data;
          pvVar8 = pMVar6->data;
          lVar62 = 0;
          do {
            auVar36._4_4_ = uVar2;
            auVar36._0_4_ = uVar2;
            auVar36._8_4_ = uVar2;
            auVar36._12_4_ = uVar2;
            auVar93 = minps(*(undefined1 (*) [16])((long)pvVar8 + lVar62),auVar36);
            *(undefined1 (*) [16])((long)*pauVar59 + lVar62) = auVar93;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar49 = (ulong)uVar5;
    local_c0 = sVar55;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims == 1) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar5) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = this_00->cstep;
                sVar7 = this_00->elemsize;
                auVar93 = *(undefined1 (*) [16])((long)pMVar6[1].data + uVar50 * 0x10);
                pvVar8 = this_00->data;
                sVar9 = pMVar6->cstep;
                sVar10 = pMVar6->elemsize;
                pvVar60 = pMVar6->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  auVar75 = minps(*(undefined1 (*) [16])
                                   ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50),auVar93);
                  *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar75;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar49);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar5) {
          uVar2 = *pMVar6[1].data;
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar8 = this_00->data;
              sVar9 = pMVar6->cstep;
              sVar10 = pMVar6->elemsize;
              pvVar60 = pMVar6->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                auVar35._4_4_ = uVar2;
                auVar35._0_4_ = uVar2;
                auVar35._8_4_ = uVar2;
                auVar35._12_4_ = uVar2;
                auVar93 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50),auVar35);
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar93;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar5) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar4) {
            pauVar59 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            pauVar57 = (undefined1 (*) [16])
                       ((long)pMVar6[1].w * uVar50 * pMVar6[1].elemsize + (long)pMVar6[1].data);
            pauVar58 = (undefined1 (*) [16])
                       (pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                auVar93 = *pauVar57;
                uVar68 = uVar51;
                do {
                  auVar75 = minps(*pauVar58,auVar93);
                  *pauVar59 = auVar75;
                  pauVar58 = pauVar58 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar68 - 1;
                  uVar68 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pauVar57 = pauVar57 + 1;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar49);
        return 0;
      }
      return 0;
    }
    if (uVar5 == uVar64 && ((uVar66 ^ 1) == 0 && (uVar65 ^ 1) == 0)) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar5) {
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = pMVar6->cstep;
              sVar7 = pMVar6->elemsize;
              auVar93 = *(undefined1 (*) [16])
                         ((long)pMVar6[1].data + pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize);
              pvVar8 = pMVar6->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                auVar75 = minps(*(undefined1 (*) [16])
                                 ((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50),auVar93);
                *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50) = auVar75;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = uVar49;
    if (uVar66 == uVar67) {
      if (iVar56 == 1 && (uVar64 == 1 && uVar65 == uVar4)) {
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = pMVar6->cstep;
                sVar7 = pMVar6->elemsize;
                sVar9 = this_00->cstep;
                pvVar8 = pMVar6->data;
                pvVar60 = pMVar6[1].data;
                sVar10 = this_00->elemsize;
                pvVar63 = this_00->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  uVar2 = *(undefined4 *)((long)pvVar60 + lVar62);
                  auVar92._4_4_ = uVar2;
                  auVar92._0_4_ = uVar2;
                  auVar92._8_4_ = uVar2;
                  auVar92._12_4_ = uVar2;
                  auVar93 = minps(auVar92,*(undefined1 (*) [16])
                                           ((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar50));
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar50) =
                       auVar93;
                  lVar62 = lVar62 + 4;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) {
        if (((iVar48 == 1) && (uVar65 == uVar4)) && (uVar5 == 1)) {
          Mat::create(this_00,uVar67,uVar4,uVar64,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar64) {
              uVar51 = 0;
              do {
                if (0 < (int)local_e0) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  sVar9 = this_00->cstep;
                  pvVar8 = pMVar6[1].data;
                  pvVar60 = pMVar6->data;
                  sVar10 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar62 = 0;
                  iVar48 = (int)local_e0;
                  do {
                    uVar2 = *(undefined4 *)((long)pvVar60 + lVar62);
                    auVar34._4_4_ = uVar2;
                    auVar34._0_4_ = uVar2;
                    auVar34._8_4_ = uVar2;
                    auVar34._12_4_ = uVar2;
                    auVar93 = minps(*(undefined1 (*) [16])
                                     ((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar51),auVar34);
                    *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar51) =
                         auVar93;
                    lVar62 = lVar62 + 4;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
LAB_00234398:
        if ((((uVar66 ^ 1) == 0 && uVar65 == uVar4) && uVar5 == uVar64) && uVar67 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  pvVar8 = pMVar6[1].data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pauVar57 = (undefined1 (*) [16])
                             (pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      auVar93 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      uVar66 = uVar67;
                      do {
                        auVar75 = minps(*pauVar57,auVar93);
                        *pauVar59 = auVar75;
                        pauVar57 = pauVar57 + 1;
                        pauVar59 = pauVar59 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar66 == uVar67 && (uVar65 ^ 1) == 0) && uVar5 == uVar64) && uVar4 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].elemsize;
                  pvVar60 = (void *)(this_00->cstep * uVar50 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar63 = (void *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data)
                  ;
                  sVar7 = pMVar6[1].cstep;
                  pvVar8 = pMVar6[1].data;
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        auVar93 = minps(*(undefined1 (*) [16])
                                         ((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50),
                                        *(undefined1 (*) [16])((long)pvVar63 + lVar62));
                        *(undefined1 (*) [16])((long)pvVar60 + lVar62) = auVar93;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar64 == uVar5 && uVar65 == uVar4) & uVar66 != 1 & (byte)local_68) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar66,uVar4,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar5) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6->cstep;
                  sVar7 = pMVar6->elemsize;
                  pvVar8 = pMVar6->data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pauVar57 = (undefined1 (*) [16])
                             (pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize + (long)pMVar6[1].data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar66) {
                      auVar93 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      uVar67 = uVar66;
                      do {
                        auVar75 = minps(*pauVar57,auVar93);
                        *pauVar59 = auVar75;
                        pauVar57 = pauVar57 + 1;
                        pauVar59 = pauVar59 + 1;
                        uVar67 = uVar67 - 1;
                      } while (uVar67 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != uVar49);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((byte)local_60 & uVar64 == uVar5 & (uVar65 != 1 && uVar66 == uVar67)) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar65,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              local_e0 = (float *)0x0;
              do {
                bVar71 = pMVar6->dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6->d;
                }
                local_8c = pMVar6->w;
                local_88 = pMVar6->h;
                local_90 = bVar71 ^ 3;
                local_d8 = (Option *)pMVar6->cstep;
                pvVar8 = pMVar6->data;
                local_c8 = (void *)pMVar6->elemsize;
                local_b8 = (undefined1  [8])
                           ((long)local_d8 * (long)local_e0 * (long)local_c8 + (long)pvVar8);
                local_a0 = pMVar6->elempack;
                local_98 = pMVar6->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_a8 = (size_t)local_c8;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = pMVar6[1].dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6[1].d;
                }
                local_8c = pMVar6[1].w;
                local_88 = pMVar6[1].h;
                local_a8 = pMVar6[1].elemsize;
                pvVar60 = (void *)(pMVar6[1].cstep * (long)local_e0 * local_a8 +
                                  (long)pMVar6[1].data);
                local_90 = bVar71 ^ 3;
                local_a0 = pMVar6[1].elempack;
                local_98 = pMVar6[1].allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar60;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = this_00->dims == 3;
                local_8c = this_00->w;
                local_88 = this_00->h;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = this_00->d;
                }
                local_a8 = this_00->elemsize;
                pvVar63 = (void *)(this_00->cstep * (long)local_e0 * local_a8 + (long)this_00->data)
                ;
                local_90 = bVar71 ^ 3;
                local_a0 = this_00->elempack;
                local_98 = this_00->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar63;
                Mat::~Mat((Mat *)local_b8);
                if (0 < (int)uVar65) {
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        auVar93 = minps(*(undefined1 (*) [16])((long)pvVar60 + lVar62),
                                        *(undefined1 (*) [16])
                                         ((long)pvVar8 +
                                         lVar62 + (long)local_d8 * (long)local_c8 * (long)local_e0))
                        ;
                        *(undefined1 (*) [16])((long)pvVar63 + lVar62) = auVar93;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar65);
                }
                local_e0 = (float *)((long)local_e0 + 1);
              } while (local_e0 != (float *)local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              bVar71 = pMVar6->dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6->d;
              }
              local_8c = pMVar6->w;
              local_88 = pMVar6->h;
              local_90 = bVar71 ^ 3;
              local_e0 = (float *)pMVar6->cstep;
              pvVar8 = pMVar6->data;
              local_d8 = (Option *)pMVar6->elemsize;
              local_b8 = (undefined1  [8])((long)local_e0 * uVar50 * (long)local_d8 + (long)pvVar8);
              local_a0 = pMVar6->elempack;
              local_98 = pMVar6->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = (size_t)local_d8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = pMVar6[1].dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6[1].d;
              }
              local_8c = pMVar6[1].w;
              local_88 = pMVar6[1].h;
              local_90 = bVar71 ^ 3;
              local_c0 = pMVar6[1].cstep;
              pvVar60 = pMVar6[1].data;
              local_a8 = pMVar6[1].elemsize;
              local_b8 = (undefined1  [8])(local_c0 * uVar50 * local_a8 + (long)pvVar60);
              local_a0 = pMVar6[1].elempack;
              local_98 = pMVar6[1].allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_70 = local_a8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = this_00->dims == 3;
              local_8c = this_00->w;
              local_88 = this_00->h;
              local_80 = 1;
              if (!bVar71) {
                local_80 = this_00->d;
              }
              local_90 = bVar71 ^ 3;
              sVar55 = this_00->cstep;
              pvVar63 = this_00->data;
              sVar7 = this_00->elemsize;
              local_b8 = (undefined1  [8])(sVar55 * uVar50 * sVar7 + (long)pvVar63);
              local_a0 = this_00->elempack;
              local_98 = this_00->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = sVar7;
              Mat::~Mat((Mat *)local_b8);
              if (0 < (int)local_c8) {
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  auVar93 = minps(*(undefined1 (*) [16])
                                   ((long)pvVar60 + lVar62 + local_c0 * local_70 * uVar50),
                                  *(undefined1 (*) [16])
                                   ((long)pvVar8 + lVar62 + (long)local_e0 * (long)local_d8 * uVar50
                                   ));
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 + sVar55 * sVar7 * uVar50) = auVar93
                  ;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    else {
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) goto LAB_00234398;
    }
    Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            auVar93 = *(undefined1 (*) [16])
                       ((long)pMVar6->data + pMVar6->cstep * uVar51 * pMVar6->elemsize);
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              auVar75 = minps(*(undefined1 (*) [16])
                               ((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51),auVar93);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar75;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  case 6:
    uVar67 = pMVar6->w;
    local_70 = (size_t)uVar67;
    pvVar8 = (void *)pMVar6->elemsize;
    uVar66 = pMVar6[1].w;
    uVar65 = pMVar6[1].h;
    uVar64 = pMVar6[1].c;
    uVar50 = (ulong)uVar64;
    iVar61 = uVar65 * uVar66;
    sVar55 = pMVar6[1].elemsize;
    iVar3 = pMVar6->dims;
    local_c8 = (void *)CONCAT44(local_c8._4_4_,uVar66);
    if (iVar3 == 1) {
      iVar3 = pMVar6[1].dims;
      if (iVar48 == 1 && uVar67 == 1) {
        if (iVar3 == 1) {
          Mat::create(this_00,uVar66,sVar55,iVar56,opt->blob_allocator);
          pvVar8 = this_00->data;
          if (pvVar8 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          local_b8._4_4_ = *pMVar6->data;
          local_b8._0_4_ = local_b8._4_4_;
          uStack_b0 = (int *)CONCAT44(local_b8._4_4_,local_b8._4_4_);
          if (0 < (int)local_c8) {
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_c8;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              _local_58 = *(undefined8 *)pfVar53;
              _fStack_50 = *(undefined8 *)(pfVar53 + 2);
              afVar163 = binary_op_pow_pack4::operator()
                                   (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
              auVar29._8_4_ = extraout_XMM0_Dc_08;
              auVar29._0_8_ = afVar163._0_8_;
              auVar29._12_4_ = extraout_XMM0_Dd_08;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar29;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
        }
        else if (iVar3 == 2) {
          Mat::create(this_00,uVar66,uVar65,sVar55,iVar56,opt->blob_allocator);
          pvVar8 = this_00->data;
          if (pvVar8 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          local_b8._4_4_ = *pMVar6->data;
          local_b8._0_4_ = local_b8._4_4_;
          uStack_b0 = (int *)CONCAT44(local_b8._4_4_,local_b8._4_4_);
          if (0 < iVar61) {
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              _local_58 = *(undefined8 *)pfVar53;
              _fStack_50 = *(undefined8 *)(pfVar53 + 2);
              afVar163 = binary_op_pow_pack4::operator()
                                   (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
              auVar28._8_4_ = extraout_XMM0_Dc_06;
              auVar28._0_8_ = afVar163._0_8_;
              auVar28._12_4_ = extraout_XMM0_Dd_06;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar28;
              lVar62 = lVar62 + 0x10;
              iVar61 = iVar61 + -1;
            } while (iVar61 != 0);
          }
        }
        else if (iVar3 == 3) {
          local_d8 = (Option *)CONCAT44(local_d8._4_4_,iVar61);
          Mat::create(this_00,uVar66,uVar65,uVar64,sVar55,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          local_b8._4_4_ = *pMVar6->data;
          local_b8._0_4_ = local_b8._4_4_;
          uStack_b0 = (int *)CONCAT44(local_b8._4_4_,local_b8._4_4_);
          if (0 < (int)uVar64) {
            local_c8 = (void *)0x0;
            local_68 = uVar50;
            do {
              if (0 < (int)local_d8) {
                local_e0 = (float *)(this_00->cstep * this_00->elemsize * (long)local_c8 +
                                    (long)this_00->data);
                lVar62 = pMVar6[1].cstep * pMVar6[1].elemsize * (long)local_c8;
                pvVar8 = pMVar6[1].data;
                lVar54 = 0;
                iVar48 = (int)local_d8;
                do {
                  pfVar53 = (float *)((long)pvVar8 + lVar54 + lVar62);
                  _local_58 = *(undefined8 *)pfVar53;
                  _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                  afVar163 = binary_op_pow_pack4::operator()
                                       (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                  auVar27._8_4_ = extraout_XMM0_Dc_01;
                  auVar27._0_8_ = afVar163._0_8_;
                  auVar27._12_4_ = extraout_XMM0_Dd_01;
                  *(undefined1 (*) [16])((long)local_e0 + lVar54) = auVar27;
                  lVar54 = lVar54 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              local_c8 = (void *)((long)local_c8 + 1);
            } while (local_c8 != (void *)local_68);
          }
        }
      }
      else if (iVar3 == 1) {
        Mat::create(this_00,uVar67,(size_t)pvVar8,iVar48,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (iVar56 == 1 && pMVar6[1].w == 1) {
          local_b8._4_4_ = *pMVar6[1].data;
          local_b8._0_4_ = local_b8._4_4_;
          uStack_b0 = (int *)CONCAT44(local_b8._4_4_,local_b8._4_4_);
          if (0 < (int)local_70) {
            pvVar60 = pMVar6->data;
            lVar62 = 0;
            sVar55 = local_70;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              _local_58 = *(undefined8 *)pfVar53;
              _fStack_50 = *(undefined8 *)(pfVar53 + 2);
              afVar163 = binary_op_pow_pack4::operator()
                                   (&local_e1,(__m128 *)&local_58,(__m128 *)local_b8);
              auVar32._8_4_ = extraout_XMM0_Dc_09;
              auVar32._0_8_ = afVar163._0_8_;
              auVar32._12_4_ = extraout_XMM0_Dd_09;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar32;
              lVar62 = lVar62 + 0x10;
              uVar67 = (int)sVar55 - 1;
              sVar55 = (size_t)uVar67;
            } while (uVar67 != 0);
          }
        }
        else {
          if ((int)local_70 < 1) {
            return 0;
          }
          pvVar60 = pMVar6->data;
          pvVar63 = pMVar6[1].data;
          lVar62 = 0;
          sVar55 = local_70;
          do {
            pfVar53 = (float *)((long)pvVar60 + lVar62);
            local_b8 = *(undefined1 (*) [8])pfVar53;
            uStack_b0 = *(int **)(pfVar53 + 2);
            pfVar53 = (float *)((long)pvVar63 + lVar62);
            _local_58 = *(undefined8 *)pfVar53;
            _fStack_50 = *(undefined8 *)(pfVar53 + 2);
            afVar163 = binary_op_pow_pack4::operator()
                                 (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
            auVar33._8_4_ = extraout_XMM0_Dc_17;
            auVar33._0_8_ = afVar163._0_8_;
            auVar33._12_4_ = extraout_XMM0_Dd_17;
            *(undefined1 (*) [16])((long)pvVar8 + lVar62) = auVar33;
            lVar62 = lVar62 + 0x10;
            uVar67 = (int)sVar55 - 1;
            sVar55 = (size_t)uVar67;
          } while (uVar67 != 0);
        }
      }
      else {
        if (iVar3 == 2) {
          Mat::create(this_00,uVar66,uVar65,sVar55,iVar56,opt->blob_allocator);
          pauVar59 = (undefined1 (*) [16])this_00->data;
          if (pauVar59 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          local_c0 = CONCAT44(local_c0._4_4_,uVar65);
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              local_e0 = (float *)pMVar6->data;
              pfVar53 = (float *)pMVar6[1].data;
              local_d8 = (Option *)((ulong)local_d8._4_4_ << 0x20);
              do {
                local_b8 = *(undefined1 (*) [8])local_e0;
                uStack_b0 = *(int **)(local_e0 + 2);
                iVar48 = (int)local_c8;
                if (0 < (int)local_c8) {
                  do {
                    _local_58 = *(undefined8 *)pfVar53;
                    _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                    afVar163 = binary_op_pow_pack4::operator()
                                         (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                    auVar31._8_4_ = extraout_XMM0_Dc_07;
                    auVar31._0_8_ = afVar163._0_8_;
                    auVar31._12_4_ = extraout_XMM0_Dd_07;
                    *pauVar59 = auVar31;
                    pfVar53 = pfVar53 + 4;
                    pauVar59 = pauVar59 + 1;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                local_e0 = local_e0 + 4;
                iVar48 = (int)local_d8 + 1;
                local_d8 = (Option *)CONCAT44(local_d8._4_4_,iVar48);
              } while (iVar48 != (uint)local_c0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar3 == 3) {
          local_d8 = (Option *)CONCAT44(local_d8._4_4_,iVar61);
          Mat::create(this_00,uVar66,uVar65,uVar64,sVar55,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar64) {
              local_c8 = (void *)0x0;
              local_68 = uVar50;
              do {
                pfVar53 = (float *)((long)pMVar6->data + (long)local_c8 * 0x10);
                local_b8 = *(undefined1 (*) [8])pfVar53;
                uStack_b0 = *(int **)(pfVar53 + 2);
                if (0 < (int)local_d8) {
                  local_e0 = (float *)(this_00->cstep * this_00->elemsize * (long)local_c8 +
                                      (long)this_00->data);
                  lVar62 = pMVar6[1].cstep * pMVar6[1].elemsize * (long)local_c8;
                  pvVar8 = pMVar6[1].data;
                  lVar54 = 0;
                  iVar48 = (int)local_d8;
                  do {
                    pfVar53 = (float *)((long)pvVar8 + lVar54 + lVar62);
                    _local_58 = *(undefined8 *)pfVar53;
                    _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                    afVar163 = binary_op_pow_pack4::operator()
                                         (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                    auVar30._8_4_ = extraout_XMM0_Dc_03;
                    auVar30._0_8_ = afVar163._0_8_;
                    auVar30._12_4_ = extraout_XMM0_Dd_03;
                    *(undefined1 (*) [16])((long)local_e0 + lVar54) = auVar30;
                    lVar54 = lVar54 + 0x10;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                local_c8 = (void *)((long)local_c8 + 1);
              } while (local_c8 != (void *)local_68);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else {
      uVar4 = pMVar6->h;
      local_d0 = (ulong)uVar4;
      iVar69 = uVar4 * uVar67;
      if (iVar3 == 2) {
        if (pMVar6[1].dims == 3) {
          Mat::create(this_00,uVar66,uVar65,uVar64,sVar55,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          local_c0 = CONCAT44(local_c0._4_4_,uVar65);
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar64) {
              local_d0 = 0;
              local_68 = uVar50;
              do {
                if (0 < (int)(uint)local_c0) {
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * local_d0 * this_00->elemsize + (long)this_00->data);
                  pfVar53 = (float *)(pMVar6[1].cstep * local_d0 * pMVar6[1].elemsize +
                                     (long)pMVar6[1].data);
                  local_e0 = (float *)((long)pMVar6->w * local_d0 * pMVar6->elemsize +
                                      (long)pMVar6->data);
                  iVar48 = 0;
                  do {
                    local_d8 = (Option *)CONCAT44(local_d8._4_4_,iVar48);
                    local_b8 = *(undefined1 (*) [8])local_e0;
                    uStack_b0 = *(int **)(local_e0 + 2);
                    iVar48 = (int)local_c8;
                    if (0 < (int)local_c8) {
                      do {
                        _local_58 = *(undefined8 *)pfVar53;
                        _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                        afVar163 = binary_op_pow_pack4::operator()
                                             (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                        auVar23._8_4_ = extraout_XMM0_Dc_00;
                        auVar23._0_8_ = afVar163._0_8_;
                        auVar23._12_4_ = extraout_XMM0_Dd_00;
                        *pauVar59 = auVar23;
                        pfVar53 = pfVar53 + 4;
                        pauVar59 = pauVar59 + 1;
                        iVar48 = iVar48 + -1;
                      } while (iVar48 != 0);
                    }
                    local_e0 = local_e0 + 4;
                    iVar48 = (int)local_d8 + 1;
                  } while (iVar48 != (uint)local_c0);
                }
                local_d0 = local_d0 + 1;
              } while (local_d0 != local_68);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar67,uVar4,(size_t)pvVar8,iVar48,opt->blob_allocator);
        pvVar60 = this_00->data;
        if (pvVar60 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar6[1].dims == 1) {
          Mat::create(this_00,(int)local_70,(int)local_d0,(size_t)pvVar8,iVar48,opt->blob_allocator)
          ;
          pauVar59 = (undefined1 (*) [16])this_00->data;
          if (pauVar59 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar56 != 1 || pMVar6[1].w != 1) {
            if (0 < (int)local_d0) {
              pfVar53 = (float *)pMVar6->data;
              local_e0 = (float *)pMVar6[1].data;
              local_d8 = (Option *)((ulong)local_d8._4_4_ << 0x20);
              do {
                local_b8 = *(undefined1 (*) [8])local_e0;
                uStack_b0 = *(int **)(local_e0 + 2);
                uVar50 = local_70 & 0xffffffff;
                if (0 < (int)local_70) {
                  do {
                    _local_58 = *(undefined8 *)pfVar53;
                    _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                    afVar163 = binary_op_pow_pack4::operator()
                                         (&local_e1,(__m128 *)&local_58,(__m128 *)local_b8);
                    auVar26._8_4_ = extraout_XMM0_Dc_19;
                    auVar26._0_8_ = afVar163._0_8_;
                    auVar26._12_4_ = extraout_XMM0_Dd_19;
                    *pauVar59 = auVar26;
                    pfVar53 = pfVar53 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar67 = (int)uVar50 - 1;
                    uVar50 = (ulong)uVar67;
                  } while (uVar67 != 0);
                }
                local_e0 = local_e0 + 4;
                iVar48 = (int)local_d8 + 1;
                local_d8 = (Option *)CONCAT44(local_d8._4_4_,iVar48);
              } while (iVar48 != (int)local_d0);
              return 0;
            }
            return 0;
          }
          local_b8._4_4_ = *pMVar6[1].data;
          local_b8._0_4_ = local_b8._4_4_;
          uStack_b0 = (int *)CONCAT44(local_b8._4_4_,local_b8._4_4_);
          if (0 < iVar69) {
            pvVar8 = pMVar6->data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar8 + lVar62);
              _local_58 = *(undefined8 *)pfVar53;
              _fStack_50 = *(undefined8 *)(pfVar53 + 2);
              afVar163 = binary_op_pow_pack4::operator()
                                   (&local_e1,(__m128 *)&local_58,(__m128 *)local_b8);
              auVar25._8_4_ = extraout_XMM0_Dc_11;
              auVar25._0_8_ = afVar163._0_8_;
              auVar25._12_4_ = extraout_XMM0_Dd_11;
              *(undefined1 (*) [16])((long)*pauVar59 + lVar62) = auVar25;
              lVar62 = lVar62 + 0x10;
              iVar69 = iVar69 + -1;
            } while (iVar69 != 0);
          }
        }
        else if (pMVar6[1].dims == 2) {
          if (iVar69 < 1) {
            return 0;
          }
          pvVar8 = pMVar6->data;
          pvVar63 = pMVar6[1].data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar8 + lVar62);
            local_b8 = *(undefined1 (*) [8])pfVar53;
            uStack_b0 = *(int **)(pfVar53 + 2);
            pfVar53 = (float *)((long)pvVar63 + lVar62);
            _local_58 = *(undefined8 *)pfVar53;
            _fStack_50 = *(undefined8 *)(pfVar53 + 2);
            afVar163 = binary_op_pow_pack4::operator()
                                 (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
            auVar24._8_4_ = extraout_XMM0_Dc_02;
            auVar24._0_8_ = afVar163._0_8_;
            auVar24._12_4_ = extraout_XMM0_Dd_02;
            *(undefined1 (*) [16])((long)pvVar60 + lVar62) = auVar24;
            lVar62 = lVar62 + 0x10;
            iVar69 = iVar69 + -1;
          } while (iVar69 != 0);
        }
      }
      else if (iVar3 == 3) {
        uVar5 = pMVar6->c;
        local_60 = (ulong)uVar5;
        local_e0 = (float *)pvVar8;
        if (pMVar6[1].dims == 3) {
          local_d8 = (Option *)CONCAT44(local_d8._4_4_,iVar61);
          if (uVar5 == uVar64 && ((uVar66 ^ 1) == 0 && (uVar65 ^ 1) == 0)) {
            Mat::create(this_00,uVar67,uVar4,uVar5,(size_t)pvVar8,iVar48,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            local_68 = CONCAT44(local_68._4_4_,iVar69);
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_60) {
                local_d8 = (Option *)0x0;
                do {
                  pvVar8 = this_00->data;
                  pfVar53 = (float *)((long)pMVar6[1].data +
                                     pMVar6[1].cstep * (long)local_d8 * pMVar6[1].elemsize);
                  local_b8 = *(undefined1 (*) [8])pfVar53;
                  uStack_b0 = *(int **)(pfVar53 + 2);
                  if (0 < (int)local_68) {
                    local_e0 = (float *)((long)pMVar6->data +
                                        pMVar6->cstep * pMVar6->elemsize * (long)local_d8);
                    lVar62 = this_00->cstep * this_00->elemsize * (long)local_d8;
                    lVar54 = 0;
                    iVar48 = (int)local_68;
                    do {
                      _local_58 = *(undefined8 *)((long)local_e0 + lVar54);
                      _fStack_50 = *(undefined8 *)((float *)((long)local_e0 + lVar54) + 2);
                      afVar163 = binary_op_pow_pack4::operator()
                                           (&local_e1,(__m128 *)&local_58,(__m128 *)local_b8);
                      auVar11._8_4_ = extraout_XMM0_Dc;
                      auVar11._0_8_ = afVar163._0_8_;
                      auVar11._12_4_ = extraout_XMM0_Dd;
                      *(undefined1 (*) [16])((long)pvVar8 + lVar54 + lVar62) = auVar11;
                      lVar54 = lVar54 + 0x10;
                      iVar48 = iVar48 + -1;
                    } while (iVar48 != 0);
                  }
                  local_d8 = (Option *)((long)local_d8 + 1);
                } while (local_d8 != (Option *)local_60);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          local_c0._0_4_ = uVar65;
          if (uVar66 == uVar67) {
            if (iVar56 == 1 && (uVar64 == 1 && uVar65 == uVar4)) {
              Mat::create(this_00,uVar67,uVar4,uVar5,(size_t)pvVar8,iVar48,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              local_68 = CONCAT44(local_68._4_4_,iVar69);
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_60) {
                  local_c8 = (void *)0x0;
                  do {
                    if (0 < (int)local_68) {
                      local_e0 = (float *)(pMVar6->cstep * pMVar6->elemsize * (long)local_c8 +
                                          (long)pMVar6->data);
                      local_d8 = (Option *)pMVar6[1].data;
                      lVar62 = this_00->cstep * this_00->elemsize * (long)local_c8;
                      pvVar8 = this_00->data;
                      lVar54 = 0;
                      iVar48 = (int)local_68;
                      do {
                        pfVar53 = (float *)((long)local_e0 + lVar54 * 4);
                        local_b8 = *(undefined1 (*) [8])pfVar53;
                        uStack_b0 = *(int **)(pfVar53 + 2);
                        fStack_54 = *(float *)((long)local_d8 + lVar54);
                        local_58 = fStack_54;
                        fStack_4c = fStack_54;
                        fStack_50 = fStack_54;
                        afVar163 = binary_op_pow_pack4::operator()
                                             (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                        auVar12._8_4_ = extraout_XMM0_Dc_05;
                        auVar12._0_8_ = afVar163._0_8_;
                        auVar12._12_4_ = extraout_XMM0_Dd_05;
                        *(undefined1 (*) [16])((long)pvVar8 + lVar54 * 4 + lVar62) = auVar12;
                        lVar54 = lVar54 + 4;
                        iVar48 = iVar48 + -1;
                      } while (iVar48 != 0);
                    }
                    local_c8 = (void *)((long)local_c8 + 1);
                  } while (local_c8 != (void *)local_60);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_38 = CONCAT71(local_38._1_7_,uVar67 == 1);
            if ((uVar67 == 1 && uVar4 == 1) && uVar64 == uVar5) {
LAB_00235b7d:
              local_c0 = CONCAT44(local_c0._4_4_,uVar65);
              Mat::create(this_00,uVar66,uVar65,uVar64,sVar55,iVar56,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)uVar64) {
                  local_c8 = (void *)0x0;
                  local_68 = uVar50;
                  do {
                    pvVar8 = pMVar6[1].data;
                    pfVar53 = (float *)((long)pMVar6->data +
                                       pMVar6->cstep * (long)local_c8 * pMVar6->elemsize);
                    local_b8 = *(undefined1 (*) [8])pfVar53;
                    uStack_b0 = *(int **)(pfVar53 + 2);
                    if (0 < (int)local_d8) {
                      local_e0 = (float *)((long)this_00->data +
                                          this_00->cstep * this_00->elemsize * (long)local_c8);
                      lVar62 = pMVar6[1].cstep * pMVar6[1].elemsize * (long)local_c8;
                      lVar54 = 0;
                      iVar48 = (int)local_d8;
                      do {
                        pfVar53 = (float *)((long)pvVar8 + lVar54 + lVar62);
                        _local_58 = *(undefined8 *)pfVar53;
                        _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                        afVar163 = binary_op_pow_pack4::operator()
                                             (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                        auVar13._8_4_ = extraout_XMM0_Dc_13;
                        auVar13._0_8_ = afVar163._0_8_;
                        auVar13._12_4_ = extraout_XMM0_Dd_13;
                        *(undefined1 (*) [16])((long)local_e0 + lVar54) = auVar13;
                        lVar54 = lVar54 + 0x10;
                        iVar48 = iVar48 + -1;
                      } while (iVar48 != 0);
                    }
                    local_c8 = (void *)((long)local_c8 + 1);
                  } while (local_c8 != (void *)local_68);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_68 = uVar50;
            if (((iVar48 == 1) && (uVar65 == uVar4)) && (uVar5 == 1)) {
              Mat::create(this_00,uVar67,uVar4,uVar64,sVar55,iVar56,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_68) {
                  local_c0 = 0;
                  do {
                    if (0 < (int)local_d8) {
                      local_e0 = (float *)(pMVar6[1].cstep * pMVar6[1].elemsize * local_c0 +
                                          (long)pMVar6[1].data);
                      local_c8 = pMVar6->data;
                      lVar62 = this_00->cstep * this_00->elemsize * local_c0;
                      pvVar8 = this_00->data;
                      lVar54 = 0;
                      iVar48 = (int)local_d8;
                      do {
                        local_b8._4_4_ = *(float *)((long)local_c8 + lVar54);
                        local_b8._0_4_ = local_b8._4_4_;
                        uStack_b0 = (int *)CONCAT44(local_b8._4_4_,local_b8._4_4_);
                        pfVar53 = (float *)((long)local_e0 + lVar54 * 4);
                        _local_58 = *(undefined8 *)pfVar53;
                        _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                        afVar163 = binary_op_pow_pack4::operator()
                                             (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                        auVar14._8_4_ = extraout_XMM0_Dc_16;
                        auVar14._0_8_ = afVar163._0_8_;
                        auVar14._12_4_ = extraout_XMM0_Dd_16;
                        *(undefined1 (*) [16])((long)pvVar8 + lVar54 * 4 + lVar62) = auVar14;
                        lVar54 = lVar54 + 4;
                        iVar48 = iVar48 + -1;
                      } while (iVar48 != 0);
                    }
                    local_c0 = local_c0 + 1;
                  } while (local_c0 != local_68);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
          }
          else {
            local_38 = CONCAT71(local_38._1_7_,uVar67 == 1);
            if ((uVar67 == 1 && uVar4 == 1) && uVar64 == uVar5) goto LAB_00235b7d;
          }
          local_39 = uVar4 == 1;
          if ((((uVar66 ^ 1) == 0 && uVar65 == uVar4) && uVar5 == uVar64) && uVar67 != 1) {
            local_d8 = opt;
            Mat::create(this_00,uVar67,uVar4,uVar5,(size_t)pvVar8,iVar48,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)local_60) {
                local_c8 = (void *)0x0;
                do {
                  if (0 < (int)local_d0) {
                    local_d8 = (Option *)
                               (pMVar6[1].cstep * (long)local_c8 * pMVar6[1].elemsize +
                               (long)pMVar6[1].data);
                    pauVar59 = (undefined1 (*) [16])
                               (this_00->cstep * (long)local_c8 * this_00->elemsize +
                               (long)this_00->data);
                    pfVar53 = (float *)(pMVar6->cstep * (long)local_c8 * pMVar6->elemsize +
                                       (long)pMVar6->data);
                    local_e0 = (float *)0x0;
                    do {
                      pfVar52 = (float *)((long)local_d8 + (long)local_e0 * 0x10);
                      local_b8 = *(undefined1 (*) [8])pfVar52;
                      uStack_b0 = *(int **)(pfVar52 + 2);
                      uVar50 = local_70 & 0xffffffff;
                      if (0 < (int)local_70) {
                        do {
                          _local_58 = *(undefined8 *)pfVar53;
                          _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                          afVar163 = binary_op_pow_pack4::operator()
                                               (&local_e1,(__m128 *)&local_58,(__m128 *)local_b8);
                          auVar15._8_4_ = extraout_XMM0_Dc_10;
                          auVar15._0_8_ = afVar163._0_8_;
                          auVar15._12_4_ = extraout_XMM0_Dd_10;
                          *pauVar59 = auVar15;
                          pfVar53 = pfVar53 + 4;
                          pauVar59 = pauVar59 + 1;
                          uVar67 = (int)uVar50 - 1;
                          uVar50 = (ulong)uVar67;
                        } while (uVar67 != 0);
                      }
                      local_e0 = (float *)((long)local_e0 + 1);
                    } while (local_e0 != (float *)local_d0);
                  }
                  local_c8 = (void *)((long)local_c8 + 1);
                } while (local_c8 != (void *)local_60);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar66 != uVar67 || (uVar65 ^ 1) != 0) || uVar5 != uVar64) || uVar4 == 1) {
            if (((uVar64 == uVar5 && uVar65 == uVar4) & uVar66 != 1 & (byte)local_38) == 1) {
              local_d8 = opt;
              Mat::create(this_00,uVar66,uVar4,uVar5,sVar55,iVar56,opt->blob_allocator);
              if (this_00->data == (void *)0x0) {
                return -100;
              }
              if ((long)this_00->c * this_00->cstep != 0) {
                if (0 < (int)local_60) {
                  local_c0 = 0;
                  do {
                    if (0 < (int)local_d0) {
                      local_d8 = (Option *)
                                 (pMVar6->cstep * local_c0 * pMVar6->elemsize + (long)pMVar6->data);
                      pauVar59 = (undefined1 (*) [16])
                                 (this_00->cstep * local_c0 * this_00->elemsize +
                                 (long)this_00->data);
                      pfVar53 = (float *)(pMVar6[1].cstep * local_c0 * pMVar6[1].elemsize +
                                         (long)pMVar6[1].data);
                      local_e0 = (float *)0x0;
                      do {
                        pfVar52 = (float *)((long)local_d8 + (long)local_e0 * 0x10);
                        local_b8 = *(undefined1 (*) [8])pfVar52;
                        uStack_b0 = *(int **)(pfVar52 + 2);
                        iVar48 = (int)local_c8;
                        if (0 < (int)local_c8) {
                          do {
                            _local_58 = *(undefined8 *)pfVar53;
                            _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                            afVar163 = binary_op_pow_pack4::operator()
                                                 (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                            auVar17._8_4_ = extraout_XMM0_Dc_18;
                            auVar17._0_8_ = afVar163._0_8_;
                            auVar17._12_4_ = extraout_XMM0_Dd_18;
                            *pauVar59 = auVar17;
                            pfVar53 = pfVar53 + 4;
                            pauVar59 = pauVar59 + 1;
                            iVar48 = iVar48 + -1;
                          } while (iVar48 != 0);
                        }
                        local_e0 = (float *)((long)local_e0 + 1);
                      } while (local_e0 != (float *)local_d0);
                    }
                    local_c0 = local_c0 + 1;
                  } while (local_c0 != local_60);
                  return 0;
                }
                return 0;
              }
              return -100;
            }
            local_68 = CONCAT44(local_68._4_4_,iVar69);
            if (((bool)local_39 && uVar64 == uVar5) && (uVar65 != 1 && uVar66 == uVar67)) {
              local_c0 = CONCAT44(local_c0._4_4_,uVar65);
              local_d8 = opt;
              Mat::create(this_00,uVar67,uVar65,uVar5,sVar55,iVar56,opt->blob_allocator);
              if (this_00->data != (void *)0x0) {
                if ((long)this_00->c * this_00->cstep == 0) {
                  return -100;
                }
                if (0 < (int)local_60) {
                  local_d8 = (Option *)(local_70 << 4);
                  local_c8 = (void *)0x0;
                  do {
                    bVar71 = pMVar6->dims == 3;
                    local_80 = 1;
                    if (!bVar71) {
                      local_80 = pMVar6->d;
                    }
                    local_8c = pMVar6->w;
                    local_88 = pMVar6->h;
                    local_90 = bVar71 ^ 3;
                    local_e0 = (float *)pMVar6->cstep;
                    pvVar8 = pMVar6->data;
                    local_d0 = pMVar6->elemsize;
                    local_b8 = (undefined1  [8])
                               ((long)local_e0 * (long)local_c8 * local_d0 + (long)pvVar8);
                    local_a0 = pMVar6->elempack;
                    local_98 = pMVar6->allocator;
                    uStack_b0 = (int *)0x0;
                    local_78 = (long)local_88 * (long)local_8c;
                    local_84 = 1;
                    local_a8 = local_d0;
                    Mat::~Mat((Mat *)local_b8);
                    sVar55 = local_70;
                    bVar71 = pMVar6[1].dims == 3;
                    local_80 = 1;
                    if (!bVar71) {
                      local_80 = pMVar6[1].d;
                    }
                    local_8c = pMVar6[1].w;
                    local_88 = pMVar6[1].h;
                    local_a8 = pMVar6[1].elemsize;
                    pvVar60 = (void *)(pMVar6[1].cstep * (long)local_c8 * local_a8 +
                                      (long)pMVar6[1].data);
                    local_90 = bVar71 ^ 3;
                    local_a0 = pMVar6[1].elempack;
                    local_98 = pMVar6[1].allocator;
                    uStack_b0 = (int *)0x0;
                    local_78 = (long)local_88 * (long)local_8c;
                    local_84 = 1;
                    local_b8 = (undefined1  [8])pvVar60;
                    Mat::~Mat((Mat *)local_b8);
                    bVar71 = this_00->dims == 3;
                    local_8c = this_00->w;
                    local_88 = this_00->h;
                    local_80 = 1;
                    if (!bVar71) {
                      local_80 = this_00->d;
                    }
                    local_a8 = this_00->elemsize;
                    pvVar63 = (void *)(this_00->cstep * (long)local_c8 * local_a8 +
                                      (long)this_00->data);
                    local_90 = bVar71 ^ 3;
                    local_a0 = this_00->elempack;
                    local_98 = this_00->allocator;
                    uStack_b0 = (int *)0x0;
                    local_78 = (long)local_88 * (long)local_8c;
                    local_84 = 1;
                    local_b8 = (undefined1  [8])pvVar63;
                    Mat::~Mat((Mat *)local_b8);
                    if (0 < (int)(uint)local_c0) {
                      lVar62 = (long)local_e0 * local_d0 * (long)local_c8;
                      iVar48 = 0;
                      do {
                        lVar54 = (long)local_d8;
                        if (0 < (int)sVar55) {
                          local_e0 = (float *)CONCAT44(local_e0._4_4_,iVar48);
                          lVar70 = 0;
                          do {
                            pfVar53 = (float *)((long)pvVar8 + lVar70 + lVar62);
                            local_b8 = *(undefined1 (*) [8])pfVar53;
                            uStack_b0 = *(int **)(pfVar53 + 2);
                            _local_58 = *(undefined8 *)((long)pvVar60 + lVar70);
                            _fStack_50 = *(undefined8 *)((float *)((long)pvVar60 + lVar70) + 2);
                            afVar163 = binary_op_pow_pack4::operator()
                                                 (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                            auVar18._8_4_ = extraout_XMM0_Dc_20;
                            auVar18._0_8_ = afVar163._0_8_;
                            auVar18._12_4_ = extraout_XMM0_Dd_20;
                            *(undefined1 (*) [16])((long)pvVar63 + lVar70) = auVar18;
                            lVar70 = lVar70 + 0x10;
                          } while (lVar54 != lVar70);
                          pvVar63 = (void *)((long)pvVar63 + lVar70);
                          pvVar60 = (void *)((long)pvVar60 + lVar70);
                          sVar55 = local_70;
                          iVar48 = (int)local_e0;
                        }
                        iVar48 = iVar48 + 1;
                      } while (iVar48 != (uint)local_c0);
                    }
                    local_c8 = (void *)((long)local_c8 + 1);
                  } while (local_c8 != (void *)local_60);
                  return 0;
                }
                return 0;
              }
            }
            else {
              local_d8 = opt;
              Mat::create(this_00,uVar67,uVar4,uVar5,(size_t)pvVar8,iVar48,opt->blob_allocator);
              if (this_00->data != (void *)0x0) {
                if ((long)this_00->c * this_00->cstep == 0) {
                  return -100;
                }
                if (0 < (int)local_60) {
                  local_d8 = (Option *)0x0;
                  do {
                    uVar50 = (ulong)local_d8;
                    bVar71 = pMVar6->dims == 3;
                    local_80 = 1;
                    if (!bVar71) {
                      local_80 = pMVar6->d;
                    }
                    local_8c = pMVar6->w;
                    local_88 = pMVar6->h;
                    local_90 = bVar71 ^ 3;
                    local_c0 = pMVar6->cstep;
                    pvVar8 = pMVar6->data;
                    local_d0 = pMVar6->elemsize;
                    local_b8 = (undefined1  [8])
                               (local_c0 * (long)local_d8 * local_d0 + (long)pvVar8);
                    local_a0 = pMVar6->elempack;
                    local_98 = pMVar6->allocator;
                    uStack_b0 = (int *)0x0;
                    local_78 = (long)local_88 * (long)local_8c;
                    local_84 = 1;
                    local_a8 = local_d0;
                    Mat::~Mat((Mat *)local_b8);
                    bVar71 = pMVar6[1].dims == 3;
                    local_80 = 1;
                    if (!bVar71) {
                      local_80 = pMVar6[1].d;
                    }
                    local_8c = pMVar6[1].w;
                    local_88 = pMVar6[1].h;
                    local_90 = bVar71 ^ 3;
                    local_70 = pMVar6[1].cstep;
                    pvVar60 = pMVar6[1].data;
                    local_a8 = pMVar6[1].elemsize;
                    local_b8 = (undefined1  [8])(local_70 * uVar50 * local_a8 + (long)pvVar60);
                    local_a0 = pMVar6[1].elempack;
                    local_98 = pMVar6[1].allocator;
                    uStack_b0 = (int *)0x0;
                    local_78 = (long)local_88 * (long)local_8c;
                    local_84 = 1;
                    local_c8 = pvVar8;
                    local_38 = local_a8;
                    Mat::~Mat((Mat *)local_b8);
                    bVar71 = this_00->dims == 3;
                    local_8c = this_00->w;
                    local_88 = this_00->h;
                    local_80 = 1;
                    if (!bVar71) {
                      local_80 = this_00->d;
                    }
                    local_90 = bVar71 ^ 3;
                    sVar55 = this_00->cstep;
                    local_e0 = (float *)this_00->data;
                    sVar7 = this_00->elemsize;
                    local_b8 = (undefined1  [8])(sVar55 * uVar50 * sVar7 + (long)local_e0);
                    local_a0 = this_00->elempack;
                    local_98 = this_00->allocator;
                    uStack_b0 = (int *)0x0;
                    local_78 = (long)local_88 * (long)local_8c;
                    local_84 = 1;
                    local_a8 = sVar7;
                    Mat::~Mat((Mat *)local_b8);
                    pvVar8 = local_c8;
                    if (0 < (int)local_68) {
                      local_e0 = (float *)((long)local_e0 + sVar55 * sVar7 * (long)local_d8);
                      lVar62 = local_70 * local_38 * (long)local_d8;
                      lVar54 = local_c0 * local_d0 * (long)local_d8;
                      lVar70 = 0;
                      iVar48 = (int)local_68;
                      do {
                        pfVar53 = (float *)((long)pvVar8 + lVar70 + lVar54);
                        local_b8 = *(undefined1 (*) [8])pfVar53;
                        uStack_b0 = *(int **)(pfVar53 + 2);
                        pfVar53 = (float *)((long)pvVar60 + lVar70 + lVar62);
                        _local_58 = *(undefined8 *)pfVar53;
                        _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                        afVar163 = binary_op_pow_pack4::operator()
                                             (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                        auVar19._8_4_ = extraout_XMM0_Dc_21;
                        auVar19._0_8_ = afVar163._0_8_;
                        auVar19._12_4_ = extraout_XMM0_Dd_21;
                        *(undefined1 (*) [16])((long)local_e0 + lVar70) = auVar19;
                        lVar70 = lVar70 + 0x10;
                        iVar48 = iVar48 + -1;
                      } while (iVar48 != 0);
                    }
                    local_d8 = (Option *)((long)local_d8 + 1);
                  } while (local_d8 != (Option *)local_60);
                  return 0;
                }
                return 0;
              }
            }
            return -100;
          }
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,(size_t)pvVar8,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_60) {
              lVar62 = local_70 << 4;
              local_c8 = (void *)0x0;
              local_d8 = (Option *)lVar62;
              do {
                if (0 < (int)local_d0) {
                  pvVar60 = (void *)(this_00->cstep * (long)local_c8 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar63 = (void *)(pMVar6->cstep * (long)local_c8 * pMVar6->elemsize +
                                    (long)pMVar6->data);
                  lVar54 = pMVar6[1].elemsize * pMVar6[1].cstep * (long)local_c8;
                  pvVar8 = pMVar6[1].data;
                  iVar48 = 0;
                  uVar50 = local_d0;
                  do {
                    if (0 < (int)local_70) {
                      local_e0 = (float *)CONCAT44(local_e0._4_4_,iVar48);
                      lVar70 = 0;
                      do {
                        local_b8 = *(undefined1 (*) [8])((long)pvVar63 + lVar70);
                        uStack_b0 = *(int **)((float *)((long)pvVar63 + lVar70) + 2);
                        pfVar53 = (float *)((long)pvVar8 + lVar70 + lVar54);
                        _local_58 = *(undefined8 *)pfVar53;
                        _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                        afVar163 = binary_op_pow_pack4::operator()
                                             (&local_e1,(__m128 *)local_b8,(__m128 *)&local_58);
                        auVar16._8_4_ = extraout_XMM0_Dc_14;
                        auVar16._0_8_ = afVar163._0_8_;
                        auVar16._12_4_ = extraout_XMM0_Dd_14;
                        *(undefined1 (*) [16])((long)pvVar60 + lVar70) = auVar16;
                        lVar70 = lVar70 + 0x10;
                      } while (lVar62 != lVar70);
                      pvVar60 = (void *)((long)pvVar60 + lVar70);
                      pvVar63 = (void *)((long)pvVar63 + lVar70);
                      uVar50 = local_d0;
                      iVar48 = (int)local_e0;
                    }
                    iVar48 = iVar48 + 1;
                  } while (iVar48 != (int)uVar50);
                }
                local_c8 = (void *)((long)local_c8 + 1);
              } while (local_c8 != (void *)local_60);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar67,uVar4,uVar5,(size_t)pvVar8,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        local_68 = CONCAT44(local_68._4_4_,iVar69);
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar48 = (int)local_60;
        if (pMVar6[1].dims == 1) {
          if (iVar56 != 1 || pMVar6[1].w != 1) {
            if (0 < iVar48) {
              local_d8 = (Option *)0x0;
              do {
                pfVar53 = (float *)((long)pMVar6[1].data + (long)local_d8 * 0x10);
                local_b8 = *(undefined1 (*) [8])pfVar53;
                uStack_b0 = *(int **)(pfVar53 + 2);
                if (0 < (int)local_68) {
                  lVar62 = this_00->cstep * this_00->elemsize * (long)local_d8;
                  pvVar8 = this_00->data;
                  local_e0 = (float *)((long)pMVar6->data +
                                      pMVar6->cstep * pMVar6->elemsize * (long)local_d8);
                  lVar54 = 0;
                  iVar48 = (int)local_68;
                  do {
                    _local_58 = *(undefined8 *)((long)local_e0 + lVar54);
                    _fStack_50 = *(undefined8 *)((float *)((long)local_e0 + lVar54) + 2);
                    afVar163 = binary_op_pow_pack4::operator()
                                         (&local_e1,(__m128 *)&local_58,(__m128 *)local_b8);
                    auVar22._8_4_ = extraout_XMM0_Dc_15;
                    auVar22._0_8_ = afVar163._0_8_;
                    auVar22._12_4_ = extraout_XMM0_Dd_15;
                    *(undefined1 (*) [16])((long)pvVar8 + lVar54 + lVar62) = auVar22;
                    lVar54 = lVar54 + 0x10;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                local_d8 = (Option *)((long)local_d8 + 1);
              } while (local_d8 != (Option *)local_60);
              return 0;
            }
            return 0;
          }
          local_b8._4_4_ = *pMVar6[1].data;
          local_b8._0_4_ = local_b8._4_4_;
          uStack_b0 = (int *)CONCAT44(local_b8._4_4_,local_b8._4_4_);
          if (0 < iVar48) {
            local_d8 = (Option *)0x0;
            do {
              if (0 < (int)local_68) {
                local_e0 = (float *)(this_00->cstep * this_00->elemsize * (long)local_d8 +
                                    (long)this_00->data);
                lVar62 = pMVar6->cstep * pMVar6->elemsize * (long)local_d8;
                pvVar8 = pMVar6->data;
                lVar54 = 0;
                iVar48 = (int)local_68;
                do {
                  pfVar53 = (float *)((long)pvVar8 + lVar54 + lVar62);
                  _local_58 = *(undefined8 *)pfVar53;
                  _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                  afVar163 = binary_op_pow_pack4::operator()
                                       (&local_e1,(__m128 *)&local_58,(__m128 *)local_b8);
                  auVar21._8_4_ = extraout_XMM0_Dc_12;
                  auVar21._0_8_ = afVar163._0_8_;
                  auVar21._12_4_ = extraout_XMM0_Dd_12;
                  *(undefined1 (*) [16])((long)local_e0 + lVar54) = auVar21;
                  lVar54 = lVar54 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              local_d8 = (Option *)((long)local_d8 + 1);
            } while (local_d8 != (Option *)local_60);
          }
        }
        else if (pMVar6[1].dims == 2) {
          if (0 < iVar48) {
            local_c8 = (void *)0x0;
            do {
              if (0 < (int)local_d0) {
                pauVar59 = (undefined1 (*) [16])
                           (this_00->cstep * (long)local_c8 * this_00->elemsize +
                           (long)this_00->data);
                local_e0 = (float *)((long)pMVar6[1].w * (long)local_c8 * pMVar6[1].elemsize +
                                    (long)pMVar6[1].data);
                pfVar53 = (float *)(pMVar6->cstep * (long)local_c8 * pMVar6->elemsize +
                                   (long)pMVar6->data);
                iVar48 = 0;
                do {
                  local_d8 = (Option *)CONCAT44(local_d8._4_4_,iVar48);
                  local_b8 = *(undefined1 (*) [8])local_e0;
                  uStack_b0 = *(int **)(local_e0 + 2);
                  uVar50 = local_70 & 0xffffffff;
                  if (0 < (int)local_70) {
                    do {
                      _local_58 = *(undefined8 *)pfVar53;
                      _fStack_50 = *(undefined8 *)(pfVar53 + 2);
                      afVar163 = binary_op_pow_pack4::operator()
                                           (&local_e1,(__m128 *)&local_58,(__m128 *)local_b8);
                      auVar20._8_4_ = extraout_XMM0_Dc_04;
                      auVar20._0_8_ = afVar163._0_8_;
                      auVar20._12_4_ = extraout_XMM0_Dd_04;
                      *pauVar59 = auVar20;
                      pfVar53 = pfVar53 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar67 = (int)uVar50 - 1;
                      uVar50 = (ulong)uVar67;
                    } while (uVar67 != 0);
                  }
                  local_e0 = local_e0 + 4;
                  iVar48 = (int)local_d8 + 1;
                } while (iVar48 != (int)local_d0);
              }
              local_c8 = (void *)((long)local_c8 + 1);
            } while (local_c8 != (void *)local_60);
            return 0;
          }
          return 0;
        }
      }
    }
    return 0;
  case 7:
    uVar67 = pMVar6->w;
    uVar51 = (ulong)uVar67;
    sVar55 = pMVar6->elemsize;
    uVar66 = pMVar6[1].w;
    uVar65 = pMVar6[1].h;
    uVar64 = pMVar6[1].c;
    uVar50 = (ulong)uVar64;
    local_e0 = (float *)CONCAT44(local_e0._4_4_,uVar65 * uVar66);
    local_70 = pMVar6[1].elemsize;
    iVar3 = pMVar6->dims;
    if (iVar3 == 1) {
      iVar3 = pMVar6[1].dims;
      if (iVar48 != 1 || uVar67 != 1) {
        if (iVar3 == 1) {
          Mat::create(this_00,uVar67,sVar55,iVar48,opt->blob_allocator);
          pvVar8 = this_00->data;
          if (pvVar8 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar56 != 1 || pMVar6[1].w != 1) {
            if (0 < (int)uVar67) {
              pvVar60 = pMVar6->data;
              pvVar63 = pMVar6[1].data;
              lVar62 = 0;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62);
                fVar128 = pfVar53[1];
                fVar157 = pfVar53[2];
                fVar159 = pfVar53[3];
                pfVar52 = (float *)((long)pvVar63 + lVar62);
                fVar161 = pfVar52[1];
                fVar156 = pfVar52[2];
                fVar158 = pfVar52[3];
                pfVar1 = (float *)((long)pvVar8 + lVar62);
                *pfVar1 = *pfVar52 - *pfVar53;
                pfVar1[1] = fVar161 - fVar128;
                pfVar1[2] = fVar156 - fVar157;
                pfVar1[3] = fVar158 - fVar159;
                lVar62 = lVar62 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar67) {
            fVar128 = *pMVar6[1].data;
            pvVar60 = pMVar6->data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = fVar128 - *pfVar53;
              pfVar52[1] = fVar128 - fVar157;
              pfVar52[2] = fVar128 - fVar159;
              pfVar52[3] = fVar128 - fVar161;
              lVar62 = lVar62 + 0x10;
              uVar67 = (int)uVar51 - 1;
              uVar51 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar3 == 2) {
          Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
          pauVar59 = (undefined1 (*) [16])this_00->data;
          if (pauVar59 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              pfVar53 = (float *)pMVar6->data;
              pfVar52 = (float *)pMVar6[1].data;
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  fVar128 = *pfVar53;
                  fVar157 = pfVar53[1];
                  fVar159 = pfVar53[2];
                  fVar161 = pfVar53[3];
                  uVar64 = uVar66;
                  do {
                    auVar95._0_4_ = *pfVar52 - fVar128;
                    auVar95._4_4_ = pfVar52[1] - fVar157;
                    auVar95._8_4_ = pfVar52[2] - fVar159;
                    auVar95._12_4_ = pfVar52[3] - fVar161;
                    *pauVar59 = auVar95;
                    pfVar52 = pfVar52 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar64 = uVar64 - 1;
                  } while (uVar64 != 0);
                }
                pfVar53 = pfVar53 + 4;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar3 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_e0) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pfVar53 = (float *)((long)pMVar6->data + uVar51 * 0x10);
              fVar128 = *pfVar53;
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pvVar8 = this_00->data;
              sVar9 = pMVar6[1].cstep;
              sVar10 = pMVar6[1].elemsize;
              pvVar60 = pMVar6[1].data;
              lVar62 = 0;
              iVar48 = (int)local_e0;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
                auVar84._0_4_ = *pfVar53 - fVar128;
                auVar84._4_4_ = pfVar53[1] - fVar157;
                auVar84._8_4_ = pfVar53[2] - fVar159;
                auVar84._12_4_ = pfVar53[3] - fVar161;
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar84;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      if (iVar3 == 1) {
        Mat::create(this_00,uVar66,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar66) {
            fVar128 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = *pfVar53 - fVar128;
              pfVar52[1] = fVar157 - fVar128;
              pfVar52[2] = fVar159 - fVar128;
              pfVar52[3] = fVar161 - fVar128;
              lVar62 = lVar62 + 0x10;
              uVar66 = uVar66 - 1;
            } while (uVar66 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 == 2) {
        Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e0) {
            fVar128 = *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = *pfVar53 - fVar128;
              pfVar52[1] = fVar157 - fVar128;
              pfVar52[2] = fVar159 - fVar128;
              pfVar52[3] = fVar161 - fVar128;
              lVar62 = lVar62 + 0x10;
              local_e0._0_4_ = (int)local_e0 + -1;
            } while ((int)local_e0 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        fVar128 = *pMVar6->data;
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
              auVar80._0_4_ = *pfVar53 - fVar128;
              auVar80._4_4_ = pfVar53[1] - fVar128;
              auVar80._8_4_ = pfVar53[2] - fVar128;
              auVar80._12_4_ = pfVar53[3] - fVar128;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar80;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar4 = pMVar6->h;
    local_c8 = (void *)CONCAT44(local_c8._4_4_,uVar4 * uVar67);
    local_d8 = (Option *)uVar50;
    if (iVar3 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_00->cstep * uVar51 * this_00->elemsize + (long)this_00->data);
                pfVar53 = (float *)(pMVar6[1].cstep * uVar51 * pMVar6[1].elemsize +
                                   (long)pMVar6[1].data);
                pfVar52 = (float *)((long)pMVar6->w * uVar51 * pMVar6->elemsize + (long)pMVar6->data
                                   );
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    fVar128 = *pfVar52;
                    fVar157 = pfVar52[1];
                    fVar159 = pfVar52[2];
                    fVar161 = pfVar52[3];
                    uVar64 = uVar66;
                    do {
                      auVar78._0_4_ = *pfVar53 - fVar128;
                      auVar78._4_4_ = pfVar53[1] - fVar157;
                      auVar78._8_4_ = pfVar53[2] - fVar159;
                      auVar78._12_4_ = pfVar53[3] - fVar161;
                      *pauVar59 = auVar78;
                      pfVar53 = pfVar53 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pfVar52 = pfVar52 + 4;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pvVar8 = this_00->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_c8) {
          pvVar60 = pMVar6->data;
          pvVar63 = pMVar6[1].data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar60 + lVar62);
            fVar128 = pfVar53[1];
            fVar157 = pfVar53[2];
            fVar159 = pfVar53[3];
            pfVar52 = (float *)((long)pvVar63 + lVar62);
            fVar161 = pfVar52[1];
            fVar156 = pfVar52[2];
            fVar158 = pfVar52[3];
            pfVar1 = (float *)((long)pvVar8 + lVar62);
            *pfVar1 = *pfVar52 - *pfVar53;
            pfVar1[1] = fVar161 - fVar128;
            pfVar1[2] = fVar156 - fVar157;
            pfVar1[3] = fVar158 - fVar159;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pauVar59 = (undefined1 (*) [16])this_00->data;
      if (pauVar59 == (undefined1 (*) [16])0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar4) {
            pauVar57 = (undefined1 (*) [16])pMVar6->data;
            pfVar53 = (float *)pMVar6[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                uVar50 = uVar51;
                do {
                  auVar93 = *pauVar57;
                  auVar153._0_4_ = fVar128 - auVar93._0_4_;
                  auVar153._4_4_ = fVar157 - auVar93._4_4_;
                  auVar153._8_4_ = fVar159 - auVar93._8_4_;
                  auVar153._12_4_ = fVar161 - auVar93._12_4_;
                  *pauVar59 = auVar153;
                  pauVar57 = pauVar57 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar53 = pfVar53 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_c8) {
          fVar128 = *pMVar6[1].data;
          pvVar8 = pMVar6->data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar8 + lVar62);
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pfVar52 = (float *)((long)*pauVar59 + lVar62);
            *pfVar52 = fVar128 - *pfVar53;
            pfVar52[1] = fVar128 - fVar157;
            pfVar52[2] = fVar128 - fVar159;
            pfVar52[3] = fVar128 - fVar161;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar49 = (ulong)uVar5;
    local_c0 = sVar55;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims == 1) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar5) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pfVar53 = (float *)((long)pMVar6[1].data + uVar50 * 0x10);
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar6->cstep;
                sVar10 = pMVar6->elemsize;
                pvVar60 = pMVar6->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50)
                  ;
                  auVar148._0_4_ = fVar128 - auVar93._0_4_;
                  auVar148._4_4_ = fVar157 - auVar93._4_4_;
                  auVar148._8_4_ = fVar159 - auVar93._8_4_;
                  auVar148._12_4_ = fVar161 - auVar93._12_4_;
                  *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar148
                  ;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar49);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar5) {
          fVar128 = *pMVar6[1].data;
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar8 = this_00->data;
              sVar9 = pMVar6->cstep;
              sVar10 = pMVar6->elemsize;
              pvVar60 = pMVar6->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
                auVar143._0_4_ = fVar128 - auVar93._0_4_;
                auVar143._4_4_ = fVar128 - auVar93._4_4_;
                auVar143._8_4_ = fVar128 - auVar93._8_4_;
                auVar143._12_4_ = fVar128 - auVar93._12_4_;
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar143;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar5) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar4) {
            pauVar59 = (undefined1 (*) [16])
                       (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            pfVar53 = (float *)((long)pMVar6[1].w * uVar50 * pMVar6[1].elemsize +
                               (long)pMVar6[1].data);
            pauVar57 = (undefined1 (*) [16])
                       (pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                uVar68 = uVar51;
                do {
                  auVar93 = *pauVar57;
                  auVar136._0_4_ = fVar128 - auVar93._0_4_;
                  auVar136._4_4_ = fVar157 - auVar93._4_4_;
                  auVar136._8_4_ = fVar159 - auVar93._8_4_;
                  auVar136._12_4_ = fVar161 - auVar93._12_4_;
                  *pauVar59 = auVar136;
                  pauVar57 = pauVar57 + 1;
                  pauVar59 = pauVar59 + 1;
                  uVar65 = (int)uVar68 - 1;
                  uVar68 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar53 = pfVar53 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar49);
        return 0;
      }
      return 0;
    }
    if (uVar5 == uVar64 && ((uVar66 ^ 1) == 0 && (uVar65 ^ 1) == 0)) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar5) {
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = pMVar6->cstep;
              sVar7 = pMVar6->elemsize;
              pfVar53 = (float *)((long)pMVar6[1].data +
                                 pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize);
              fVar128 = *pfVar53;
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pvVar8 = pMVar6->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                auVar93 = *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                auVar130._0_4_ = fVar128 - auVar93._0_4_;
                auVar130._4_4_ = fVar157 - auVar93._4_4_;
                auVar130._8_4_ = fVar159 - auVar93._8_4_;
                auVar130._12_4_ = fVar161 - auVar93._12_4_;
                *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50) = auVar130;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = uVar49;
    if (uVar66 == uVar67) {
      if (iVar56 == 1 && (uVar64 == 1 && uVar65 == uVar4)) {
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = pMVar6->cstep;
                sVar7 = pMVar6->elemsize;
                sVar9 = this_00->cstep;
                pvVar8 = pMVar6->data;
                pvVar60 = pMVar6[1].data;
                sVar10 = this_00->elemsize;
                pvVar63 = this_00->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar50);
                  fVar128 = *(float *)((long)pvVar60 + lVar62);
                  auVar90._0_4_ = fVar128 - *pfVar53;
                  auVar90._4_4_ = fVar128 - pfVar53[1];
                  auVar90._8_4_ = fVar128 - pfVar53[2];
                  auVar90._12_4_ = fVar128 - pfVar53[3];
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar50) =
                       auVar90;
                  lVar62 = lVar62 + 4;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) {
        if (((iVar48 == 1) && (uVar65 == uVar4)) && (uVar5 == 1)) {
          Mat::create(this_00,uVar67,uVar4,uVar64,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar64) {
              uVar51 = 0;
              do {
                if (0 < (int)local_e0) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  sVar9 = this_00->cstep;
                  pvVar8 = pMVar6[1].data;
                  pvVar60 = pMVar6->data;
                  sVar10 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar62 = 0;
                  iVar48 = (int)local_e0;
                  do {
                    fVar128 = *(float *)((long)pvVar60 + lVar62);
                    pfVar53 = (float *)((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar51);
                    auVar114._0_4_ = *pfVar53 - fVar128;
                    auVar114._4_4_ = pfVar53[1] - fVar128;
                    auVar114._8_4_ = pfVar53[2] - fVar128;
                    auVar114._12_4_ = pfVar53[3] - fVar128;
                    *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar51) =
                         auVar114;
                    lVar62 = lVar62 + 4;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
LAB_00233952:
        if ((((uVar66 ^ 1) == 0 && uVar65 == uVar4) && uVar5 == uVar64) && uVar67 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  pvVar8 = pMVar6[1].data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pauVar57 = (undefined1 (*) [16])
                             (pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      pfVar53 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      fVar128 = *pfVar53;
                      fVar157 = pfVar53[1];
                      fVar159 = pfVar53[2];
                      fVar161 = pfVar53[3];
                      uVar66 = uVar67;
                      do {
                        auVar93 = *pauVar57;
                        auVar142._0_4_ = fVar128 - auVar93._0_4_;
                        auVar142._4_4_ = fVar157 - auVar93._4_4_;
                        auVar142._8_4_ = fVar159 - auVar93._8_4_;
                        auVar142._12_4_ = fVar161 - auVar93._12_4_;
                        *pauVar59 = auVar142;
                        pauVar57 = pauVar57 + 1;
                        pauVar59 = pauVar59 + 1;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar66 == uVar67 && (uVar65 ^ 1) == 0) && uVar5 == uVar64) && uVar4 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].elemsize;
                  pvVar60 = (void *)(this_00->cstep * uVar50 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar63 = (void *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data)
                  ;
                  sVar7 = pMVar6[1].cstep;
                  pvVar8 = pMVar6[1].data;
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        pfVar53 = (float *)((long)pvVar63 + lVar62);
                        pfVar52 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                        auVar108._0_4_ = *pfVar52 - *pfVar53;
                        auVar108._4_4_ = pfVar52[1] - pfVar53[1];
                        auVar108._8_4_ = pfVar52[2] - pfVar53[2];
                        auVar108._12_4_ = pfVar52[3] - pfVar53[3];
                        *(undefined1 (*) [16])((long)pvVar60 + lVar62) = auVar108;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar64 == uVar5 && uVar65 == uVar4) & uVar66 != 1 & (byte)local_68) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar66,uVar4,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar5) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6->cstep;
                  sVar7 = pMVar6->elemsize;
                  pvVar8 = pMVar6->data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pfVar53 = (float *)(pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize +
                                     (long)pMVar6[1].data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar66) {
                      pfVar52 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      fVar128 = *pfVar52;
                      fVar157 = pfVar52[1];
                      fVar159 = pfVar52[2];
                      fVar161 = pfVar52[3];
                      uVar67 = uVar66;
                      do {
                        auVar117._0_4_ = *pfVar53 - fVar128;
                        auVar117._4_4_ = pfVar53[1] - fVar157;
                        auVar117._8_4_ = pfVar53[2] - fVar159;
                        auVar117._12_4_ = pfVar53[3] - fVar161;
                        *pauVar59 = auVar117;
                        pfVar53 = pfVar53 + 4;
                        pauVar59 = pauVar59 + 1;
                        uVar67 = uVar67 - 1;
                      } while (uVar67 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != uVar49);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((byte)local_60 & uVar64 == uVar5 & (uVar65 != 1 && uVar66 == uVar67)) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar65,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              local_e0 = (float *)0x0;
              do {
                bVar71 = pMVar6->dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6->d;
                }
                local_8c = pMVar6->w;
                local_88 = pMVar6->h;
                local_90 = bVar71 ^ 3;
                local_d8 = (Option *)pMVar6->cstep;
                pvVar8 = pMVar6->data;
                local_c8 = (void *)pMVar6->elemsize;
                local_b8 = (undefined1  [8])
                           ((long)local_d8 * (long)local_e0 * (long)local_c8 + (long)pvVar8);
                local_a0 = pMVar6->elempack;
                local_98 = pMVar6->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_a8 = (size_t)local_c8;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = pMVar6[1].dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6[1].d;
                }
                local_8c = pMVar6[1].w;
                local_88 = pMVar6[1].h;
                local_a8 = pMVar6[1].elemsize;
                pvVar60 = (void *)(pMVar6[1].cstep * (long)local_e0 * local_a8 +
                                  (long)pMVar6[1].data);
                local_90 = bVar71 ^ 3;
                local_a0 = pMVar6[1].elempack;
                local_98 = pMVar6[1].allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar60;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = this_00->dims == 3;
                local_8c = this_00->w;
                local_88 = this_00->h;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = this_00->d;
                }
                local_a8 = this_00->elemsize;
                pvVar63 = (void *)(this_00->cstep * (long)local_e0 * local_a8 + (long)this_00->data)
                ;
                local_90 = bVar71 ^ 3;
                local_a0 = this_00->elempack;
                local_98 = this_00->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar63;
                Mat::~Mat((Mat *)local_b8);
                if (0 < (int)uVar65) {
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        pfVar53 = (float *)((long)pvVar8 +
                                           lVar62 + (long)local_d8 * (long)local_c8 * (long)local_e0
                                           );
                        pfVar52 = (float *)((long)pvVar60 + lVar62);
                        auVar123._0_4_ = *pfVar52 - *pfVar53;
                        auVar123._4_4_ = pfVar52[1] - pfVar53[1];
                        auVar123._8_4_ = pfVar52[2] - pfVar53[2];
                        auVar123._12_4_ = pfVar52[3] - pfVar53[3];
                        *(undefined1 (*) [16])((long)pvVar63 + lVar62) = auVar123;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar65);
                }
                local_e0 = (float *)((long)local_e0 + 1);
              } while (local_e0 != (float *)local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              bVar71 = pMVar6->dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6->d;
              }
              local_8c = pMVar6->w;
              local_88 = pMVar6->h;
              local_90 = bVar71 ^ 3;
              local_e0 = (float *)pMVar6->cstep;
              pvVar8 = pMVar6->data;
              local_d8 = (Option *)pMVar6->elemsize;
              local_b8 = (undefined1  [8])((long)local_e0 * uVar50 * (long)local_d8 + (long)pvVar8);
              local_a0 = pMVar6->elempack;
              local_98 = pMVar6->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = (size_t)local_d8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = pMVar6[1].dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6[1].d;
              }
              local_8c = pMVar6[1].w;
              local_88 = pMVar6[1].h;
              local_90 = bVar71 ^ 3;
              local_c0 = pMVar6[1].cstep;
              pvVar60 = pMVar6[1].data;
              local_a8 = pMVar6[1].elemsize;
              local_b8 = (undefined1  [8])(local_c0 * uVar50 * local_a8 + (long)pvVar60);
              local_a0 = pMVar6[1].elempack;
              local_98 = pMVar6[1].allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_70 = local_a8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = this_00->dims == 3;
              local_8c = this_00->w;
              local_88 = this_00->h;
              local_80 = 1;
              if (!bVar71) {
                local_80 = this_00->d;
              }
              local_90 = bVar71 ^ 3;
              sVar55 = this_00->cstep;
              pvVar63 = this_00->data;
              sVar7 = this_00->elemsize;
              local_b8 = (undefined1  [8])(sVar55 * uVar50 * sVar7 + (long)pvVar63);
              local_a0 = this_00->elempack;
              local_98 = this_00->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = sVar7;
              Mat::~Mat((Mat *)local_b8);
              if (0 < (int)local_c8) {
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  pfVar53 = (float *)((long)pvVar8 +
                                     lVar62 + (long)local_e0 * (long)local_d8 * uVar50);
                  pfVar52 = (float *)((long)pvVar60 + lVar62 + local_c0 * local_70 * uVar50);
                  auVar126._0_4_ = *pfVar52 - *pfVar53;
                  auVar126._4_4_ = pfVar52[1] - pfVar53[1];
                  auVar126._8_4_ = pfVar52[2] - pfVar53[2];
                  auVar126._12_4_ = pfVar52[3] - pfVar53[3];
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 + sVar55 * sVar7 * uVar50) =
                       auVar126;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    else {
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) goto LAB_00233952;
    }
    Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pfVar53 = (float *)((long)pMVar6->data + pMVar6->cstep * uVar51 * pMVar6->elemsize);
            fVar128 = *pfVar53;
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
              auVar105._0_4_ = *pfVar53 - fVar128;
              auVar105._4_4_ = pfVar53[1] - fVar157;
              auVar105._8_4_ = pfVar53[2] - fVar159;
              auVar105._12_4_ = pfVar53[3] - fVar161;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar105;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  case 8:
    uVar67 = pMVar6->w;
    uVar51 = (ulong)uVar67;
    sVar55 = pMVar6->elemsize;
    uVar66 = pMVar6[1].w;
    uVar65 = pMVar6[1].h;
    uVar64 = pMVar6[1].c;
    uVar50 = (ulong)uVar64;
    local_e0 = (float *)CONCAT44(local_e0._4_4_,uVar65 * uVar66);
    local_70 = pMVar6[1].elemsize;
    iVar3 = pMVar6->dims;
    if (iVar3 == 1) {
      iVar3 = pMVar6[1].dims;
      if (iVar48 != 1 || uVar67 != 1) {
        if (iVar3 == 1) {
          Mat::create(this_00,uVar67,sVar55,iVar48,opt->blob_allocator);
          pvVar8 = this_00->data;
          if (pvVar8 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (iVar56 != 1 || pMVar6[1].w != 1) {
            if (0 < (int)uVar67) {
              pvVar60 = pMVar6->data;
              pvVar63 = pMVar6[1].data;
              lVar62 = 0;
              do {
                auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62);
                in_XMM1 = rcpps(in_XMM1,auVar93);
                pfVar53 = (float *)((long)pvVar63 + lVar62);
                fVar128 = pfVar53[1];
                fVar157 = pfVar53[2];
                fVar159 = pfVar53[3];
                fVar161 = *pfVar53 * in_XMM1._0_4_;
                fVar156 = fVar128 * in_XMM1._4_4_;
                fVar158 = fVar157 * in_XMM1._8_4_;
                fVar160 = fVar159 * in_XMM1._12_4_;
                pfVar52 = (float *)((long)pvVar8 + lVar62);
                *pfVar52 = (*pfVar53 - auVar93._0_4_ * fVar161) * in_XMM1._0_4_ + fVar161;
                pfVar52[1] = (fVar128 - auVar93._4_4_ * fVar156) * in_XMM1._4_4_ + fVar156;
                pfVar52[2] = (fVar157 - auVar93._8_4_ * fVar158) * in_XMM1._8_4_ + fVar158;
                pfVar52[3] = (fVar159 - auVar93._12_4_ * fVar160) * in_XMM1._12_4_ + fVar160;
                lVar62 = lVar62 + 0x10;
                uVar67 = (int)uVar51 - 1;
                uVar51 = (ulong)uVar67;
              } while (uVar67 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar67) {
            fVar128 = *pMVar6[1].data;
            pvVar60 = pMVar6->data;
            lVar62 = 0;
            do {
              auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62);
              in_XMM2 = rcpps(in_XMM2,auVar93);
              fVar157 = fVar128 * in_XMM2._0_4_;
              fVar159 = fVar128 * in_XMM2._4_4_;
              fVar161 = fVar128 * in_XMM2._8_4_;
              fVar156 = fVar128 * in_XMM2._12_4_;
              pfVar53 = (float *)((long)pvVar8 + lVar62);
              *pfVar53 = (fVar128 - auVar93._0_4_ * fVar157) * in_XMM2._0_4_ + fVar157;
              pfVar53[1] = (fVar128 - auVar93._4_4_ * fVar159) * in_XMM2._4_4_ + fVar159;
              pfVar53[2] = (fVar128 - auVar93._8_4_ * fVar161) * in_XMM2._8_4_ + fVar161;
              pfVar53[3] = (fVar128 - auVar93._12_4_ * fVar156) * in_XMM2._12_4_ + fVar156;
              lVar62 = lVar62 + 0x10;
              uVar67 = (int)uVar51 - 1;
              uVar51 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar3 == 2) {
          Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
          pauVar59 = (undefined1 (*) [16])this_00->data;
          if (pauVar59 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar65) {
              pauVar57 = (undefined1 (*) [16])pMVar6->data;
              pfVar53 = (float *)pMVar6[1].data;
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  auVar93 = *pauVar57;
                  in_XMM3 = rcpps(in_XMM3,auVar93);
                  fVar128 = in_XMM3._0_4_;
                  fVar157 = in_XMM3._4_4_;
                  fVar159 = in_XMM3._8_4_;
                  fVar161 = in_XMM3._12_4_;
                  uVar64 = uVar66;
                  do {
                    auVar75._0_4_ = *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128)
                    ;
                    auVar75._4_4_ =
                         pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
                    auVar75._8_4_ =
                         pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
                    auVar75._12_4_ =
                         pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
                    *pauVar59 = auVar75;
                    pfVar53 = pfVar53 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar64 = uVar64 - 1;
                  } while (uVar64 != 0);
                }
                pauVar57 = pauVar57 + 1;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar3 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_e0) {
              sVar55 = pMVar6[1].cstep;
              auVar93 = *(undefined1 (*) [16])((long)pMVar6->data + uVar51 * 0x10);
              in_XMM3 = rcpps(in_XMM3,auVar93);
              fVar128 = in_XMM3._0_4_;
              fVar157 = in_XMM3._4_4_;
              fVar159 = in_XMM3._8_4_;
              fVar161 = in_XMM3._12_4_;
              sVar7 = this_00->cstep;
              sVar9 = this_00->elemsize;
              pvVar8 = this_00->data;
              sVar10 = pMVar6[1].elemsize;
              pvVar60 = pMVar6[1].data;
              lVar62 = 0;
              iVar48 = (int)local_e0;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar55 * sVar10 * uVar51);
                auVar137._0_4_ = *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128);
                auVar137._4_4_ = pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
                auVar137._8_4_ = pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
                auVar137._12_4_ =
                     pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar7 * sVar9 * uVar51) = auVar137;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      if (iVar3 == 1) {
        Mat::create(this_00,uVar66,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar66) {
            fVar128 = 1.0 / *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = *pfVar53 * fVar128;
              pfVar52[1] = fVar157 * fVar128;
              pfVar52[2] = fVar159 * fVar128;
              pfVar52[3] = fVar161 * fVar128;
              lVar62 = lVar62 + 0x10;
              uVar66 = uVar66 - 1;
            } while (uVar66 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 == 2) {
        Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_e0) {
            fVar128 = 1.0 / *pMVar6->data;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar8 + lVar62);
              *pfVar52 = *pfVar53 * fVar128;
              pfVar52[1] = fVar157 * fVar128;
              pfVar52[2] = fVar159 * fVar128;
              pfVar52[3] = fVar161 * fVar128;
              lVar62 = lVar62 + 0x10;
              local_e0._0_4_ = (int)local_e0 + -1;
            } while ((int)local_e0 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar64) {
        fVar128 = 1.0 / *pMVar6->data;
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar8 = this_00->data;
            sVar9 = pMVar6[1].cstep;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
              auVar93._0_4_ = *pfVar53 * fVar128;
              auVar93._4_4_ = pfVar53[1] * fVar128;
              auVar93._8_4_ = pfVar53[2] * fVar128;
              auVar93._12_4_ = pfVar53[3] * fVar128;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar93;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    uVar4 = pMVar6->h;
    local_c8 = (void *)CONCAT44(local_c8._4_4_,uVar4 * uVar67);
    local_d8 = (Option *)uVar50;
    if (iVar3 == 2) {
      if (pMVar6[1].dims == 3) {
        Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)uVar65) {
                pauVar59 = (undefined1 (*) [16])
                           (this_00->cstep * uVar51 * this_00->elemsize + (long)this_00->data);
                pfVar53 = (float *)(pMVar6[1].cstep * uVar51 * pMVar6[1].elemsize +
                                   (long)pMVar6[1].data);
                pauVar57 = (undefined1 (*) [16])
                           ((long)pMVar6->w * uVar51 * pMVar6->elemsize + (long)pMVar6->data);
                uVar67 = 0;
                do {
                  if (0 < (int)uVar66) {
                    auVar93 = *pauVar57;
                    in_XMM3 = rcpps(in_XMM3,auVar93);
                    fVar128 = in_XMM3._0_4_;
                    fVar157 = in_XMM3._4_4_;
                    fVar159 = in_XMM3._8_4_;
                    fVar161 = in_XMM3._12_4_;
                    uVar64 = uVar66;
                    do {
                      auVar133._0_4_ =
                           *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128);
                      auVar133._4_4_ =
                           pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
                      auVar133._8_4_ =
                           pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
                      auVar133._12_4_ =
                           pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
                      *pauVar59 = auVar133;
                      pfVar53 = pfVar53 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar64 = uVar64 - 1;
                    } while (uVar64 != 0);
                  }
                  pauVar57 = pauVar57 + 1;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar65);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pvVar8 = this_00->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims != 1) {
        if (pMVar6[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_c8) {
          pvVar60 = pMVar6->data;
          pvVar63 = pMVar6[1].data;
          lVar62 = 0;
          do {
            auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62);
            in_XMM1 = rcpps(in_XMM1,auVar93);
            pfVar53 = (float *)((long)pvVar63 + lVar62);
            fVar128 = pfVar53[1];
            fVar157 = pfVar53[2];
            fVar159 = pfVar53[3];
            fVar161 = *pfVar53 * in_XMM1._0_4_;
            fVar156 = fVar128 * in_XMM1._4_4_;
            fVar158 = fVar157 * in_XMM1._8_4_;
            fVar160 = fVar159 * in_XMM1._12_4_;
            pfVar52 = (float *)((long)pvVar8 + lVar62);
            *pfVar52 = (*pfVar53 - auVar93._0_4_ * fVar161) * in_XMM1._0_4_ + fVar161;
            pfVar52[1] = (fVar128 - auVar93._4_4_ * fVar156) * in_XMM1._4_4_ + fVar156;
            pfVar52[2] = (fVar157 - auVar93._8_4_ * fVar158) * in_XMM1._8_4_ + fVar158;
            pfVar52[3] = (fVar159 - auVar93._12_4_ * fVar160) * in_XMM1._12_4_ + fVar160;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
      pfVar53 = (float *)this_00->data;
      if (pfVar53 == (float *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar4) {
            pauVar59 = (undefined1 (*) [16])pMVar6->data;
            pfVar52 = (float *)pMVar6[1].data;
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar128 = *pfVar52;
                fVar157 = pfVar52[1];
                fVar159 = pfVar52[2];
                fVar161 = pfVar52[3];
                uVar50 = uVar51;
                do {
                  auVar93 = *pauVar59;
                  in_XMM2 = rcpps(in_XMM2,auVar93);
                  fVar156 = fVar128 * in_XMM2._0_4_;
                  fVar158 = fVar157 * in_XMM2._4_4_;
                  fVar160 = fVar159 * in_XMM2._8_4_;
                  fVar162 = fVar161 * in_XMM2._12_4_;
                  *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
                  pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                  pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                  pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
                  pauVar59 = pauVar59 + 1;
                  pfVar53 = pfVar53 + 4;
                  uVar65 = (int)uVar50 - 1;
                  uVar50 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar52 = pfVar52 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
            return 0;
          }
          return 0;
        }
        if (0 < (int)local_c8) {
          fVar128 = *pMVar6[1].data;
          pvVar8 = pMVar6->data;
          lVar62 = 0;
          do {
            auVar93 = *(undefined1 (*) [16])((long)pvVar8 + lVar62);
            in_XMM2 = rcpps(in_XMM2,auVar93);
            fVar157 = fVar128 * in_XMM2._0_4_;
            fVar159 = fVar128 * in_XMM2._4_4_;
            fVar161 = fVar128 * in_XMM2._8_4_;
            fVar156 = fVar128 * in_XMM2._12_4_;
            pfVar52 = (float *)((long)pfVar53 + lVar62);
            *pfVar52 = (fVar128 - auVar93._0_4_ * fVar157) * in_XMM2._0_4_ + fVar157;
            pfVar52[1] = (fVar128 - auVar93._4_4_ * fVar159) * in_XMM2._4_4_ + fVar159;
            pfVar52[2] = (fVar128 - auVar93._8_4_ * fVar161) * in_XMM2._8_4_ + fVar161;
            pfVar52[3] = (fVar128 - auVar93._12_4_ * fVar156) * in_XMM2._12_4_ + fVar156;
            lVar62 = lVar62 + 0x10;
            local_c8._0_4_ = (int)local_c8 + -1;
          } while ((int)local_c8 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 != 3) {
      return 0;
    }
    uVar5 = pMVar6->c;
    uVar49 = (ulong)uVar5;
    local_c0 = sVar55;
    if (pMVar6[1].dims != 3) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar6[1].dims == 1) {
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar5) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = this_00->cstep;
                sVar7 = this_00->elemsize;
                pfVar53 = (float *)((long)pMVar6[1].data + uVar50 * 0x10);
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                pvVar8 = this_00->data;
                sVar9 = pMVar6->cstep;
                sVar10 = pMVar6->elemsize;
                pvVar60 = pMVar6->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50)
                  ;
                  in_XMM2 = rcpps(in_XMM2,auVar93);
                  fVar156 = fVar128 * in_XMM2._0_4_;
                  fVar158 = fVar157 * in_XMM2._4_4_;
                  fVar160 = fVar159 * in_XMM2._8_4_;
                  fVar162 = fVar161 * in_XMM2._12_4_;
                  pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                  *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
                  pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                  pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                  pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar49);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar5) {
          fVar128 = *pMVar6[1].data;
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar8 = this_00->data;
              sVar9 = pMVar6->cstep;
              sVar10 = pMVar6->elemsize;
              pvVar60 = pMVar6->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                auVar93 = *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
                in_XMM2 = rcpps(in_XMM2,auVar93);
                fVar157 = fVar128 * in_XMM2._0_4_;
                fVar159 = fVar128 * in_XMM2._4_4_;
                fVar161 = fVar128 * in_XMM2._8_4_;
                fVar156 = fVar128 * in_XMM2._12_4_;
                pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                *pfVar53 = (fVar128 - auVar93._0_4_ * fVar157) * in_XMM2._0_4_ + fVar157;
                pfVar53[1] = (fVar128 - auVar93._4_4_ * fVar159) * in_XMM2._4_4_ + fVar159;
                pfVar53[2] = (fVar128 - auVar93._8_4_ * fVar161) * in_XMM2._8_4_ + fVar161;
                pfVar53[3] = (fVar128 - auVar93._12_4_ * fVar156) * in_XMM2._12_4_ + fVar156;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if (0 < (int)uVar5) {
        uVar50 = 0;
        do {
          if (0 < (int)uVar4) {
            pfVar53 = (float *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
            pfVar52 = (float *)((long)pMVar6[1].w * uVar50 * pMVar6[1].elemsize +
                               (long)pMVar6[1].data);
            pauVar59 = (undefined1 (*) [16])
                       (pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
            uVar66 = 0;
            do {
              if (0 < (int)uVar67) {
                fVar128 = *pfVar52;
                fVar157 = pfVar52[1];
                fVar159 = pfVar52[2];
                fVar161 = pfVar52[3];
                uVar68 = uVar51;
                do {
                  auVar93 = *pauVar59;
                  in_XMM2 = rcpps(in_XMM2,auVar93);
                  fVar156 = fVar128 * in_XMM2._0_4_;
                  fVar158 = fVar157 * in_XMM2._4_4_;
                  fVar160 = fVar159 * in_XMM2._8_4_;
                  fVar162 = fVar161 * in_XMM2._12_4_;
                  *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
                  pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                  pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                  pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
                  pauVar59 = pauVar59 + 1;
                  pfVar53 = pfVar53 + 4;
                  uVar65 = (int)uVar68 - 1;
                  uVar68 = (ulong)uVar65;
                } while (uVar65 != 0);
              }
              pfVar52 = pfVar52 + 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != uVar4);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar49);
        return 0;
      }
      return 0;
    }
    if (uVar5 == uVar64 && ((uVar66 ^ 1) == 0 && (uVar65 ^ 1) == 0)) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar5) {
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = pMVar6->cstep;
              sVar7 = pMVar6->elemsize;
              pfVar53 = (float *)((long)pMVar6[1].data +
                                 pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize);
              fVar128 = *pfVar53;
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pvVar8 = pMVar6->data;
              sVar9 = this_00->cstep;
              sVar10 = this_00->elemsize;
              pvVar60 = this_00->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                auVar93 = *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                in_XMM2 = rcpps(in_XMM2,auVar93);
                fVar156 = fVar128 * in_XMM2._0_4_;
                fVar158 = fVar157 * in_XMM2._4_4_;
                fVar160 = fVar159 * in_XMM2._8_4_;
                fVar162 = fVar161 * in_XMM2._12_4_;
                pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
                *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
                pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_d0 = uVar49;
    if (uVar66 == uVar67) {
      if (iVar56 == 1 && (uVar64 == 1 && uVar65 == uVar4)) {
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              if (0 < (int)local_c8) {
                sVar55 = pMVar6->cstep;
                sVar7 = pMVar6->elemsize;
                sVar9 = this_00->cstep;
                pvVar8 = pMVar6->data;
                pvVar60 = pMVar6[1].data;
                sVar10 = this_00->elemsize;
                pvVar63 = this_00->data;
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  auVar93 = *(undefined1 (*) [16])
                             ((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar50);
                  in_XMM1 = rcpps(in_XMM1,auVar93);
                  fVar128 = *(float *)((long)pvVar60 + lVar62);
                  fVar157 = fVar128 * in_XMM1._0_4_;
                  fVar159 = fVar128 * in_XMM1._4_4_;
                  fVar161 = fVar128 * in_XMM1._8_4_;
                  fVar156 = fVar128 * in_XMM1._12_4_;
                  auVar139._0_4_ = (fVar128 - auVar93._0_4_ * fVar157) * in_XMM1._0_4_ + fVar157;
                  auVar139._4_4_ = (fVar128 - auVar93._4_4_ * fVar159) * in_XMM1._4_4_ + fVar159;
                  auVar139._8_4_ = (fVar128 - auVar93._8_4_ * fVar161) * in_XMM1._8_4_ + fVar161;
                  auVar139._12_4_ = (fVar128 - auVar93._12_4_ * fVar156) * in_XMM1._12_4_ + fVar156;
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar50) =
                       auVar139;
                  lVar62 = lVar62 + 4;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) {
        if (((iVar48 == 1) && (uVar65 == uVar4)) && (uVar5 == 1)) {
          Mat::create(this_00,uVar67,uVar4,uVar64,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar64) {
              uVar51 = 0;
              do {
                if (0 < (int)local_e0) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  sVar9 = this_00->cstep;
                  pvVar8 = pMVar6[1].data;
                  pvVar60 = pMVar6->data;
                  sVar10 = this_00->elemsize;
                  pvVar63 = this_00->data;
                  lVar62 = 0;
                  iVar48 = (int)local_e0;
                  do {
                    auVar93 = *(undefined1 (*) [16])
                               ((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar51);
                    fVar128 = 1.0 / *(float *)((long)pvVar60 + lVar62);
                    auVar149._0_4_ = fVar128 * auVar93._0_4_;
                    auVar149._4_4_ = fVar128 * auVar93._4_4_;
                    auVar149._8_4_ = fVar128 * auVar93._8_4_;
                    auVar149._12_4_ = fVar128 * auVar93._12_4_;
                    *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar51) =
                         auVar149;
                    lVar62 = lVar62 + 4;
                    iVar48 = iVar48 + -1;
                  } while (iVar48 != 0);
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar50);
              return 0;
            }
            return 0;
          }
          return -100;
        }
LAB_002347dc:
        if ((((uVar66 ^ 1) == 0 && uVar65 == uVar4) && uVar5 == uVar64) && uVar67 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].cstep;
                  sVar7 = pMVar6[1].elemsize;
                  pvVar8 = pMVar6[1].data;
                  pfVar53 = (float *)(this_00->cstep * uVar50 * this_00->elemsize +
                                     (long)this_00->data);
                  pauVar59 = (undefined1 (*) [16])
                             (pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      pfVar52 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      fVar128 = *pfVar52;
                      fVar157 = pfVar52[1];
                      fVar159 = pfVar52[2];
                      fVar161 = pfVar52[3];
                      uVar66 = uVar67;
                      do {
                        auVar93 = *pauVar59;
                        in_XMM2 = rcpps(in_XMM2,auVar93);
                        fVar156 = fVar128 * in_XMM2._0_4_;
                        fVar158 = fVar157 * in_XMM2._4_4_;
                        fVar160 = fVar159 * in_XMM2._8_4_;
                        fVar162 = fVar161 * in_XMM2._12_4_;
                        *pfVar53 = (fVar128 - auVar93._0_4_ * fVar156) * in_XMM2._0_4_ + fVar156;
                        pfVar53[1] = (fVar157 - auVar93._4_4_ * fVar158) * in_XMM2._4_4_ + fVar158;
                        pfVar53[2] = (fVar159 - auVar93._8_4_ * fVar160) * in_XMM2._8_4_ + fVar160;
                        pfVar53[3] = (fVar161 - auVar93._12_4_ * fVar162) * in_XMM2._12_4_ + fVar162
                        ;
                        pauVar59 = pauVar59 + 1;
                        pfVar53 = pfVar53 + 4;
                        uVar66 = uVar66 - 1;
                      } while (uVar66 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar66 == uVar67 && (uVar65 ^ 1) == 0) && uVar5 == uVar64) && uVar4 != 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6[1].elemsize;
                  pvVar60 = (void *)(this_00->cstep * uVar50 * this_00->elemsize +
                                    (long)this_00->data);
                  pvVar63 = (void *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data)
                  ;
                  sVar7 = pMVar6[1].cstep;
                  pvVar8 = pMVar6[1].data;
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        auVar93 = *(undefined1 (*) [16])((long)pvVar63 + lVar62);
                        in_XMM1 = rcpps(in_XMM1,auVar93);
                        pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                        fVar128 = *pfVar53 * in_XMM1._0_4_;
                        fVar157 = pfVar53[1] * in_XMM1._4_4_;
                        fVar159 = pfVar53[2] * in_XMM1._8_4_;
                        fVar161 = pfVar53[3] * in_XMM1._12_4_;
                        auVar146._0_4_ =
                             (*pfVar53 - auVar93._0_4_ * fVar128) * in_XMM1._0_4_ + fVar128;
                        auVar146._4_4_ =
                             (pfVar53[1] - auVar93._4_4_ * fVar157) * in_XMM1._4_4_ + fVar157;
                        auVar146._8_4_ =
                             (pfVar53[2] - auVar93._8_4_ * fVar159) * in_XMM1._8_4_ + fVar159;
                        auVar146._12_4_ =
                             (pfVar53[3] - auVar93._12_4_ * fVar161) * in_XMM1._12_4_ + fVar161;
                        *(undefined1 (*) [16])((long)pvVar60 + lVar62) = auVar146;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar64 == uVar5 && uVar65 == uVar4) & uVar66 != 1 & (byte)local_68) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar66,uVar4,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar5) {
              uVar50 = 0;
              do {
                if (0 < (int)uVar4) {
                  sVar55 = pMVar6->cstep;
                  sVar7 = pMVar6->elemsize;
                  pvVar8 = pMVar6->data;
                  pauVar59 = (undefined1 (*) [16])
                             (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                  pfVar53 = (float *)(pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize +
                                     (long)pMVar6[1].data);
                  uVar51 = 0;
                  do {
                    if (0 < (int)uVar66) {
                      auVar93 = *(undefined1 (*) [16])
                                 ((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                      in_XMM3 = rcpps(in_XMM3,auVar93);
                      fVar128 = in_XMM3._0_4_;
                      fVar157 = in_XMM3._4_4_;
                      fVar159 = in_XMM3._8_4_;
                      fVar161 = in_XMM3._12_4_;
                      uVar67 = uVar66;
                      do {
                        auVar151._0_4_ =
                             *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128);
                        auVar151._4_4_ =
                             pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
                        auVar151._8_4_ =
                             pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
                        auVar151._12_4_ =
                             pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
                        *pauVar59 = auVar151;
                        pfVar53 = pfVar53 + 4;
                        pauVar59 = pauVar59 + 1;
                        uVar67 = uVar67 - 1;
                      } while (uVar67 != 0);
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 != uVar4);
                }
                uVar50 = uVar50 + 1;
              } while (uVar50 != uVar49);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((byte)local_60 & uVar64 == uVar5 & (uVar65 != 1 && uVar66 == uVar67)) == 1) {
          local_d8 = opt;
          Mat::create(this_00,uVar67,uVar65,uVar5,local_70,iVar56,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)local_d0) {
              local_e0 = (float *)0x0;
              do {
                bVar71 = pMVar6->dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6->d;
                }
                local_8c = pMVar6->w;
                local_88 = pMVar6->h;
                local_90 = bVar71 ^ 3;
                local_d8 = (Option *)pMVar6->cstep;
                pvVar8 = pMVar6->data;
                local_c8 = (void *)pMVar6->elemsize;
                local_b8 = (undefined1  [8])
                           ((long)local_d8 * (long)local_e0 * (long)local_c8 + (long)pvVar8);
                local_a0 = pMVar6->elempack;
                local_98 = pMVar6->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_a8 = (size_t)local_c8;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = pMVar6[1].dims == 3;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = pMVar6[1].d;
                }
                local_8c = pMVar6[1].w;
                local_88 = pMVar6[1].h;
                local_a8 = pMVar6[1].elemsize;
                pvVar60 = (void *)(pMVar6[1].cstep * (long)local_e0 * local_a8 +
                                  (long)pMVar6[1].data);
                local_90 = bVar71 ^ 3;
                local_a0 = pMVar6[1].elempack;
                local_98 = pMVar6[1].allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar60;
                Mat::~Mat((Mat *)local_b8);
                bVar71 = this_00->dims == 3;
                local_8c = this_00->w;
                local_88 = this_00->h;
                local_80 = 1;
                if (!bVar71) {
                  local_80 = this_00->d;
                }
                local_a8 = this_00->elemsize;
                pvVar63 = (void *)(this_00->cstep * (long)local_e0 * local_a8 + (long)this_00->data)
                ;
                local_90 = bVar71 ^ 3;
                local_a0 = this_00->elempack;
                local_98 = this_00->allocator;
                uStack_b0 = (int *)0x0;
                local_78 = (long)local_88 * (long)local_8c;
                local_84 = 1;
                local_b8 = (undefined1  [8])pvVar63;
                Mat::~Mat((Mat *)local_b8);
                if (0 < (int)uVar65) {
                  uVar66 = 0;
                  do {
                    if (0 < (int)uVar67) {
                      lVar62 = 0;
                      do {
                        auVar93 = *(undefined1 (*) [16])
                                   ((long)pvVar8 +
                                   lVar62 + (long)local_d8 * (long)local_c8 * (long)local_e0);
                        in_XMM1 = rcpps(in_XMM1,auVar93);
                        pfVar53 = (float *)((long)pvVar60 + lVar62);
                        fVar128 = *pfVar53 * in_XMM1._0_4_;
                        fVar157 = pfVar53[1] * in_XMM1._4_4_;
                        fVar159 = pfVar53[2] * in_XMM1._8_4_;
                        fVar161 = pfVar53[3] * in_XMM1._12_4_;
                        auVar154._0_4_ =
                             (*pfVar53 - auVar93._0_4_ * fVar128) * in_XMM1._0_4_ + fVar128;
                        auVar154._4_4_ =
                             (pfVar53[1] - auVar93._4_4_ * fVar157) * in_XMM1._4_4_ + fVar157;
                        auVar154._8_4_ =
                             (pfVar53[2] - auVar93._8_4_ * fVar159) * in_XMM1._8_4_ + fVar159;
                        auVar154._12_4_ =
                             (pfVar53[3] - auVar93._12_4_ * fVar161) * in_XMM1._12_4_ + fVar161;
                        *(undefined1 (*) [16])((long)pvVar63 + lVar62) = auVar154;
                        lVar62 = lVar62 + 0x10;
                      } while (uVar51 << 4 != lVar62);
                      pvVar63 = (void *)((long)pvVar63 + lVar62);
                      pvVar60 = (void *)((long)pvVar60 + lVar62);
                    }
                    uVar66 = uVar66 + 1;
                  } while (uVar66 != uVar65);
                }
                local_e0 = (float *)((long)local_e0 + 1);
              } while (local_e0 != (float *)local_d0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              bVar71 = pMVar6->dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6->d;
              }
              local_8c = pMVar6->w;
              local_88 = pMVar6->h;
              local_90 = bVar71 ^ 3;
              local_e0 = (float *)pMVar6->cstep;
              pvVar8 = pMVar6->data;
              local_d8 = (Option *)pMVar6->elemsize;
              local_b8 = (undefined1  [8])((long)local_e0 * uVar50 * (long)local_d8 + (long)pvVar8);
              local_a0 = pMVar6->elempack;
              local_98 = pMVar6->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = (size_t)local_d8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = pMVar6[1].dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6[1].d;
              }
              local_8c = pMVar6[1].w;
              local_88 = pMVar6[1].h;
              local_90 = bVar71 ^ 3;
              local_c0 = pMVar6[1].cstep;
              pvVar60 = pMVar6[1].data;
              local_a8 = pMVar6[1].elemsize;
              local_b8 = (undefined1  [8])(local_c0 * uVar50 * local_a8 + (long)pvVar60);
              local_a0 = pMVar6[1].elempack;
              local_98 = pMVar6[1].allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_70 = local_a8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = this_00->dims == 3;
              local_8c = this_00->w;
              local_88 = this_00->h;
              local_80 = 1;
              if (!bVar71) {
                local_80 = this_00->d;
              }
              local_90 = bVar71 ^ 3;
              sVar55 = this_00->cstep;
              pvVar63 = this_00->data;
              sVar7 = this_00->elemsize;
              local_b8 = (undefined1  [8])(sVar55 * uVar50 * sVar7 + (long)pvVar63);
              local_a0 = this_00->elempack;
              local_98 = this_00->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = sVar7;
              Mat::~Mat((Mat *)local_b8);
              if (0 < (int)local_c8) {
                lVar62 = 0;
                iVar48 = (int)local_c8;
                do {
                  auVar93 = *(undefined1 (*) [16])
                             ((long)pvVar8 + lVar62 + (long)local_e0 * (long)local_d8 * uVar50);
                  in_XMM1 = rcpps(in_XMM1,auVar93);
                  pfVar53 = (float *)((long)pvVar60 + lVar62 + local_c0 * local_70 * uVar50);
                  fVar128 = *pfVar53 * in_XMM1._0_4_;
                  fVar157 = pfVar53[1] * in_XMM1._4_4_;
                  fVar159 = pfVar53[2] * in_XMM1._8_4_;
                  fVar161 = pfVar53[3] * in_XMM1._12_4_;
                  auVar155._0_4_ = (*pfVar53 - auVar93._0_4_ * fVar128) * in_XMM1._0_4_ + fVar128;
                  auVar155._4_4_ = (pfVar53[1] - auVar93._4_4_ * fVar157) * in_XMM1._4_4_ + fVar157;
                  auVar155._8_4_ = (pfVar53[2] - auVar93._8_4_ * fVar159) * in_XMM1._8_4_ + fVar159;
                  auVar155._12_4_ =
                       (pfVar53[3] - auVar93._12_4_ * fVar161) * in_XMM1._12_4_ + fVar161;
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 + sVar55 * sVar7 * uVar50) =
                       auVar155;
                  lVar62 = lVar62 + 0x10;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    else {
      local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
      local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
      if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) goto LAB_002347dc;
    }
    Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (0 < (int)uVar64) {
        uVar51 = 0;
        do {
          if (0 < (int)local_e0) {
            sVar55 = pMVar6[1].cstep;
            auVar93 = *(undefined1 (*) [16])
                       ((long)pMVar6->data + pMVar6->cstep * uVar51 * pMVar6->elemsize);
            in_XMM3 = rcpps(in_XMM3,auVar93);
            fVar128 = in_XMM3._0_4_;
            fVar157 = in_XMM3._4_4_;
            fVar159 = in_XMM3._8_4_;
            fVar161 = in_XMM3._12_4_;
            sVar7 = this_00->cstep;
            sVar9 = this_00->elemsize;
            pvVar8 = this_00->data;
            sVar10 = pMVar6[1].elemsize;
            pvVar60 = pMVar6[1].data;
            lVar62 = 0;
            iVar48 = (int)local_e0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar55 * sVar10 * uVar51);
              auVar145._0_4_ = *pfVar53 * ((1.0 - auVar93._0_4_ * fVar128) * fVar128 + fVar128);
              auVar145._4_4_ = pfVar53[1] * ((1.0 - auVar93._4_4_ * fVar157) * fVar157 + fVar157);
              auVar145._8_4_ = pfVar53[2] * ((1.0 - auVar93._8_4_ * fVar159) * fVar159 + fVar159);
              auVar145._12_4_ = pfVar53[3] * ((1.0 - auVar93._12_4_ * fVar161) * fVar161 + fVar161);
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar7 * sVar9 * uVar51) = auVar145;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar50);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  uVar67 = pMVar6->w;
  uVar51 = (ulong)uVar67;
  sVar55 = pMVar6->elemsize;
  uVar66 = pMVar6[1].w;
  uVar65 = pMVar6[1].h;
  uVar64 = pMVar6[1].c;
  uVar50 = (ulong)uVar64;
  local_e0 = (float *)CONCAT44(local_e0._4_4_,uVar65 * uVar66);
  local_70 = pMVar6[1].elemsize;
  iVar3 = pMVar6->dims;
  if (iVar3 == 1) {
    iVar3 = pMVar6[1].dims;
    if (iVar48 != 1 || uVar67 != 1) {
      if (iVar3 == 1) {
        Mat::create(this_00,uVar67,sVar55,iVar48,opt->blob_allocator);
        pvVar8 = this_00->data;
        if (pvVar8 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (iVar56 != 1 || pMVar6[1].w != 1) {
          if (0 < (int)uVar67) {
            pvVar60 = pMVar6->data;
            pvVar63 = pMVar6[1].data;
            lVar62 = 0;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62);
              fVar128 = pfVar53[1];
              fVar157 = pfVar53[2];
              fVar159 = pfVar53[3];
              pfVar52 = (float *)((long)pvVar63 + lVar62);
              fVar161 = pfVar52[1];
              fVar156 = pfVar52[2];
              fVar158 = pfVar52[3];
              pfVar1 = (float *)((long)pvVar8 + lVar62);
              *pfVar1 = *pfVar52 + *pfVar53;
              pfVar1[1] = fVar161 + fVar128;
              pfVar1[2] = fVar156 + fVar157;
              pfVar1[3] = fVar158 + fVar159;
              lVar62 = lVar62 + 0x10;
              uVar67 = (int)uVar51 - 1;
              uVar51 = (ulong)uVar67;
            } while (uVar67 != 0);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar67) {
          fVar128 = *pMVar6[1].data;
          pvVar60 = pMVar6->data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar60 + lVar62);
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pfVar52 = (float *)((long)pvVar8 + lVar62);
            *pfVar52 = *pfVar53 + fVar128;
            pfVar52[1] = fVar157 + fVar128;
            pfVar52[2] = fVar159 + fVar128;
            pfVar52[3] = fVar161 + fVar128;
            lVar62 = lVar62 + 0x10;
            uVar67 = (int)uVar51 - 1;
            uVar51 = (ulong)uVar67;
          } while (uVar67 != 0);
          return 0;
        }
        return 0;
      }
      if (iVar3 == 2) {
        Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
        pauVar59 = (undefined1 (*) [16])this_00->data;
        if (pauVar59 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar65) {
            pfVar53 = (float *)pMVar6->data;
            pfVar52 = (float *)pMVar6[1].data;
            uVar67 = 0;
            do {
              if (0 < (int)uVar66) {
                fVar128 = *pfVar53;
                fVar157 = pfVar53[1];
                fVar159 = pfVar53[2];
                fVar161 = pfVar53[3];
                uVar64 = uVar66;
                do {
                  auVar96._0_4_ = *pfVar52 + fVar128;
                  auVar96._4_4_ = pfVar52[1] + fVar157;
                  auVar96._8_4_ = pfVar52[2] + fVar159;
                  auVar96._12_4_ = pfVar52[3] + fVar161;
                  *pauVar59 = auVar96;
                  pfVar52 = pfVar52 + 4;
                  pauVar59 = pauVar59 + 1;
                  uVar64 = uVar64 - 1;
                } while (uVar64 != 0);
              }
              pfVar53 = pfVar53 + 4;
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar65);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar3 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
      if (this_00->data != (void *)0x0) {
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)local_e0) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pfVar53 = (float *)((long)pMVar6->data + uVar51 * 0x10);
              fVar128 = *pfVar53;
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pvVar8 = this_00->data;
              sVar9 = pMVar6[1].cstep;
              sVar10 = pMVar6[1].elemsize;
              pvVar60 = pMVar6[1].data;
              lVar62 = 0;
              iVar48 = (int)local_e0;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
                auVar85._0_4_ = *pfVar53 + fVar128;
                auVar85._4_4_ = pfVar53[1] + fVar157;
                auVar85._8_4_ = pfVar53[2] + fVar159;
                auVar85._12_4_ = pfVar53[3] + fVar161;
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar85;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 == 1) {
      Mat::create(this_00,uVar66,local_70,iVar56,opt->blob_allocator);
      pvVar8 = this_00->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar66) {
          fVar128 = *pMVar6->data;
          pvVar60 = pMVar6[1].data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar60 + lVar62);
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pfVar52 = (float *)((long)pvVar8 + lVar62);
            *pfVar52 = *pfVar53 + fVar128;
            pfVar52[1] = fVar157 + fVar128;
            pfVar52[2] = fVar159 + fVar128;
            pfVar52[3] = fVar161 + fVar128;
            lVar62 = lVar62 + 0x10;
            uVar66 = uVar66 - 1;
          } while (uVar66 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 == 2) {
      Mat::create(this_00,uVar66,uVar65,local_70,iVar56,opt->blob_allocator);
      pvVar8 = this_00->data;
      if (pvVar8 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_e0) {
          fVar128 = *pMVar6->data;
          pvVar60 = pMVar6[1].data;
          lVar62 = 0;
          do {
            pfVar53 = (float *)((long)pvVar60 + lVar62);
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pfVar52 = (float *)((long)pvVar8 + lVar62);
            *pfVar52 = *pfVar53 + fVar128;
            pfVar52[1] = fVar157 + fVar128;
            pfVar52[2] = fVar159 + fVar128;
            pfVar52[3] = fVar161 + fVar128;
            lVar62 = lVar62 + 0x10;
            local_e0._0_4_ = (int)local_e0 + -1;
          } while ((int)local_e0 != 0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar3 != 3) {
      return 0;
    }
    Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (0 < (int)uVar64) {
      fVar128 = *pMVar6->data;
      uVar51 = 0;
      do {
        if (0 < (int)local_e0) {
          sVar55 = this_00->cstep;
          sVar7 = this_00->elemsize;
          pvVar8 = this_00->data;
          sVar9 = pMVar6[1].cstep;
          sVar10 = pMVar6[1].elemsize;
          pvVar60 = pMVar6[1].data;
          lVar62 = 0;
          iVar48 = (int)local_e0;
          do {
            pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
            auVar81._0_4_ = *pfVar53 + fVar128;
            auVar81._4_4_ = pfVar53[1] + fVar128;
            auVar81._8_4_ = pfVar53[2] + fVar128;
            auVar81._12_4_ = pfVar53[3] + fVar128;
            *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar81;
            lVar62 = lVar62 + 0x10;
            iVar48 = iVar48 + -1;
          } while (iVar48 != 0);
        }
        uVar51 = uVar51 + 1;
      } while (uVar51 != uVar50);
      return 0;
    }
    return 0;
  }
  uVar4 = pMVar6->h;
  local_c8 = (void *)CONCAT44(local_c8._4_4_,uVar4 * uVar67);
  local_d8 = (Option *)uVar50;
  if (iVar3 == 2) {
    if (pMVar6[1].dims == 3) {
      Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar64) {
          uVar51 = 0;
          do {
            if (0 < (int)uVar65) {
              pauVar59 = (undefined1 (*) [16])
                         (this_00->cstep * uVar51 * this_00->elemsize + (long)this_00->data);
              pfVar53 = (float *)(pMVar6[1].cstep * uVar51 * pMVar6[1].elemsize +
                                 (long)pMVar6[1].data);
              pfVar52 = (float *)((long)pMVar6->w * uVar51 * pMVar6->elemsize + (long)pMVar6->data);
              uVar67 = 0;
              do {
                if (0 < (int)uVar66) {
                  fVar128 = *pfVar52;
                  fVar157 = pfVar52[1];
                  fVar159 = pfVar52[2];
                  fVar161 = pfVar52[3];
                  uVar64 = uVar66;
                  do {
                    auVar79._0_4_ = *pfVar53 + fVar128;
                    auVar79._4_4_ = pfVar53[1] + fVar157;
                    auVar79._8_4_ = pfVar53[2] + fVar159;
                    auVar79._12_4_ = pfVar53[3] + fVar161;
                    *pauVar59 = auVar79;
                    pfVar53 = pfVar53 + 4;
                    pauVar59 = pauVar59 + 1;
                    uVar64 = uVar64 - 1;
                  } while (uVar64 != 0);
                }
                pfVar52 = pfVar52 + 4;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar65);
            }
            uVar51 = uVar51 + 1;
          } while (uVar51 != uVar50);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_e0 = (float *)CONCAT44(local_e0._4_4_,iVar56);
    Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
    pvVar8 = this_00->data;
    if (pvVar8 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar6[1].dims != 1) {
      if (pMVar6[1].dims != 2) {
        return 0;
      }
      if (0 < (int)local_c8) {
        pvVar60 = pMVar6->data;
        pvVar63 = pMVar6[1].data;
        lVar62 = 0;
        do {
          pfVar53 = (float *)((long)pvVar60 + lVar62);
          fVar128 = pfVar53[1];
          fVar157 = pfVar53[2];
          fVar159 = pfVar53[3];
          pfVar52 = (float *)((long)pvVar63 + lVar62);
          fVar161 = pfVar52[1];
          fVar156 = pfVar52[2];
          fVar158 = pfVar52[3];
          pfVar1 = (float *)((long)pvVar8 + lVar62);
          *pfVar1 = *pfVar52 + *pfVar53;
          pfVar1[1] = fVar161 + fVar128;
          pfVar1[2] = fVar156 + fVar157;
          pfVar1[3] = fVar158 + fVar159;
          lVar62 = lVar62 + 0x10;
          local_c8._0_4_ = (int)local_c8 + -1;
        } while ((int)local_c8 != 0);
        return 0;
      }
      return 0;
    }
    Mat::create(this_00,uVar67,uVar4,sVar55,iVar48,opt->blob_allocator);
    pauVar59 = (undefined1 (*) [16])this_00->data;
    if (pauVar59 == (undefined1 (*) [16])0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if ((int)local_e0 != 1 || pMVar6[1].w != 1) {
        if (0 < (int)uVar4) {
          pfVar53 = (float *)pMVar6->data;
          pfVar52 = (float *)pMVar6[1].data;
          uVar66 = 0;
          do {
            if (0 < (int)uVar67) {
              fVar128 = *pfVar52;
              fVar157 = pfVar52[1];
              fVar159 = pfVar52[2];
              fVar161 = pfVar52[3];
              uVar50 = uVar51;
              do {
                auVar120._0_4_ = *pfVar53 + fVar128;
                auVar120._4_4_ = pfVar53[1] + fVar157;
                auVar120._8_4_ = pfVar53[2] + fVar159;
                auVar120._12_4_ = pfVar53[3] + fVar161;
                *pauVar59 = auVar120;
                pfVar53 = pfVar53 + 4;
                pauVar59 = pauVar59 + 1;
                uVar65 = (int)uVar50 - 1;
                uVar50 = (ulong)uVar65;
              } while (uVar65 != 0);
            }
            pfVar52 = pfVar52 + 4;
            uVar66 = uVar66 + 1;
          } while (uVar66 != uVar4);
          return 0;
        }
        return 0;
      }
      if (0 < (int)local_c8) {
        fVar128 = *pMVar6[1].data;
        pvVar8 = pMVar6->data;
        lVar62 = 0;
        do {
          pfVar53 = (float *)((long)pvVar8 + lVar62);
          fVar157 = pfVar53[1];
          fVar159 = pfVar53[2];
          fVar161 = pfVar53[3];
          pfVar52 = (float *)((long)*pauVar59 + lVar62);
          *pfVar52 = *pfVar53 + fVar128;
          pfVar52[1] = fVar157 + fVar128;
          pfVar52[2] = fVar159 + fVar128;
          pfVar52[3] = fVar161 + fVar128;
          lVar62 = lVar62 + 0x10;
          local_c8._0_4_ = (int)local_c8 + -1;
        } while ((int)local_c8 != 0);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  if (iVar3 != 3) {
    return 0;
  }
  uVar5 = pMVar6->c;
  uVar49 = (ulong)uVar5;
  local_c0 = sVar55;
  if (pMVar6[1].dims != 3) {
    Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar6[1].dims == 1) {
      if (iVar56 != 1 || pMVar6[1].w != 1) {
        if (0 < (int)uVar5) {
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pfVar53 = (float *)((long)pMVar6[1].data + uVar50 * 0x10);
              fVar128 = *pfVar53;
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              pvVar8 = this_00->data;
              sVar9 = pMVar6->cstep;
              sVar10 = pMVar6->elemsize;
              pvVar60 = pMVar6->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
                auVar111._0_4_ = *pfVar53 + fVar128;
                auVar111._4_4_ = pfVar53[1] + fVar157;
                auVar111._8_4_ = pfVar53[2] + fVar159;
                auVar111._12_4_ = pfVar53[3] + fVar161;
                *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar111;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar49);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar5) {
        fVar128 = *pMVar6[1].data;
        uVar50 = 0;
        do {
          if (0 < (int)local_c8) {
            sVar55 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar8 = this_00->data;
            sVar9 = pMVar6->cstep;
            sVar10 = pMVar6->elemsize;
            pvVar60 = pMVar6->data;
            lVar62 = 0;
            iVar48 = (int)local_c8;
            do {
              pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50);
              auVar102._0_4_ = *pfVar53 + fVar128;
              auVar102._4_4_ = pfVar53[1] + fVar128;
              auVar102._8_4_ = pfVar53[2] + fVar128;
              auVar102._12_4_ = pfVar53[3] + fVar128;
              *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50) = auVar102;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar49);
        return 0;
      }
      return 0;
    }
    if (pMVar6[1].dims != 2) {
      return 0;
    }
    if (0 < (int)uVar5) {
      uVar50 = 0;
      do {
        if (0 < (int)uVar4) {
          pauVar59 = (undefined1 (*) [16])
                     (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
          pfVar53 = (float *)((long)pMVar6[1].w * uVar50 * pMVar6[1].elemsize + (long)pMVar6[1].data
                             );
          pfVar52 = (float *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
          uVar66 = 0;
          do {
            if (0 < (int)uVar67) {
              fVar128 = *pfVar53;
              fVar157 = pfVar53[1];
              fVar159 = pfVar53[2];
              fVar161 = pfVar53[3];
              uVar68 = uVar51;
              do {
                auVar86._0_4_ = *pfVar52 + fVar128;
                auVar86._4_4_ = pfVar52[1] + fVar157;
                auVar86._8_4_ = pfVar52[2] + fVar159;
                auVar86._12_4_ = pfVar52[3] + fVar161;
                *pauVar59 = auVar86;
                pfVar52 = pfVar52 + 4;
                pauVar59 = pauVar59 + 1;
                uVar65 = (int)uVar68 - 1;
                uVar68 = (ulong)uVar65;
              } while (uVar65 != 0);
            }
            pfVar53 = pfVar53 + 4;
            uVar66 = uVar66 + 1;
          } while (uVar66 != uVar4);
        }
        uVar50 = uVar50 + 1;
      } while (uVar50 != uVar49);
      return 0;
    }
    return 0;
  }
  if (uVar5 == uVar64 && ((uVar66 ^ 1) == 0 && (uVar65 ^ 1) == 0)) {
    Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
    if (this_00->data == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep != 0) {
      if (0 < (int)uVar5) {
        uVar50 = 0;
        do {
          if (0 < (int)local_c8) {
            sVar55 = pMVar6->cstep;
            sVar7 = pMVar6->elemsize;
            pfVar53 = (float *)((long)pMVar6[1].data + pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize
                               );
            fVar128 = *pfVar53;
            fVar157 = pfVar53[1];
            fVar159 = pfVar53[2];
            fVar161 = pfVar53[3];
            pvVar8 = pMVar6->data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            pvVar60 = this_00->data;
            lVar62 = 0;
            iVar48 = (int)local_c8;
            do {
              pfVar53 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
              auVar72._0_4_ = *pfVar53 + fVar128;
              auVar72._4_4_ = pfVar53[1] + fVar157;
              auVar72._8_4_ = pfVar53[2] + fVar159;
              auVar72._12_4_ = pfVar53[3] + fVar161;
              *(undefined1 (*) [16])((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar50) = auVar72;
              lVar62 = lVar62 + 0x10;
              iVar48 = iVar48 + -1;
            } while (iVar48 != 0);
          }
          uVar50 = uVar50 + 1;
        } while (uVar50 != uVar49);
        return 0;
      }
      return 0;
    }
    return -100;
  }
  local_d0 = uVar49;
  if (uVar66 == uVar67) {
    if (iVar56 == 1 && (uVar64 == 1 && uVar65 == uVar4)) {
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_d0) {
          uVar50 = 0;
          do {
            if (0 < (int)local_c8) {
              sVar55 = pMVar6->cstep;
              sVar7 = pMVar6->elemsize;
              sVar9 = this_00->cstep;
              pvVar8 = pMVar6->data;
              pvVar60 = pMVar6[1].data;
              sVar10 = this_00->elemsize;
              pvVar63 = this_00->data;
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                pfVar53 = (float *)((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar50);
                fVar128 = *(float *)((long)pvVar60 + lVar62);
                auVar91._0_4_ = fVar128 + *pfVar53;
                auVar91._4_4_ = fVar128 + pfVar53[1];
                auVar91._8_4_ = fVar128 + pfVar53[2];
                auVar91._12_4_ = fVar128 + pfVar53[3];
                *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar50) =
                     auVar91;
                lVar62 = lVar62 + 4;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_d0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
    local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
    if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) {
      if (((iVar48 == 1) && (uVar65 == uVar4)) && (uVar5 == 1)) {
        Mat::create(this_00,uVar67,uVar4,uVar64,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar64) {
            uVar51 = 0;
            do {
              if (0 < (int)local_e0) {
                sVar55 = pMVar6[1].cstep;
                sVar7 = pMVar6[1].elemsize;
                sVar9 = this_00->cstep;
                pvVar8 = pMVar6[1].data;
                pvVar60 = pMVar6->data;
                sVar10 = this_00->elemsize;
                pvVar63 = this_00->data;
                lVar62 = 0;
                iVar48 = (int)local_e0;
                do {
                  fVar128 = *(float *)((long)pvVar60 + lVar62);
                  pfVar53 = (float *)((long)pvVar8 + lVar62 * 4 + sVar55 * sVar7 * uVar51);
                  auVar115._0_4_ = *pfVar53 + fVar128;
                  auVar115._4_4_ = pfVar53[1] + fVar128;
                  auVar115._8_4_ = pfVar53[2] + fVar128;
                  auVar115._12_4_ = pfVar53[3] + fVar128;
                  *(undefined1 (*) [16])((long)pvVar63 + lVar62 * 4 + sVar9 * sVar10 * uVar51) =
                       auVar115;
                  lVar62 = lVar62 + 4;
                  iVar48 = iVar48 + -1;
                } while (iVar48 != 0);
              }
              uVar51 = uVar51 + 1;
            } while (uVar51 != uVar50);
            return 0;
          }
          return 0;
        }
        return -100;
      }
LAB_00233bd2:
      if ((((uVar66 ^ 1) == 0 && uVar65 == uVar4) && uVar5 == uVar64) && uVar67 != 1) {
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              if (0 < (int)uVar4) {
                sVar55 = pMVar6[1].cstep;
                sVar7 = pMVar6[1].elemsize;
                pvVar8 = pMVar6[1].data;
                pauVar59 = (undefined1 (*) [16])
                           (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                pfVar53 = (float *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
                uVar51 = 0;
                do {
                  if (0 < (int)uVar67) {
                    pfVar52 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                    fVar128 = *pfVar52;
                    fVar157 = pfVar52[1];
                    fVar159 = pfVar52[2];
                    fVar161 = pfVar52[3];
                    uVar66 = uVar67;
                    do {
                      auVar98._0_4_ = *pfVar53 + fVar128;
                      auVar98._4_4_ = pfVar53[1] + fVar157;
                      auVar98._8_4_ = pfVar53[2] + fVar159;
                      auVar98._12_4_ = pfVar53[3] + fVar161;
                      *pauVar59 = auVar98;
                      pfVar53 = pfVar53 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar66 = uVar66 - 1;
                    } while (uVar66 != 0);
                  }
                  uVar51 = uVar51 + 1;
                } while (uVar51 != uVar4);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar66 == uVar67 && (uVar65 ^ 1) == 0) && uVar5 == uVar64) && uVar4 != 1) {
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            uVar50 = 0;
            do {
              if (0 < (int)uVar4) {
                sVar55 = pMVar6[1].elemsize;
                pvVar60 = (void *)(this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data
                                  );
                pvVar63 = (void *)(pMVar6->cstep * uVar50 * pMVar6->elemsize + (long)pMVar6->data);
                sVar7 = pMVar6[1].cstep;
                pvVar8 = pMVar6[1].data;
                uVar66 = 0;
                do {
                  if (0 < (int)uVar67) {
                    lVar62 = 0;
                    do {
                      pfVar53 = (float *)((long)pvVar63 + lVar62);
                      pfVar52 = (float *)((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar50);
                      auVar109._0_4_ = *pfVar52 + *pfVar53;
                      auVar109._4_4_ = pfVar52[1] + pfVar53[1];
                      auVar109._8_4_ = pfVar52[2] + pfVar53[2];
                      auVar109._12_4_ = pfVar52[3] + pfVar53[3];
                      *(undefined1 (*) [16])((long)pvVar60 + lVar62) = auVar109;
                      lVar62 = lVar62 + 0x10;
                    } while (uVar51 << 4 != lVar62);
                    pvVar60 = (void *)((long)pvVar60 + lVar62);
                    pvVar63 = (void *)((long)pvVar63 + lVar62);
                  }
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar4);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar64 == uVar5 && uVar65 == uVar4) & uVar66 != 1 & (byte)local_68) == 1) {
        local_d8 = opt;
        Mat::create(this_00,uVar66,uVar4,uVar5,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar5) {
            uVar50 = 0;
            do {
              if (0 < (int)uVar4) {
                sVar55 = pMVar6->cstep;
                sVar7 = pMVar6->elemsize;
                pvVar8 = pMVar6->data;
                pauVar59 = (undefined1 (*) [16])
                           (this_00->cstep * uVar50 * this_00->elemsize + (long)this_00->data);
                pfVar53 = (float *)(pMVar6[1].cstep * uVar50 * pMVar6[1].elemsize +
                                   (long)pMVar6[1].data);
                uVar51 = 0;
                do {
                  if (0 < (int)uVar66) {
                    pfVar52 = (float *)((long)pvVar8 + uVar51 * 0x10 + sVar55 * uVar50 * sVar7);
                    fVar128 = *pfVar52;
                    fVar157 = pfVar52[1];
                    fVar159 = pfVar52[2];
                    fVar161 = pfVar52[3];
                    uVar67 = uVar66;
                    do {
                      auVar118._0_4_ = *pfVar53 + fVar128;
                      auVar118._4_4_ = pfVar53[1] + fVar157;
                      auVar118._8_4_ = pfVar53[2] + fVar159;
                      auVar118._12_4_ = pfVar53[3] + fVar161;
                      *pauVar59 = auVar118;
                      pfVar53 = pfVar53 + 4;
                      pauVar59 = pauVar59 + 1;
                      uVar67 = uVar67 - 1;
                    } while (uVar67 != 0);
                  }
                  uVar51 = uVar51 + 1;
                } while (uVar51 != uVar4);
              }
              uVar50 = uVar50 + 1;
            } while (uVar50 != uVar49);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((byte)local_60 & uVar64 == uVar5 & (uVar65 != 1 && uVar66 == uVar67)) == 1) {
        local_d8 = opt;
        Mat::create(this_00,uVar67,uVar65,uVar5,local_70,iVar56,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)local_d0) {
            local_e0 = (float *)0x0;
            do {
              bVar71 = pMVar6->dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6->d;
              }
              local_8c = pMVar6->w;
              local_88 = pMVar6->h;
              local_90 = bVar71 ^ 3;
              local_d8 = (Option *)pMVar6->cstep;
              pvVar8 = pMVar6->data;
              local_c8 = (void *)pMVar6->elemsize;
              local_b8 = (undefined1  [8])
                         ((long)local_d8 * (long)local_e0 * (long)local_c8 + (long)pvVar8);
              local_a0 = pMVar6->elempack;
              local_98 = pMVar6->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_a8 = (size_t)local_c8;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = pMVar6[1].dims == 3;
              local_80 = 1;
              if (!bVar71) {
                local_80 = pMVar6[1].d;
              }
              local_8c = pMVar6[1].w;
              local_88 = pMVar6[1].h;
              local_a8 = pMVar6[1].elemsize;
              pvVar60 = (void *)(pMVar6[1].cstep * (long)local_e0 * local_a8 + (long)pMVar6[1].data)
              ;
              local_90 = bVar71 ^ 3;
              local_a0 = pMVar6[1].elempack;
              local_98 = pMVar6[1].allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_b8 = (undefined1  [8])pvVar60;
              Mat::~Mat((Mat *)local_b8);
              bVar71 = this_00->dims == 3;
              local_8c = this_00->w;
              local_88 = this_00->h;
              local_80 = 1;
              if (!bVar71) {
                local_80 = this_00->d;
              }
              local_a8 = this_00->elemsize;
              pvVar63 = (void *)(this_00->cstep * (long)local_e0 * local_a8 + (long)this_00->data);
              local_90 = bVar71 ^ 3;
              local_a0 = this_00->elempack;
              local_98 = this_00->allocator;
              uStack_b0 = (int *)0x0;
              local_78 = (long)local_88 * (long)local_8c;
              local_84 = 1;
              local_b8 = (undefined1  [8])pvVar63;
              Mat::~Mat((Mat *)local_b8);
              if (0 < (int)uVar65) {
                uVar66 = 0;
                do {
                  if (0 < (int)uVar67) {
                    lVar62 = 0;
                    do {
                      pfVar53 = (float *)((long)pvVar8 +
                                         lVar62 + (long)local_d8 * (long)local_c8 * (long)local_e0);
                      pfVar52 = (float *)((long)pvVar60 + lVar62);
                      auVar124._0_4_ = *pfVar52 + *pfVar53;
                      auVar124._4_4_ = pfVar52[1] + pfVar53[1];
                      auVar124._8_4_ = pfVar52[2] + pfVar53[2];
                      auVar124._12_4_ = pfVar52[3] + pfVar53[3];
                      *(undefined1 (*) [16])((long)pvVar63 + lVar62) = auVar124;
                      lVar62 = lVar62 + 0x10;
                    } while (uVar51 << 4 != lVar62);
                    pvVar63 = (void *)((long)pvVar63 + lVar62);
                    pvVar60 = (void *)((long)pvVar60 + lVar62);
                  }
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar65);
              }
              local_e0 = (float *)((long)local_e0 + 1);
            } while (local_e0 != (float *)local_d0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_d8 = opt;
      Mat::create(this_00,uVar67,uVar4,uVar5,sVar55,iVar48,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)local_d0) {
          uVar50 = 0;
          do {
            bVar71 = pMVar6->dims == 3;
            local_80 = 1;
            if (!bVar71) {
              local_80 = pMVar6->d;
            }
            local_8c = pMVar6->w;
            local_88 = pMVar6->h;
            local_90 = bVar71 ^ 3;
            local_e0 = (float *)pMVar6->cstep;
            pvVar8 = pMVar6->data;
            local_d8 = (Option *)pMVar6->elemsize;
            local_b8 = (undefined1  [8])((long)local_e0 * uVar50 * (long)local_d8 + (long)pvVar8);
            local_a0 = pMVar6->elempack;
            local_98 = pMVar6->allocator;
            uStack_b0 = (int *)0x0;
            local_78 = (long)local_88 * (long)local_8c;
            local_84 = 1;
            local_a8 = (size_t)local_d8;
            Mat::~Mat((Mat *)local_b8);
            bVar71 = pMVar6[1].dims == 3;
            local_80 = 1;
            if (!bVar71) {
              local_80 = pMVar6[1].d;
            }
            local_8c = pMVar6[1].w;
            local_88 = pMVar6[1].h;
            local_90 = bVar71 ^ 3;
            local_c0 = pMVar6[1].cstep;
            pvVar60 = pMVar6[1].data;
            local_a8 = pMVar6[1].elemsize;
            local_b8 = (undefined1  [8])(local_c0 * uVar50 * local_a8 + (long)pvVar60);
            local_a0 = pMVar6[1].elempack;
            local_98 = pMVar6[1].allocator;
            uStack_b0 = (int *)0x0;
            local_78 = (long)local_88 * (long)local_8c;
            local_84 = 1;
            local_70 = local_a8;
            Mat::~Mat((Mat *)local_b8);
            bVar71 = this_00->dims == 3;
            local_8c = this_00->w;
            local_88 = this_00->h;
            local_80 = 1;
            if (!bVar71) {
              local_80 = this_00->d;
            }
            local_90 = bVar71 ^ 3;
            sVar55 = this_00->cstep;
            pvVar63 = this_00->data;
            sVar7 = this_00->elemsize;
            local_b8 = (undefined1  [8])(sVar55 * uVar50 * sVar7 + (long)pvVar63);
            local_a0 = this_00->elempack;
            local_98 = this_00->allocator;
            uStack_b0 = (int *)0x0;
            local_78 = (long)local_88 * (long)local_8c;
            local_84 = 1;
            local_a8 = sVar7;
            Mat::~Mat((Mat *)local_b8);
            if (0 < (int)local_c8) {
              lVar62 = 0;
              iVar48 = (int)local_c8;
              do {
                pfVar53 = (float *)((long)pvVar8 + lVar62 + (long)local_e0 * (long)local_d8 * uVar50
                                   );
                pfVar52 = (float *)((long)pvVar60 + lVar62 + local_c0 * local_70 * uVar50);
                auVar127._0_4_ = *pfVar52 + *pfVar53;
                auVar127._4_4_ = pfVar52[1] + pfVar53[1];
                auVar127._8_4_ = pfVar52[2] + pfVar53[2];
                auVar127._12_4_ = pfVar52[3] + pfVar53[3];
                *(undefined1 (*) [16])((long)pvVar63 + lVar62 + sVar55 * sVar7 * uVar50) = auVar127;
                lVar62 = lVar62 + 0x10;
                iVar48 = iVar48 + -1;
              } while (iVar48 != 0);
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != local_d0);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  else {
    local_68 = CONCAT71(local_68._1_7_,uVar67 == 1);
    local_60 = CONCAT71(local_60._1_7_,uVar4 == 1);
    if ((uVar67 != 1 || uVar4 != 1) || uVar64 != uVar5) goto LAB_00233bd2;
  }
  Mat::create(this_00,uVar66,uVar65,uVar64,local_70,iVar56,opt->blob_allocator);
  iVar48 = -100;
  if (((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) &&
     (iVar48 = 0, 0 < (int)uVar64)) {
    uVar51 = 0;
    iVar48 = 0;
    do {
      if (0 < (int)local_e0) {
        sVar55 = this_00->cstep;
        sVar7 = this_00->elemsize;
        pfVar53 = (float *)((long)pMVar6->data + pMVar6->cstep * uVar51 * pMVar6->elemsize);
        fVar128 = *pfVar53;
        fVar157 = pfVar53[1];
        fVar159 = pfVar53[2];
        fVar161 = pfVar53[3];
        pvVar8 = this_00->data;
        sVar9 = pMVar6[1].cstep;
        sVar10 = pMVar6[1].elemsize;
        pvVar60 = pMVar6[1].data;
        lVar62 = 0;
        iVar56 = (int)local_e0;
        do {
          pfVar53 = (float *)((long)pvVar60 + lVar62 + sVar9 * sVar10 * uVar51);
          auVar106._0_4_ = *pfVar53 + fVar128;
          auVar106._4_4_ = pfVar53[1] + fVar157;
          auVar106._8_4_ = pfVar53[2] + fVar159;
          auVar106._12_4_ = pfVar53[3] + fVar161;
          *(undefined1 (*) [16])((long)pvVar8 + lVar62 + sVar55 * sVar7 * uVar51) = auVar106;
          lVar62 = lVar62 + 0x10;
          iVar56 = iVar56 + -1;
        } while (iVar56 != 0);
      }
      uVar51 = uVar51 + 1;
    } while (uVar51 != uVar50);
  }
  return iVar48;
}

Assistant:

int BinaryOp_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_rsub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_rdiv_pack8>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_rsub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_rdiv_pack4>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}